

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Mish_x86_avx::forward_inplace(Mish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [24];
  undefined1 auVar90 [32];
  undefined1 auVar91 [24];
  long *in_RSI;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m256 two;
  __m256 one_2;
  __m256 y_1;
  __m256 z;
  __m256 tmp_1;
  __m256 mask_1;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_1;
  __m256i imm0_1;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  __m256 one_3;
  __m256 pow2n_1;
  __m256 y_2;
  __m256 mask_2;
  __m256 one_4;
  __m256i imm0_2;
  __m256 fx_1;
  __m256 tmp_2;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  imm_xmm_union u_7;
  __m256i ret_3;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_12;
  imm_xmm_union u_11;
  imm_xmm_union u_10;
  __m256i ret_4;
  __m128i y2_2;
  __m128i y1_2;
  __m128i x2_4;
  __m128i x1_4;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_14;
  imm_xmm_union u_13;
  __m256i ret_5;
  __m128i x2_5;
  __m128i x1_5;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  __m128 two_1;
  __m128 one_7;
  v4sf y_4;
  v4sf z_1;
  v4sf tmp_4;
  v4sf mask_4;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_6;
  v4si emm0_1;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_5;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_3;
  __m128 one_8;
  v4sf pow2n_3;
  v4sf y_5;
  v4sf mask_5;
  v4sf one_9;
  v4si emm0_2;
  v4sf fx_3;
  v4sf tmp_5;
  undefined8 local_3e50;
  undefined8 uStack_3e48;
  undefined8 local_3e40;
  undefined8 uStack_3e38;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  int local_3e18;
  undefined8 local_3e08;
  undefined8 local_3e00;
  undefined8 local_3df8;
  undefined4 local_3df0;
  long local_3de8;
  undefined4 local_3de0;
  undefined4 local_3ddc;
  undefined4 local_3dd8;
  undefined4 local_3dd4;
  undefined4 local_3dd0;
  undefined8 local_3dc8;
  undefined1 (*local_3dc0) [32];
  int local_3db4;
  int local_3db0;
  int local_3dac;
  int local_3da8;
  int local_3da4;
  int local_3da0;
  int local_3d9c;
  long *local_3d90;
  undefined1 local_3d7d;
  int local_3d7c;
  undefined8 *local_3d70;
  undefined8 *local_3d68;
  undefined8 *local_3d58;
  undefined1 (*local_3d48) [32];
  undefined8 local_3d40;
  undefined8 uStack_3d38;
  undefined8 uStack_3d30;
  undefined8 uStack_3d28;
  undefined8 local_3d20;
  undefined8 uStack_3d18;
  undefined8 uStack_3d10;
  undefined8 uStack_3d08;
  undefined1 (*local_3cf0) [32];
  undefined1 (*local_3ce8) [32];
  undefined8 local_3ce0;
  undefined8 uStack_3cd8;
  undefined8 local_3cd0;
  undefined8 uStack_3cc8;
  undefined1 (*local_3cb8) [32];
  long local_3cb0;
  undefined4 local_3ca4;
  long local_3ca0;
  undefined1 (*local_3c98) [32];
  undefined4 local_3c8c;
  int local_3c88;
  int local_3c84;
  undefined8 *local_3c80;
  undefined4 local_3c74;
  long local_3c70;
  undefined8 *local_3c50;
  undefined1 local_3c20 [8];
  float fStack_3c18;
  float fStack_3c14;
  float fStack_3c10;
  float fStack_3c0c;
  float fStack_3c08;
  undefined1 local_3c00 [8];
  float fStack_3bf8;
  float fStack_3bf4;
  float fStack_3bf0;
  float fStack_3bec;
  float fStack_3be8;
  undefined4 uStack_3be4;
  undefined8 local_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  undefined8 local_3bc0;
  undefined8 uStack_3bb8;
  undefined8 uStack_3bb0;
  undefined8 uStack_3ba8;
  undefined8 local_3ba0;
  undefined8 uStack_3b98;
  undefined8 uStack_3b90;
  undefined8 uStack_3b88;
  undefined8 local_3b80;
  undefined8 uStack_3b78;
  undefined8 uStack_3b70;
  undefined8 uStack_3b68;
  undefined1 local_3b60 [8];
  float fStack_3b58;
  float fStack_3b54;
  float fStack_3b50;
  float fStack_3b4c;
  float fStack_3b48;
  undefined8 local_3b40;
  undefined8 uStack_3b38;
  undefined8 uStack_3b30;
  undefined8 uStack_3b28;
  undefined8 local_3b20;
  undefined8 uStack_3b18;
  undefined8 uStack_3b10;
  undefined8 uStack_3b08;
  undefined1 local_3b00 [8];
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  float local_3ae0;
  float fStack_3adc;
  float fStack_3ad8;
  float fStack_3ad4;
  float fStack_3ad0;
  float fStack_3acc;
  float fStack_3ac8;
  float fStack_3ac4;
  undefined1 local_3ac0 [32];
  undefined1 local_3aa0 [32];
  undefined1 local_3a80 [8];
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  undefined1 local_3a60 [32];
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  undefined8 local_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  undefined1 local_3a00 [8];
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  undefined8 local_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  undefined8 local_39a0;
  undefined8 uStack_3998;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  undefined8 local_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  undefined8 local_3940;
  undefined8 uStack_3938;
  undefined8 uStack_3930;
  undefined8 uStack_3928;
  undefined8 local_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  undefined8 local_3900;
  undefined8 uStack_38f8;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  undefined8 local_38e0;
  undefined8 uStack_38d8;
  undefined8 uStack_38d0;
  undefined8 uStack_38c8;
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  undefined8 local_38a0;
  undefined8 uStack_3898;
  undefined8 uStack_3890;
  undefined8 uStack_3888;
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 uStack_3870;
  undefined8 uStack_3868;
  undefined8 local_3860;
  undefined8 uStack_3858;
  undefined8 uStack_3850;
  undefined8 uStack_3848;
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  undefined8 local_3820;
  undefined8 uStack_3818;
  undefined8 uStack_3810;
  undefined8 uStack_3808;
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 uStack_37f0;
  undefined8 uStack_37e8;
  undefined1 local_37e0 [32];
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  undefined8 local_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  undefined1 local_3780 [8];
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  undefined8 local_3760;
  undefined8 uStack_3758;
  undefined8 uStack_3750;
  undefined8 uStack_3748;
  undefined1 local_3740 [32];
  undefined8 local_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  undefined8 local_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined4 local_364c;
  undefined4 local_3648;
  undefined4 local_3644;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 local_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  undefined1 local_3600 [32];
  undefined8 local_35e0;
  undefined8 uStack_35d8;
  undefined8 uStack_35d0;
  undefined8 uStack_35c8;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined1 local_3560 [32];
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  float local_3520;
  float fStack_351c;
  float fStack_3518;
  float fStack_3514;
  float fStack_3510;
  float fStack_350c;
  float fStack_3508;
  undefined4 uStack_3504;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined1 local_34e0 [8];
  float fStack_34d8;
  float fStack_34d4;
  float fStack_34d0;
  float fStack_34cc;
  float fStack_34c8;
  float fStack_34c4;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  float local_34a0;
  float fStack_349c;
  float fStack_3498;
  float fStack_3494;
  float fStack_3490;
  float fStack_348c;
  float fStack_3488;
  float fStack_3484;
  undefined1 local_3480 [32];
  undefined8 local_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined1 local_3420 [8];
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined1 local_33e0 [32];
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined1 local_33a0 [32];
  undefined8 local_3380;
  undefined8 uStack_3378;
  undefined8 uStack_3370;
  undefined8 uStack_3368;
  undefined8 local_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 uStack_3330;
  undefined8 uStack_3328;
  undefined8 local_3320;
  undefined8 uStack_3318;
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  undefined4 local_32e4;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  float local_3260;
  float fStack_325c;
  float fStack_3258;
  float fStack_3254;
  float fStack_3250;
  float fStack_324c;
  float fStack_3248;
  float fStack_3244;
  undefined1 local_3240 [32];
  undefined1 local_3220 [32];
  undefined1 local_3200 [32];
  undefined1 local_31e0 [32];
  undefined1 local_31c0 [32];
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined1 local_3070 [16];
  undefined1 local_3060 [16];
  undefined4 local_3044;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  undefined8 local_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined8 local_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 local_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 local_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined8 local_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 local_2db0;
  undefined8 uStack_2da8;
  undefined1 local_2da0 [16];
  undefined1 local_2d90 [16];
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 local_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined1 *local_2d18;
  undefined8 *local_2d10;
  float *local_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  float local_2ca0;
  float fStack_2c9c;
  float fStack_2c98;
  float fStack_2c94;
  float fStack_2c90;
  float fStack_2c8c;
  float fStack_2c88;
  float fStack_2c84;
  float *local_2c78;
  undefined1 *local_2c70;
  float *local_2c68;
  undefined8 local_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  float local_2c20 [2];
  float afStack_2c18 [2];
  float afStack_2c10 [2];
  float afStack_2c08 [2];
  float local_2c00;
  float fStack_2bfc;
  float fStack_2bf8;
  float fStack_2bf4;
  float fStack_2bf0;
  float fStack_2bec;
  float fStack_2be8;
  float fStack_2be4;
  float *local_2bd8;
  undefined1 *local_2bd0;
  float *local_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  float local_2b80 [2];
  float afStack_2b78 [2];
  float afStack_2b70 [2];
  float afStack_2b68 [2];
  float local_2b60;
  float fStack_2b5c;
  float fStack_2b58;
  float fStack_2b54;
  float fStack_2b50;
  float fStack_2b4c;
  float fStack_2b48;
  float fStack_2b44;
  float *local_2b38;
  undefined1 *local_2b30;
  float *local_2b28;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  float local_2ae0 [2];
  float afStack_2ad8 [2];
  float afStack_2ad0 [2];
  float afStack_2ac8 [2];
  float local_2ac0;
  float fStack_2abc;
  float fStack_2ab8;
  float fStack_2ab4;
  float fStack_2ab0;
  float fStack_2aac;
  float fStack_2aa8;
  float fStack_2aa4;
  float *local_2a98;
  undefined1 *local_2a90;
  float *local_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  float local_2a40 [2];
  float afStack_2a38 [2];
  float afStack_2a30 [2];
  float afStack_2a28 [2];
  float local_2a20;
  float fStack_2a1c;
  float fStack_2a18;
  float fStack_2a14;
  float fStack_2a10;
  float fStack_2a0c;
  float fStack_2a08;
  float fStack_2a04;
  float *local_29f8;
  undefined1 *local_29f0;
  float *local_29e8;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  float local_29a0 [2];
  float afStack_2998 [2];
  float afStack_2990 [2];
  float afStack_2988 [2];
  float local_2980;
  float fStack_297c;
  float fStack_2978;
  float fStack_2974;
  float fStack_2970;
  float fStack_296c;
  float fStack_2968;
  float fStack_2964;
  float *local_2958;
  float *local_2950;
  undefined1 *local_2948;
  float local_2940 [2];
  float afStack_2938 [2];
  float afStack_2930 [2];
  float afStack_2928 [2];
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  float local_2900 [2];
  float afStack_28f8 [2];
  float afStack_28f0 [2];
  float afStack_28e8 [2];
  float local_28e0;
  float fStack_28dc;
  float fStack_28d8;
  float fStack_28d4;
  float fStack_28d0;
  float fStack_28cc;
  float fStack_28c8;
  undefined4 uStack_28c4;
  undefined1 *local_28b8;
  undefined8 *local_28b0;
  undefined8 *local_28a8;
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  float local_2840;
  float fStack_283c;
  float fStack_2838;
  float fStack_2834;
  float fStack_2830;
  float fStack_282c;
  float fStack_2828;
  float fStack_2824;
  float *local_2818;
  undefined1 *local_2810;
  undefined8 *local_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  float local_27c0 [2];
  float afStack_27b8 [2];
  float afStack_27b0 [2];
  float afStack_27a8 [2];
  float local_27a0;
  float fStack_279c;
  float fStack_2798;
  float fStack_2794;
  float fStack_2790;
  float fStack_278c;
  float fStack_2788;
  float fStack_2784;
  float *local_2778;
  undefined1 *local_2770;
  undefined8 *local_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  float local_2720 [2];
  float afStack_2718 [2];
  float afStack_2710 [2];
  float afStack_2708 [2];
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  float fStack_26e4;
  float *local_26d8;
  undefined1 *local_26d0;
  undefined8 *local_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  float local_2680 [2];
  float afStack_2678 [2];
  float afStack_2670 [2];
  float afStack_2668 [2];
  float local_2660;
  float fStack_265c;
  float fStack_2658;
  float fStack_2654;
  float fStack_2650;
  float fStack_264c;
  float fStack_2648;
  float fStack_2644;
  float *local_2638;
  undefined1 *local_2630;
  undefined8 *local_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  float local_25e0 [2];
  float afStack_25d8 [2];
  float afStack_25d0 [2];
  float afStack_25c8 [2];
  float local_25c0;
  float fStack_25bc;
  float fStack_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  float *local_2598;
  undefined1 *local_2590;
  undefined8 *local_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  float local_2540 [2];
  float afStack_2538 [2];
  float afStack_2530 [2];
  float afStack_2528 [2];
  float local_2520;
  float fStack_251c;
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  float *local_24f8;
  float *local_24f0;
  undefined1 *local_24e8;
  float local_24e0 [2];
  float afStack_24d8 [2];
  float afStack_24d0 [2];
  float afStack_24c8 [2];
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  float local_24a0 [2];
  float afStack_2498 [2];
  float afStack_2490 [2];
  float afStack_2488 [2];
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  undefined4 uStack_2464;
  undefined1 *local_2458;
  float *local_2450;
  undefined1 *local_2448;
  float local_2440 [2];
  float afStack_2438 [2];
  float afStack_2430 [2];
  float afStack_2428 [2];
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  float local_23e0;
  float fStack_23dc;
  float fStack_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  undefined4 uStack_23c4;
  undefined1 *local_23b8;
  float *local_23b0;
  undefined1 *local_23a8;
  float local_23a0 [2];
  float afStack_2398 [2];
  float afStack_2390 [2];
  float afStack_2388 [2];
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  float local_2340;
  float fStack_233c;
  float fStack_2338;
  float fStack_2334;
  float fStack_2330;
  float fStack_232c;
  float fStack_2328;
  undefined4 uStack_2324;
  float *local_2318;
  undefined1 *local_2310;
  undefined1 *local_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  float local_22c0 [2];
  float afStack_22b8 [2];
  float afStack_22b0 [2];
  float afStack_22a8 [2];
  float local_22a0;
  float fStack_229c;
  float fStack_2298;
  float fStack_2294;
  float fStack_2290;
  float fStack_228c;
  float fStack_2288;
  float fStack_2284;
  float *local_2278;
  undefined1 *local_2270;
  undefined1 *local_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  float local_2220 [2];
  float afStack_2218 [2];
  float afStack_2210 [2];
  float afStack_2208 [2];
  float local_2200;
  float fStack_21fc;
  float fStack_21f8;
  float fStack_21f4;
  float fStack_21f0;
  float fStack_21ec;
  float fStack_21e8;
  float fStack_21e4;
  float *local_21d8;
  undefined1 *local_21d0;
  undefined1 *local_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  float local_2180 [2];
  float afStack_2178 [2];
  float afStack_2170 [2];
  float afStack_2168 [2];
  float local_2160;
  float fStack_215c;
  float fStack_2158;
  float fStack_2154;
  float fStack_2150;
  float fStack_214c;
  float fStack_2148;
  float fStack_2144;
  float *local_2138;
  undefined1 *local_2130;
  undefined1 *local_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  float local_20e0 [2];
  float afStack_20d8 [2];
  float afStack_20d0 [2];
  float afStack_20c8 [2];
  float local_20c0;
  float fStack_20bc;
  float fStack_20b8;
  float fStack_20b4;
  float fStack_20b0;
  float fStack_20ac;
  float fStack_20a8;
  float fStack_20a4;
  float *local_2098;
  undefined1 *local_2090;
  undefined1 *local_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  float local_2040 [2];
  float afStack_2038 [2];
  float afStack_2030 [2];
  float afStack_2028 [2];
  float local_2020;
  float fStack_201c;
  float fStack_2018;
  float fStack_2014;
  float fStack_2010;
  float fStack_200c;
  float fStack_2008;
  float fStack_2004;
  float *local_1ff8;
  undefined1 *local_1ff0;
  undefined1 *local_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  float local_1fa0 [2];
  float afStack_1f98 [2];
  float afStack_1f90 [2];
  float afStack_1f88 [2];
  float local_1f80;
  float fStack_1f7c;
  float fStack_1f78;
  float fStack_1f74;
  float fStack_1f70;
  float fStack_1f6c;
  float fStack_1f68;
  float fStack_1f64;
  float *local_1f58;
  undefined1 *local_1f50;
  undefined1 *local_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  float local_1f00 [2];
  float afStack_1ef8 [2];
  float afStack_1ef0 [2];
  float afStack_1ee8 [2];
  float local_1ee0;
  float fStack_1edc;
  float fStack_1ed8;
  float fStack_1ed4;
  float fStack_1ed0;
  float fStack_1ecc;
  float fStack_1ec8;
  float fStack_1ec4;
  float *local_1eb8;
  undefined1 *local_1eb0;
  undefined1 *local_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  float local_1e60 [2];
  float afStack_1e58 [2];
  float afStack_1e50 [2];
  float afStack_1e48 [2];
  float local_1e40;
  float fStack_1e3c;
  float fStack_1e38;
  float fStack_1e34;
  float fStack_1e30;
  float fStack_1e2c;
  float fStack_1e28;
  float fStack_1e24;
  undefined1 *local_1e18;
  float *local_1e10;
  undefined1 *local_1e08;
  float local_1e00 [2];
  float afStack_1df8 [2];
  float afStack_1df0 [2];
  float afStack_1de8 [2];
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  float local_1dc0;
  float fStack_1dbc;
  float fStack_1db8;
  float fStack_1db4;
  float fStack_1db0;
  float fStack_1dac;
  float fStack_1da8;
  float fStack_1da4;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined1 *local_1d78;
  float *local_1d70;
  undefined1 *local_1d68;
  float local_1d60 [2];
  float afStack_1d58 [2];
  float afStack_1d50 [2];
  float afStack_1d48 [2];
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  float local_1d20;
  float fStack_1d1c;
  float fStack_1d18;
  float fStack_1d14;
  float fStack_1d10;
  float fStack_1d0c;
  float fStack_1d08;
  float fStack_1d04;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined1 *local_1cd8;
  float *local_1cd0;
  undefined1 *local_1cc8;
  float local_1cc0 [2];
  float afStack_1cb8 [2];
  float afStack_1cb0 [2];
  float afStack_1ca8 [2];
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  float local_1c80;
  float fStack_1c7c;
  float fStack_1c78;
  float fStack_1c74;
  float fStack_1c70;
  float fStack_1c6c;
  float fStack_1c68;
  float fStack_1c64;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined1 *local_1c38;
  float *local_1c30;
  undefined1 *local_1c28;
  float local_1c20 [2];
  float afStack_1c18 [2];
  float afStack_1c10 [2];
  float afStack_1c08 [2];
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  float local_1be0;
  float fStack_1bdc;
  float fStack_1bd8;
  float fStack_1bd4;
  float fStack_1bd0;
  float fStack_1bcc;
  float fStack_1bc8;
  float fStack_1bc4;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined1 *local_1b98;
  float *local_1b90;
  float *local_1b88;
  float local_1b80 [2];
  float afStack_1b78 [2];
  float afStack_1b70 [2];
  float afStack_1b68 [2];
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  float local_1b40;
  float fStack_1b3c;
  float fStack_1b38;
  float fStack_1b34;
  float fStack_1b30;
  float fStack_1b2c;
  float fStack_1b28;
  float fStack_1b24;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined4 local_1af4;
  undefined8 local_1af0;
  undefined8 uStack_1ae8;
  undefined4 local_1ad4;
  undefined8 local_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 local_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 local_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 local_1930;
  undefined8 uStack_1928;
  undefined1 local_1920 [16];
  undefined1 local_1910 [16];
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 local_1830;
  undefined8 uStack_1828;
  undefined1 local_1820 [16];
  undefined1 local_1810 [16];
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined1 local_1750 [16];
  undefined1 local_1740 [16];
  undefined4 local_1724;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined1 local_1690 [16];
  undefined1 local_1680 [16];
  undefined4 local_1664;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 local_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 local_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 local_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 local_1590;
  undefined8 uStack_1588;
  undefined4 local_1574;
  undefined8 local_1570;
  undefined8 uStack_1568;
  undefined4 local_1554;
  undefined8 local_1550;
  undefined8 uStack_1548;
  undefined4 local_1534;
  undefined8 local_1530;
  undefined8 uStack_1528;
  undefined4 local_1514;
  undefined8 local_1510;
  undefined8 uStack_1508;
  undefined1 local_1500 [16];
  undefined1 auStack_14f0 [16];
  undefined4 local_14e0;
  undefined4 local_14dc;
  undefined4 local_14d8;
  undefined4 local_14d4;
  undefined4 local_14d0;
  undefined4 local_14cc;
  undefined4 local_14c8;
  undefined4 local_14c4;
  undefined1 local_14c0 [16];
  undefined1 auStack_14b0 [16];
  undefined4 local_14a0;
  undefined4 local_149c;
  undefined4 local_1498;
  undefined4 local_1494;
  undefined4 local_1490;
  undefined4 local_148c;
  undefined4 local_1488;
  undefined4 local_1484;
  undefined1 local_1480 [16];
  undefined1 auStack_1470 [16];
  undefined4 local_1460;
  undefined4 local_145c;
  undefined4 local_1458;
  undefined4 local_1454;
  undefined4 local_1450;
  undefined4 local_144c;
  undefined4 local_1448;
  undefined4 local_1444;
  undefined1 local_1440 [16];
  undefined1 auStack_1430 [16];
  undefined4 local_1410;
  undefined4 local_140c;
  undefined4 local_1408;
  undefined4 local_1404;
  undefined4 local_1400;
  undefined4 local_13fc;
  undefined4 local_13f8;
  undefined4 local_13f4;
  undefined1 local_13f0 [8];
  float fStack_13e8;
  float fStack_13e4;
  undefined1 local_13e0 [8];
  float fStack_13d8;
  float fStack_13d4;
  undefined8 local_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 local_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined1 local_1390 [8];
  float fStack_1388;
  float fStack_1384;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 local_1370;
  undefined8 uStack_1368;
  undefined1 local_1360 [8];
  undefined8 uStack_1358;
  float local_1350;
  float fStack_134c;
  float fStack_1348;
  float fStack_1344;
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined1 local_1320 [8];
  undefined8 uStack_1318;
  undefined1 local_1310 [16];
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined1 local_12f0 [16];
  undefined1 local_12e0 [8];
  undefined8 uStack_12d8;
  undefined4 local_12c4;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 local_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 local_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 local_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 local_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 local_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 local_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 local_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 local_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 local_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined1 local_1190 [16];
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined1 local_1170 [16];
  undefined1 local_1160 [8];
  undefined8 uStack_1158;
  undefined8 local_1150;
  undefined8 uStack_1148;
  undefined1 local_1140 [16];
  undefined8 local_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined4 local_1104;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 local_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 local_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 local_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 local_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 local_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined4 local_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1034;
  undefined4 local_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined4 local_1014;
  undefined4 local_1010;
  undefined4 uStack_100c;
  undefined4 uStack_1008;
  undefined4 uStack_1004;
  undefined4 local_ff4;
  undefined8 local_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined1 local_fd0 [16];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 local_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 local_f90;
  undefined8 uStack_f88;
  undefined1 local_f80 [16];
  undefined8 local_f70;
  undefined8 uStack_f68;
  float local_f60;
  float fStack_f5c;
  float fStack_f58;
  float fStack_f54;
  undefined8 local_f50;
  undefined8 uStack_f48;
  undefined1 local_f40 [16];
  undefined8 local_f30;
  undefined8 uStack_f28;
  float local_f20;
  float fStack_f1c;
  float fStack_f18;
  float fStack_f14;
  undefined1 local_f10 [16];
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined1 local_ef0 [16];
  undefined1 local_ee0 [8];
  undefined8 uStack_ed8;
  undefined8 local_ed0;
  undefined8 uStack_ec8;
  undefined1 local_ec0 [16];
  undefined8 local_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined4 local_e84;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 local_e70;
  undefined8 uStack_e68;
  undefined1 local_e60 [16];
  undefined8 local_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 local_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 local_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 local_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined4 local_dd0;
  undefined4 uStack_dcc;
  undefined4 uStack_dc8;
  undefined4 uStack_dc4;
  undefined4 local_db4;
  undefined8 local_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 local_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  float local_d70;
  float fStack_d6c;
  float fStack_d68;
  float fStack_d64;
  undefined1 local_d60 [16];
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 local_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 local_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 local_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 local_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 local_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 local_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 local_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 local_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined1 *local_b48;
  undefined8 *local_b40;
  float *local_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 local_b10;
  undefined8 uStack_b08;
  float local_b00;
  float fStack_afc;
  float fStack_af8;
  float fStack_af4;
  float *local_ae8;
  undefined1 *local_ae0;
  float *local_ad8;
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  float local_ab0 [2];
  float afStack_aa8 [2];
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float *local_a88;
  undefined1 *local_a80;
  float *local_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  float local_a50 [2];
  float afStack_a48 [2];
  float local_a40;
  float fStack_a3c;
  float fStack_a38;
  float fStack_a34;
  float *local_a28;
  undefined1 *local_a20;
  float *local_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  float local_9f0 [2];
  float afStack_9e8 [2];
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float *local_9c8;
  undefined1 *local_9c0;
  float *local_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  float local_990 [2];
  float afStack_988 [2];
  float local_980;
  float fStack_97c;
  float fStack_978;
  float fStack_974;
  float *local_968;
  undefined1 *local_960;
  float *local_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  float local_930 [2];
  float afStack_928 [2];
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  undefined1 *local_908;
  undefined8 *local_900;
  undefined8 *local_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float *local_8a8;
  undefined1 *local_8a0;
  undefined8 *local_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  float local_870 [2];
  float afStack_868 [2];
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float *local_848;
  undefined1 *local_840;
  undefined8 *local_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  float local_810 [2];
  float afStack_808 [2];
  float local_800;
  float fStack_7fc;
  float fStack_7f8;
  float fStack_7f4;
  float *local_7e8;
  undefined1 *local_7e0;
  undefined8 *local_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  float local_7b0 [2];
  float afStack_7a8 [2];
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float *local_788;
  undefined1 *local_780;
  undefined8 *local_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  float local_750 [2];
  float afStack_748 [2];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float *local_728;
  undefined1 *local_720;
  undefined8 *local_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  float local_6f0 [2];
  float afStack_6e8 [2];
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  undefined1 *local_6c8;
  float *local_6c0;
  undefined1 *local_6b8;
  float local_6b0 [2];
  float afStack_6a8 [2];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  undefined1 *local_668;
  float *local_660;
  undefined1 *local_658;
  float local_650 [2];
  float afStack_648 [2];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  float local_5d0 [2];
  float afStack_5c8 [2];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  float local_570 [2];
  float afStack_568 [2];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  float local_510 [2];
  float afStack_508 [2];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  float local_4b0 [2];
  float afStack_4a8 [2];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  float local_450 [2];
  float afStack_448 [2];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  float local_3f0 [2];
  float afStack_3e8 [2];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  float local_390 [2];
  float afStack_388 [2];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  float local_330 [2];
  float afStack_328 [2];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  undefined1 *local_308;
  float *local_300;
  undefined1 *local_2f8;
  float local_2f0 [2];
  float afStack_2e8 [2];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  float local_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined1 *local_2a8;
  float *local_2a0;
  undefined1 *local_298;
  float local_290 [2];
  float afStack_288 [2];
  undefined8 local_280;
  undefined8 uStack_278;
  float local_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined1 *local_248;
  float *local_240;
  undefined1 *local_238;
  float local_230 [2];
  float afStack_228 [2];
  undefined8 local_220;
  undefined8 uStack_218;
  float local_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined1 *local_1e8;
  float *local_1e0;
  undefined1 *local_1d8;
  float local_1d0 [2];
  float afStack_1c8 [2];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined1 *local_188;
  float *local_180;
  float *local_178;
  float local_170 [2];
  float afStack_168 [2];
  undefined8 local_160;
  undefined8 uStack_158;
  float local_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_3d9c = *(int *)((long)in_RSI + 0x2c);
  local_3da0 = (int)in_RSI[6];
  local_3da4 = *(int *)((long)in_RSI + 0x34);
  local_3da8 = (int)in_RSI[7];
  local_3dac = (int)in_RSI[3];
  local_3db0 = local_3d9c * local_3da0 * local_3da4 * local_3dac;
  local_3d90 = in_RSI;
  for (local_3db4 = 0; local_3db4 < local_3da8; local_3db4 = local_3db4 + 1) {
    local_3d70 = &local_3e08;
    local_3c84 = *(int *)((long)local_3d90 + 0x2c);
    local_3c88 = (int)local_3d90[6];
    local_3c8c = *(undefined4 *)((long)local_3d90 + 0x34);
    local_3c98 = (undefined1 (*) [32])
                 (*local_3d90 + local_3d90[8] * (long)local_3db4 * local_3d90[2]);
    local_3ca0 = local_3d90[2];
    local_3ca4 = (undefined4)local_3d90[3];
    local_3cb0 = local_3d90[4];
    local_3c80 = &local_3e08;
    local_3c70 = (long)local_3c84 * (long)local_3c88 * local_3ca0;
    local_3d68 = &local_3e08;
    local_3d58 = &local_3e08;
    local_3c74 = 0x10;
    local_3d7c = local_3db4;
    local_3d7d = 1;
    local_3e08 = 0;
    local_3df8 = 0;
    local_3df0 = 0;
    local_3de0 = 0;
    local_3ddc = 0;
    local_3dd8 = 0;
    local_3dd4 = 0;
    local_3dd0 = 0;
    local_3dc8 = 0;
    local_3e00 = 0;
    local_3dc0 = local_3c98;
    for (local_3e18 = 0; local_3e18 + 7 < local_3db0; local_3e18 = local_3e18 + 8) {
      local_3d48 = local_3dc0;
      local_3d40 = *(undefined8 *)*local_3dc0;
      uStack_3d38 = *(undefined8 *)(*local_3dc0 + 8);
      uStack_3d30 = *(undefined8 *)(*local_3dc0 + 0x10);
      auVar89 = *(undefined1 (*) [24])*local_3dc0;
      uStack_3d28 = *(undefined8 *)(*local_3dc0 + 0x18);
      auVar90 = *local_3dc0;
      local_31e0 = ZEXT1632(ZEXT816(0) << 0x40);
      local_3a40 = 0x3f8000003f800000;
      uStack_3a38 = 0x3f8000003f800000;
      uStack_3a30 = 0x3f8000003f800000;
      uStack_3a28 = 0x3f8000003f800000;
      local_3740._0_8_ = auVar89._0_8_;
      local_1a20 = local_3740._0_8_;
      local_3740._8_8_ = auVar89._8_8_;
      uStack_1a18 = local_3740._8_8_;
      local_3740._16_8_ = auVar89._16_8_;
      uStack_1a10 = local_3740._16_8_;
      local_1a80 = 0x42b0c0a542b0c0a5;
      uStack_1a78 = 0x42b0c0a542b0c0a5;
      uStack_1a70 = 0x42b0c0a542b0c0a5;
      uStack_1a68 = 0x42b0c0a542b0c0a5;
      auVar48._8_8_ = 0x42b0c0a542b0c0a5;
      auVar48._0_8_ = 0x42b0c0a542b0c0a5;
      auVar48._16_8_ = 0x42b0c0a542b0c0a5;
      auVar48._24_8_ = 0x42b0c0a542b0c0a5;
      auVar5 = vminps_avx(*local_3dc0,auVar48);
      local_3740._0_8_ = auVar5._0_8_;
      local_3140 = local_3740._0_8_;
      local_3740._8_8_ = auVar5._8_8_;
      uStack_3138 = local_3740._8_8_;
      local_3740._16_8_ = auVar5._16_8_;
      uStack_3130 = local_3740._16_8_;
      local_3740._24_8_ = auVar5._24_8_;
      uStack_3128 = local_3740._24_8_;
      local_31a0 = 0xc2b0c0a5c2b0c0a5;
      uStack_3198 = 0xc2b0c0a5c2b0c0a5;
      uStack_3190 = 0xc2b0c0a5c2b0c0a5;
      uStack_3188 = 0xc2b0c0a5c2b0c0a5;
      auVar32._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar32._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar32._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar32._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar4 = vmaxps_avx(auVar5,auVar32);
      local_28b8 = local_3740;
      local_24f0 = ::_ps256_cephes_LOG2EF;
      local_24f8 = ::_ps256_0p5;
      local_3740._0_8_ = auVar4._0_8_;
      uVar7 = local_3740._0_8_;
      local_3740._8_8_ = auVar4._8_8_;
      uVar8 = local_3740._8_8_;
      local_3740._16_8_ = auVar4._16_8_;
      uVar9 = local_3740._16_8_;
      local_3740._24_8_ = auVar4._24_8_;
      uVar10 = local_3740._24_8_;
      local_24e0[0] = 1.442695;
      local_24e0[1] = 1.442695;
      afStack_24d8[0] = 1.442695;
      afStack_24d8[1] = 1.442695;
      afStack_24d0[0] = 1.442695;
      afStack_24d0[1] = 1.442695;
      afStack_24c8[0] = 1.442695;
      afStack_24c8[1] = 1.442695;
      local_24c0._0_4_ = auVar4._0_4_;
      local_24c0._4_4_ = auVar4._4_4_;
      uStack_24b8._0_4_ = auVar4._8_4_;
      uStack_24b8._4_4_ = auVar4._12_4_;
      uStack_24b0._0_4_ = auVar4._16_4_;
      uStack_24b0._4_4_ = auVar4._20_4_;
      uStack_24a8._0_4_ = auVar4._24_4_;
      uStack_2464 = 0x3fb8aa3b;
      local_2480 = (float)local_24c0 * 1.442695;
      fStack_247c = local_24c0._4_4_ * 1.442695;
      fStack_2478 = (float)uStack_24b8 * 1.442695;
      fStack_2474 = uStack_24b8._4_4_ * 1.442695;
      fStack_2470 = (float)uStack_24b0 * 1.442695;
      fStack_246c = uStack_24b0._4_4_ * 1.442695;
      fStack_2468 = (float)uStack_24a8 * 1.442695;
      local_24a0[0] = 0.5;
      local_24a0[1] = 0.5;
      afStack_2498[0] = 0.5;
      afStack_2498[1] = 0.5;
      afStack_2490[0] = 0.5;
      afStack_2490[1] = 0.5;
      afStack_2488[0] = 0.5;
      afStack_2488[1] = 0.5;
      local_3780._4_4_ = fStack_247c + 0.5;
      local_3780._0_4_ = local_2480 + 0.5;
      uStack_3778._0_4_ = fStack_2478 + 0.5;
      uStack_3778._4_4_ = fStack_2474 + 0.5;
      uStack_3770._0_4_ = fStack_2470 + 0.5;
      uStack_3770._4_4_ = fStack_246c + 0.5;
      uStack_3768._0_4_ = fStack_2468 + 0.5;
      uStack_3768._4_4_ = 0x3ff8aa3b;
      auVar6 = vroundps_avx(_local_3780,1);
      auVar5 = vcmpps_avx(_local_3780,auVar6,1);
      local_37e0._0_8_ = auVar5._0_8_;
      local_2fa0 = local_37e0._0_8_;
      local_37e0._8_8_ = auVar5._8_8_;
      uStack_2f98 = local_37e0._8_8_;
      local_37e0._16_8_ = auVar5._16_8_;
      uStack_2f90 = local_37e0._16_8_;
      local_37e0._24_8_ = auVar5._24_8_;
      uStack_2f88 = local_37e0._24_8_;
      local_2fc0 = 0x3f8000003f800000;
      uStack_2fb8 = 0x3f8000003f800000;
      uStack_2fb0 = 0x3f8000003f800000;
      uStack_2fa8 = 0x3f8000003f800000;
      auVar36._8_8_ = 0x3f8000003f800000;
      auVar36._0_8_ = 0x3f8000003f800000;
      auVar36._16_8_ = 0x3f8000003f800000;
      auVar36._24_8_ = 0x3f8000003f800000;
      local_37e0 = vandps_avx(auVar5,auVar36);
      local_3760 = auVar6._0_8_;
      local_3620 = local_3760;
      uStack_3758 = auVar6._8_8_;
      uStack_3618 = uStack_3758;
      uStack_3750 = auVar6._16_8_;
      uStack_3610 = uStack_3750;
      uStack_3748 = auVar6._24_8_;
      uStack_3608 = uStack_3748;
      local_3640 = local_37e0._0_8_;
      uStack_3638 = local_37e0._8_8_;
      uStack_3630 = local_37e0._16_8_;
      uStack_3628 = local_37e0._24_8_;
      _local_3780 = vsubps_avx(auVar6,local_37e0);
      local_1cc8 = local_3780;
      local_1c30 = ::_ps256_cephes_exp_C1;
      local_1bc0 = local_3740._0_8_;
      uStack_1bb8 = local_3740._8_8_;
      uStack_1bb0 = local_3740._16_8_;
      uStack_1ba8 = local_3740._24_8_;
      local_1c20[0] = 0.6933594;
      local_1c20[1] = 0.6933594;
      afStack_1c18[0] = 0.6933594;
      afStack_1c18[1] = 0.6933594;
      afStack_1c10[0] = 0.6933594;
      afStack_1c10[1] = 0.6933594;
      afStack_1c08[0] = 0.6933594;
      afStack_1c08[1] = 0.6933594;
      local_1c00._0_4_ = local_3780._0_4_;
      local_1c00._4_4_ = local_3780._4_4_;
      uStack_1bf8._0_4_ = local_3780._8_4_;
      uStack_1bf8._4_4_ = local_3780._12_4_;
      uStack_1bf0._0_4_ = local_3780._16_4_;
      uStack_1bf0._4_4_ = local_3780._20_4_;
      uStack_1be8._0_4_ = local_3780._24_4_;
      uStack_1be8._4_4_ = local_3780._28_4_;
      fStack_1bc4 = uStack_1be8._4_4_;
      local_1be0 = (float)local_1c00 * 0.6933594;
      fStack_1bdc = local_1c00._4_4_ * 0.6933594;
      fStack_1bd8 = (float)uStack_1bf8 * 0.6933594;
      fStack_1bd4 = uStack_1bf8._4_4_ * 0.6933594;
      fStack_1bd0 = (float)uStack_1bf0 * 0.6933594;
      fStack_1bcc = uStack_1bf0._4_4_ * 0.6933594;
      fStack_1bc8 = (float)uStack_1be8 * 0.6933594;
      auVar45._4_4_ = fStack_1bdc;
      auVar45._0_4_ = local_1be0;
      auVar45._8_4_ = fStack_1bd8;
      auVar45._12_4_ = fStack_1bd4;
      auVar45._16_4_ = fStack_1bd0;
      auVar45._20_4_ = fStack_1bcc;
      auVar45._24_4_ = fStack_1bc8;
      auVar45._28_4_ = uStack_1be8._4_4_;
      auVar5 = vsubps_avx(auVar4,auVar45);
      local_1cd0 = ::_ps256_cephes_exp_C2;
      local_3740._0_8_ = auVar5._0_8_;
      local_1c60 = local_3740._0_8_;
      local_3740._8_8_ = auVar5._8_8_;
      uStack_1c58 = local_3740._8_8_;
      local_3740._16_8_ = auVar5._16_8_;
      uStack_1c50 = local_3740._16_8_;
      local_3740._24_8_ = auVar5._24_8_;
      uStack_1c48 = local_3740._24_8_;
      local_1ca0 = local_3780;
      uStack_1c98 = uStack_3778;
      uStack_1c90 = uStack_3770;
      uStack_1c88 = uStack_3768;
      local_1cc0[0] = -0.00021219444;
      local_1cc0[1] = -0.00021219444;
      afStack_1cb8[0] = -0.00021219444;
      afStack_1cb8[1] = -0.00021219444;
      afStack_1cb0[0] = -0.00021219444;
      afStack_1cb0[1] = -0.00021219444;
      afStack_1ca8[0] = -0.00021219444;
      afStack_1ca8[1] = -0.00021219444;
      fStack_1c64 = uStack_1be8._4_4_;
      local_1c80 = (float)local_1c00 * -0.00021219444;
      fStack_1c7c = local_1c00._4_4_ * -0.00021219444;
      fStack_1c78 = (float)uStack_1bf8 * -0.00021219444;
      fStack_1c74 = uStack_1bf8._4_4_ * -0.00021219444;
      fStack_1c70 = (float)uStack_1bf0 * -0.00021219444;
      fStack_1c6c = uStack_1bf0._4_4_ * -0.00021219444;
      fStack_1c68 = (float)uStack_1be8 * -0.00021219444;
      auVar44._4_4_ = fStack_1c7c;
      auVar44._0_4_ = local_1c80;
      auVar44._8_4_ = fStack_1c78;
      auVar44._12_4_ = fStack_1c74;
      auVar44._16_4_ = fStack_1c70;
      auVar44._20_4_ = fStack_1c6c;
      auVar44._24_4_ = fStack_1c68;
      auVar44._28_4_ = uStack_1be8._4_4_;
      local_3740 = vsubps_avx(auVar5,auVar44);
      local_36e0 = local_3740._0_8_;
      uStack_36d8 = local_3740._8_8_;
      uStack_36d0 = local_3740._16_8_;
      uStack_36c8 = local_3740._24_8_;
      local_36c0._0_4_ = local_3740._0_4_;
      local_36c0._4_4_ = local_3740._4_4_;
      uStack_36b8._0_4_ = local_3740._8_4_;
      uStack_36b8._4_4_ = local_3740._12_4_;
      uStack_36b0._0_4_ = local_3740._16_4_;
      uStack_36b0._4_4_ = local_3740._20_4_;
      uStack_36a8._0_4_ = local_3740._24_4_;
      uStack_36a8._4_4_ = local_3740._28_4_;
      local_3760 = CONCAT44(local_36c0._4_4_ * local_36c0._4_4_,
                            (float)local_36c0 * (float)local_36c0);
      uStack_3758._0_4_ = (float)uStack_36b8 * (float)uStack_36b8;
      uStack_3758._4_4_ = uStack_36b8._4_4_ * uStack_36b8._4_4_;
      uStack_3750._0_4_ = (float)uStack_36b0 * (float)uStack_36b0;
      uStack_3750._4_4_ = uStack_36b0._4_4_ * uStack_36b0._4_4_;
      auVar91 = _local_3760;
      uStack_3748._0_4_ = (float)uStack_36a8 * (float)uStack_36a8;
      uStack_3748._4_4_ = uStack_36a8._4_4_;
      auVar36 = _local_3760;
      local_28a8 = &local_3800;
      local_2598 = ::_ps256_cephes_exp_p1;
      local_2560 = 0x3950696739506967;
      uStack_2558 = 0x3950696739506967;
      uStack_2550 = 0x3950696739506967;
      uStack_2548 = 0x3950696739506967;
      local_2580 = local_3740._0_8_;
      uStack_2578 = local_3740._8_8_;
      uStack_2570 = local_3740._16_8_;
      uStack_2568 = local_3740._24_8_;
      fStack_2504 = uStack_36a8._4_4_;
      local_2520 = (float)local_36c0 * 0.00019875691;
      fStack_251c = local_36c0._4_4_ * 0.00019875691;
      fStack_2518 = (float)uStack_36b8 * 0.00019875691;
      fStack_2514 = uStack_36b8._4_4_ * 0.00019875691;
      fStack_2510 = (float)uStack_36b0 * 0.00019875691;
      fStack_250c = uStack_36b0._4_4_ * 0.00019875691;
      fStack_2508 = (float)uStack_36a8 * 0.00019875691;
      local_2540[0] = 0.0013981999;
      local_2540[1] = 0.0013981999;
      afStack_2538[0] = 0.0013981999;
      afStack_2538[1] = 0.0013981999;
      afStack_2530[0] = 0.0013981999;
      afStack_2530[1] = 0.0013981999;
      afStack_2528[0] = 0.0013981999;
      afStack_2528[1] = 0.0013981999;
      local_3800 = CONCAT44(fStack_251c + 0.0013981999,local_2520 + 0.0013981999);
      uStack_37f8 = CONCAT44(fStack_2514 + 0.0013981999,fStack_2518 + 0.0013981999);
      uStack_37f0 = CONCAT44(fStack_250c + 0.0013981999,fStack_2510 + 0.0013981999);
      uStack_37e8 = CONCAT44(uStack_36a8._4_4_ + 0.0013981999,fStack_2508 + 0.0013981999);
      local_2638 = ::_ps256_cephes_exp_p2;
      local_2600 = local_3800;
      uStack_25f8 = uStack_37f8;
      uStack_25f0 = uStack_37f0;
      uStack_25e8 = uStack_37e8;
      local_2620 = local_3740._0_8_;
      uStack_2618 = local_3740._8_8_;
      uStack_2610 = local_3740._16_8_;
      uStack_2608 = local_3740._24_8_;
      fStack_25a4 = uStack_36a8._4_4_;
      local_25c0 = (local_2520 + 0.0013981999) * (float)local_36c0;
      fStack_25bc = (fStack_251c + 0.0013981999) * local_36c0._4_4_;
      fStack_25b8 = (fStack_2518 + 0.0013981999) * (float)uStack_36b8;
      fStack_25b4 = (fStack_2514 + 0.0013981999) * uStack_36b8._4_4_;
      fStack_25b0 = (fStack_2510 + 0.0013981999) * (float)uStack_36b0;
      fStack_25ac = (fStack_250c + 0.0013981999) * uStack_36b0._4_4_;
      fStack_25a8 = (fStack_2508 + 0.0013981999) * (float)uStack_36a8;
      local_25e0[0] = 0.008333452;
      local_25e0[1] = 0.008333452;
      afStack_25d8[0] = 0.008333452;
      afStack_25d8[1] = 0.008333452;
      afStack_25d0[0] = 0.008333452;
      afStack_25d0[1] = 0.008333452;
      afStack_25c8[0] = 0.008333452;
      afStack_25c8[1] = 0.008333452;
      local_3800 = CONCAT44(fStack_25bc + 0.008333452,local_25c0 + 0.008333452);
      uStack_37f8 = CONCAT44(fStack_25b4 + 0.008333452,fStack_25b8 + 0.008333452);
      uStack_37f0 = CONCAT44(fStack_25ac + 0.008333452,fStack_25b0 + 0.008333452);
      uStack_37e8 = CONCAT44(uStack_36a8._4_4_ + 0.008333452,fStack_25a8 + 0.008333452);
      local_26d8 = ::_ps256_cephes_exp_p3;
      local_26a0 = local_3800;
      uStack_2698 = uStack_37f8;
      uStack_2690 = uStack_37f0;
      uStack_2688 = uStack_37e8;
      local_26c0 = local_3740._0_8_;
      uStack_26b8 = local_3740._8_8_;
      uStack_26b0 = local_3740._16_8_;
      uStack_26a8 = local_3740._24_8_;
      fStack_2644 = uStack_36a8._4_4_;
      local_2660 = (local_25c0 + 0.008333452) * (float)local_36c0;
      fStack_265c = (fStack_25bc + 0.008333452) * local_36c0._4_4_;
      fStack_2658 = (fStack_25b8 + 0.008333452) * (float)uStack_36b8;
      fStack_2654 = (fStack_25b4 + 0.008333452) * uStack_36b8._4_4_;
      fStack_2650 = (fStack_25b0 + 0.008333452) * (float)uStack_36b0;
      fStack_264c = (fStack_25ac + 0.008333452) * uStack_36b0._4_4_;
      fStack_2648 = (fStack_25a8 + 0.008333452) * (float)uStack_36a8;
      local_2680[0] = 0.041665796;
      local_2680[1] = 0.041665796;
      afStack_2678[0] = 0.041665796;
      afStack_2678[1] = 0.041665796;
      afStack_2670[0] = 0.041665796;
      afStack_2670[1] = 0.041665796;
      afStack_2668[0] = 0.041665796;
      afStack_2668[1] = 0.041665796;
      local_3800 = CONCAT44(fStack_265c + 0.041665796,local_2660 + 0.041665796);
      uStack_37f8 = CONCAT44(fStack_2654 + 0.041665796,fStack_2658 + 0.041665796);
      uStack_37f0 = CONCAT44(fStack_264c + 0.041665796,fStack_2650 + 0.041665796);
      uStack_37e8 = CONCAT44(uStack_36a8._4_4_ + 0.041665796,fStack_2648 + 0.041665796);
      local_2778 = ::_ps256_cephes_exp_p4;
      local_2740 = local_3800;
      uStack_2738 = uStack_37f8;
      uStack_2730 = uStack_37f0;
      uStack_2728 = uStack_37e8;
      local_2760 = local_3740._0_8_;
      uStack_2758 = local_3740._8_8_;
      uStack_2750 = local_3740._16_8_;
      uStack_2748 = local_3740._24_8_;
      fStack_26e4 = uStack_36a8._4_4_;
      local_2700 = (local_2660 + 0.041665796) * (float)local_36c0;
      fStack_26fc = (fStack_265c + 0.041665796) * local_36c0._4_4_;
      fStack_26f8 = (fStack_2658 + 0.041665796) * (float)uStack_36b8;
      fStack_26f4 = (fStack_2654 + 0.041665796) * uStack_36b8._4_4_;
      fStack_26f0 = (fStack_2650 + 0.041665796) * (float)uStack_36b0;
      fStack_26ec = (fStack_264c + 0.041665796) * uStack_36b0._4_4_;
      fStack_26e8 = (fStack_2648 + 0.041665796) * (float)uStack_36a8;
      local_2720[0] = 0.16666666;
      local_2720[1] = 0.16666666;
      afStack_2718[0] = 0.16666666;
      afStack_2718[1] = 0.16666666;
      afStack_2710[0] = 0.16666666;
      afStack_2710[1] = 0.16666666;
      afStack_2708[0] = 0.16666666;
      afStack_2708[1] = 0.16666666;
      local_3800 = CONCAT44(fStack_26fc + 0.16666666,local_2700 + 0.16666666);
      uStack_37f8 = CONCAT44(fStack_26f4 + 0.16666666,fStack_26f8 + 0.16666666);
      uStack_37f0 = CONCAT44(fStack_26ec + 0.16666666,fStack_26f0 + 0.16666666);
      uStack_37e8 = CONCAT44(uStack_36a8._4_4_ + 0.16666666,fStack_26e8 + 0.16666666);
      local_2818 = ::_ps256_cephes_exp_p5;
      local_27e0 = local_3800;
      uStack_27d8 = uStack_37f8;
      uStack_27d0 = uStack_37f0;
      uStack_27c8 = uStack_37e8;
      local_2800 = local_3740._0_8_;
      uStack_27f8 = local_3740._8_8_;
      uStack_27f0 = local_3740._16_8_;
      uStack_27e8 = local_3740._24_8_;
      fStack_2784 = uStack_36a8._4_4_;
      local_27a0 = (local_2700 + 0.16666666) * (float)local_36c0;
      fStack_279c = (fStack_26fc + 0.16666666) * local_36c0._4_4_;
      fStack_2798 = (fStack_26f8 + 0.16666666) * (float)uStack_36b8;
      fStack_2794 = (fStack_26f4 + 0.16666666) * uStack_36b8._4_4_;
      fStack_2790 = (fStack_26f0 + 0.16666666) * (float)uStack_36b0;
      fStack_278c = (fStack_26ec + 0.16666666) * uStack_36b0._4_4_;
      fStack_2788 = (fStack_26e8 + 0.16666666) * (float)uStack_36a8;
      local_27c0[0] = 0.5;
      local_27c0[1] = 0.5;
      afStack_27b8[0] = 0.5;
      afStack_27b8[1] = 0.5;
      afStack_27b0[0] = 0.5;
      afStack_27b0[1] = 0.5;
      afStack_27a8[0] = 0.5;
      afStack_27a8[1] = 0.5;
      local_3800 = CONCAT44(fStack_279c + 0.5,local_27a0 + 0.5);
      uStack_37f8 = CONCAT44(fStack_2794 + 0.5,fStack_2798 + 0.5);
      uStack_37f0 = CONCAT44(fStack_278c + 0.5,fStack_2790 + 0.5);
      uStack_37e8 = CONCAT44(uStack_36a8._4_4_ + 0.5,fStack_2788 + 0.5);
      local_28b0 = &local_3760;
      local_2880 = local_3800;
      uStack_2878 = uStack_37f8;
      uStack_2870 = uStack_37f0;
      uStack_2868 = uStack_37e8;
      local_28a0 = local_3760;
      uStack_2898 = uStack_3758;
      uStack_3750 = auVar91._16_8_;
      uStack_2890 = uStack_3750;
      uStack_3748 = auVar36._24_8_;
      uStack_2888 = uStack_3748;
      fStack_2824 = uStack_36a8._4_4_;
      local_2840 = (local_27a0 + 0.5) * (float)local_36c0 * (float)local_36c0;
      fStack_283c = (fStack_279c + 0.5) * local_36c0._4_4_ * local_36c0._4_4_;
      fStack_2838 = (fStack_2798 + 0.5) * (float)uStack_36b8 * (float)uStack_36b8;
      fStack_2834 = (fStack_2794 + 0.5) * uStack_36b8._4_4_ * uStack_36b8._4_4_;
      fStack_2830 = (fStack_2790 + 0.5) * (float)uStack_36b0 * (float)uStack_36b0;
      fStack_282c = (fStack_278c + 0.5) * uStack_36b0._4_4_ * uStack_36b0._4_4_;
      fStack_2828 = (fStack_2788 + 0.5) * (float)uStack_36a8 * (float)uStack_36a8;
      local_2860 = local_3740._0_8_;
      uStack_2858 = local_3740._8_8_;
      uStack_2850 = local_3740._16_8_;
      uStack_2848 = local_3740._24_8_;
      local_3800 = CONCAT44(fStack_283c + local_36c0._4_4_,local_2840 + (float)local_36c0);
      uStack_37f8 = CONCAT44(fStack_2834 + uStack_36b8._4_4_,fStack_2838 + (float)uStack_36b8);
      uStack_37f0 = CONCAT44(fStack_282c + uStack_36b0._4_4_,fStack_2830 + (float)uStack_36b0);
      uStack_37e8 = CONCAT44(uStack_36a8._4_4_ + uStack_36a8._4_4_,fStack_2828 + (float)uStack_36a8)
      ;
      local_3680 = local_3800;
      uStack_3678 = uStack_37f8;
      uStack_3670 = uStack_37f0;
      uStack_3668 = uStack_37e8;
      local_36a0 = 0x3f8000003f800000;
      uStack_3698 = 0x3f8000003f800000;
      uStack_3690 = 0x3f8000003f800000;
      uStack_3688 = 0x3f8000003f800000;
      fVar92 = local_2840 + (float)local_36c0 + 1.0;
      fVar93 = fStack_283c + local_36c0._4_4_ + 1.0;
      fVar94 = fStack_2838 + (float)uStack_36b8 + 1.0;
      fVar95 = fStack_2834 + uStack_36b8._4_4_ + 1.0;
      fVar96 = fStack_2830 + (float)uStack_36b0 + 1.0;
      fVar97 = fStack_282c + uStack_36b0._4_4_ + 1.0;
      fVar98 = fStack_2828 + (float)uStack_36a8 + 1.0;
      fVar99 = uStack_36a8._4_4_ + uStack_36a8._4_4_ + 1.0;
      local_3800 = CONCAT44(fVar93,fVar92);
      uStack_37f8 = CONCAT44(fVar95,fVar94);
      uStack_37f0 = CONCAT44(fVar97,fVar96);
      uStack_37e8 = CONCAT44(fVar99,fVar98);
      local_19e0 = local_3780;
      uStack_19d8 = uStack_3778;
      uStack_19d0 = uStack_3770;
      uStack_19c8 = uStack_3768;
      local_37a0 = CONCAT44((int)local_1c00._4_4_,(int)(float)local_1c00);
      uStack_3798 = CONCAT44((int)uStack_1bf8._4_4_,(int)(float)uStack_1bf8);
      uStack_3790 = CONCAT44((int)uStack_1bf0._4_4_,(int)(float)uStack_1bf0);
      uStack_3788 = CONCAT44((int)uStack_1be8._4_4_,(int)(float)uStack_1be8);
      local_17e0 = local_37a0;
      uStack_17d8 = uStack_3798;
      uStack_17d0 = uStack_3790;
      uStack_17c8 = uStack_3788;
      local_2d80 = 0x7f0000007f;
      uStack_2d78 = 0x7f0000007f;
      uStack_2d70 = 0x7f0000007f;
      uStack_2d68 = 0x7f0000007f;
      local_1880 = local_37a0;
      uStack_1878 = uStack_3798;
      uStack_1870 = uStack_3790;
      uStack_1868 = uStack_3788;
      local_18a0 = 0x7f0000007f;
      uStack_1898 = 0x7f0000007f;
      uStack_1890 = 0x7f0000007f;
      uStack_1888 = 0x7f0000007f;
      local_1830 = 0x7f0000007f;
      uStack_1828 = 0x7f0000007f;
      local_1840 = 0x7f0000007f;
      uStack_1838 = 0x7f0000007f;
      local_15d0 = local_37a0;
      uStack_15c8 = uStack_3798;
      local_15e0 = 0x7f0000007f;
      uStack_15d8 = 0x7f0000007f;
      auVar51._8_8_ = uStack_3798;
      auVar51._0_8_ = local_37a0;
      auVar50._8_8_ = 0x7f0000007f;
      auVar50._0_8_ = 0x7f0000007f;
      local_1810 = vpaddd_avx(auVar51,auVar50);
      local_15f0 = uStack_3790;
      uStack_15e8 = uStack_3788;
      local_1600 = 0x7f0000007f;
      uStack_15f8 = 0x7f0000007f;
      auVar49._8_8_ = uStack_3788;
      auVar49._0_8_ = uStack_3790;
      auVar3._8_8_ = 0x7f0000007f;
      auVar3._0_8_ = 0x7f0000007f;
      local_1820 = vpaddd_avx(auVar49,auVar3);
      local_18c0 = local_1810._0_8_;
      uStack_18b8 = local_1810._8_8_;
      uStack_18b0 = local_1820._0_8_;
      uStack_18a8 = local_1820._8_8_;
      local_1860 = local_1810._0_8_;
      uStack_1858 = local_1810._8_8_;
      uStack_1850 = local_1820._0_8_;
      uStack_1848 = local_1820._8_8_;
      local_1660 = local_1810._0_8_;
      uStack_1658 = local_1810._8_8_;
      uStack_1650 = local_1820._0_8_;
      uStack_1648 = local_1820._8_8_;
      local_1664 = 0x17;
      local_16e0 = local_1810._0_8_;
      uStack_16d8 = local_1810._8_8_;
      uStack_16d0 = local_1820._0_8_;
      uStack_16c8 = local_1820._8_8_;
      local_1550 = local_1810._0_8_;
      uStack_1548 = local_1810._8_8_;
      local_1554 = 0x17;
      local_1680 = vpslld_avx(local_1810,ZEXT416(0x17));
      local_1570 = local_1820._0_8_;
      uStack_1568 = local_1820._8_8_;
      local_1574 = 0x17;
      local_1690 = vpslld_avx(local_1820,ZEXT416(0x17));
      local_1700 = local_1680._0_8_;
      uStack_16f8 = local_1680._8_8_;
      uStack_16f0 = local_1690._0_8_;
      uStack_16e8 = local_1690._8_8_;
      local_16c0 = local_1680._0_8_;
      uStack_16b8 = local_1680._8_8_;
      uStack_16b0 = local_1690._0_8_;
      uStack_16a8 = local_1690._8_8_;
      local_37a0 = local_1680._0_8_;
      uStack_3798 = local_1680._8_8_;
      uStack_3790 = local_1690._0_8_;
      uStack_3788 = local_1690._8_8_;
      local_1620 = local_1680._0_8_;
      uStack_1618 = local_1680._8_8_;
      uStack_1610 = local_1690._0_8_;
      uStack_1608 = local_1690._8_8_;
      local_3820 = local_1680._0_8_;
      uStack_3818 = local_1680._8_8_;
      uStack_3810 = local_1690._0_8_;
      uStack_3808 = local_1690._8_8_;
      local_3700 = local_3800;
      uStack_36f8 = uStack_37f8;
      uStack_36f0 = uStack_37f0;
      uStack_36e8 = uStack_37e8;
      local_3720._0_4_ = local_1680._0_4_;
      local_3720._4_4_ = local_1680._4_4_;
      uStack_3718._0_4_ = local_1680._8_4_;
      uStack_3718._4_4_ = local_1680._12_4_;
      uStack_3710._0_4_ = local_1690._0_4_;
      uStack_3710._4_4_ = local_1690._4_4_;
      uStack_3708._0_4_ = local_1690._8_4_;
      fVar92 = fVar92 * (float)local_3720;
      fVar93 = fVar93 * local_3720._4_4_;
      fVar94 = fVar94 * (float)uStack_3718;
      fVar95 = fVar95 * uStack_3718._4_4_;
      fVar96 = fVar96 * (float)uStack_3710;
      fVar97 = fVar97 * uStack_3710._4_4_;
      fVar98 = fVar98 * (float)uStack_3708;
      local_3800 = CONCAT44(fVar93,fVar92);
      uStack_37f8 = CONCAT44(fVar95,fVar94);
      uStack_37f0 = CONCAT44(fVar97,fVar96);
      uStack_37e8 = CONCAT44(fVar99,fVar98);
      local_3840 = local_3800;
      uStack_3838 = uStack_37f8;
      uStack_3830 = uStack_37f0;
      uStack_3828 = uStack_37e8;
      local_3644 = 0x3f800000;
      local_14a0 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_14c0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_14b0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_3860._0_4_ = local_14c0._0_4_;
      local_3860._4_4_ = local_14c0._4_4_;
      uStack_3858._0_4_ = local_14c0._8_4_;
      uStack_3858._4_4_ = local_14c0._12_4_;
      uStack_3850._0_4_ = auStack_14b0._0_4_;
      uStack_3850._4_4_ = auStack_14b0._4_4_;
      uStack_3848._0_4_ = auStack_14b0._8_4_;
      uStack_3848._4_4_ = auStack_14b0._12_4_;
      local_3a00._4_4_ = fVar93 + local_3860._4_4_;
      local_3a00._0_4_ = fVar92 + (float)local_3860;
      uStack_39f8._0_4_ = fVar94 + (float)uStack_3858;
      uStack_39f8._4_4_ = fVar95 + uStack_3858._4_4_;
      uStack_39f0._0_4_ = fVar96 + (float)uStack_3850;
      uStack_39f0._4_4_ = fVar97 + uStack_3850._4_4_;
      auVar91 = _local_3a00;
      uStack_39e8._0_4_ = fVar98 + (float)uStack_3848;
      uStack_39e8._4_4_ = fVar99 + uStack_3848._4_4_;
      auVar5 = _local_3a00;
      local_3a60 = vcmpps_avx(_local_3a00,local_31e0,2);
      local_3100 = local_3a00;
      uStack_30f8 = uStack_39f8;
      uStack_39f0 = auVar91._16_8_;
      uStack_30f0 = uStack_39f0;
      uStack_39e8 = auVar5._24_8_;
      uStack_30e8 = uStack_39e8;
      local_3120 = 0x80000000800000;
      uStack_3118 = 0x80000000800000;
      uStack_3110 = 0x80000000800000;
      uStack_3108 = 0x80000000800000;
      auVar34._16_8_ = uStack_39f0;
      auVar34._0_16_ = _local_3a00;
      auVar34._24_8_ = uStack_39e8;
      auVar33._8_8_ = 0x80000000800000;
      auVar33._0_8_ = 0x80000000800000;
      auVar33._16_8_ = 0x80000000800000;
      auVar33._24_8_ = 0x80000000800000;
      auVar5 = vmaxps_avx(auVar34,auVar33);
      local_3a00 = auVar5._0_8_;
      local_3020 = local_3a00;
      uStack_39f8 = auVar5._8_8_;
      uStack_3018 = uStack_39f8;
      uStack_39f0 = auVar5._16_8_;
      uStack_3010 = uStack_39f0;
      uStack_39e8 = auVar5._24_8_;
      uStack_3008 = uStack_39e8;
      local_3040 = local_3a00;
      uStack_3038 = uStack_39f8;
      uStack_3030 = uStack_39f0;
      uStack_3028 = uStack_39e8;
      local_3044 = 0x17;
      local_30c0 = local_3a00;
      uStack_30b8 = uStack_39f8;
      uStack_30b0 = uStack_39f0;
      uStack_30a8 = uStack_39e8;
      local_1ad0 = local_3a00;
      uStack_1ac8 = uStack_39f8;
      local_1ad4 = 0x17;
      local_3060 = vpsrld_avx(auVar5._0_16_,ZEXT416(0x17));
      local_1af0 = uStack_39f0;
      uStack_1ae8 = uStack_39e8;
      local_1af4 = 0x17;
      local_3070 = vpsrld_avx(auVar5._16_16_,ZEXT416(0x17));
      local_30e0 = local_3060._0_8_;
      uStack_30d8 = local_3060._8_8_;
      uStack_30d0 = local_3070._0_8_;
      uStack_30c8 = local_3070._8_8_;
      local_30a0 = local_3060._0_8_;
      uStack_3098 = local_3060._8_8_;
      uStack_3090 = local_3070._0_8_;
      uStack_3088 = local_3070._8_8_;
      local_2ee0 = local_3a00;
      uStack_2ed8 = uStack_39f8;
      uStack_2ed0 = uStack_39f0;
      uStack_2ec8 = uStack_39e8;
      local_2f00 = 0x807fffff807fffff;
      uStack_2ef8 = 0x807fffff807fffff;
      uStack_2ef0 = 0x807fffff807fffff;
      uStack_2ee8 = 0x807fffff807fffff;
      auVar38._8_8_ = 0x807fffff807fffff;
      auVar38._0_8_ = 0x807fffff807fffff;
      auVar38._16_8_ = 0x807fffff807fffff;
      auVar38._24_8_ = 0x807fffff807fffff;
      auVar5 = vandps_avx(auVar5,auVar38);
      local_3a00 = auVar5._0_8_;
      local_2e60 = local_3a00;
      uStack_39f8 = auVar5._8_8_;
      uStack_2e58 = uStack_39f8;
      uStack_39f0 = auVar5._16_8_;
      uStack_2e50 = uStack_39f0;
      uStack_39e8 = auVar5._24_8_;
      uStack_2e48 = uStack_39e8;
      local_2e80 = 0x3f0000003f000000;
      uStack_2e78 = 0x3f0000003f000000;
      uStack_2e70 = 0x3f0000003f000000;
      uStack_2e68 = 0x3f0000003f000000;
      auVar40._8_8_ = 0x3f0000003f000000;
      auVar40._0_8_ = 0x3f0000003f000000;
      auVar40._16_8_ = 0x3f0000003f000000;
      auVar40._24_8_ = 0x3f0000003f000000;
      auVar4 = vorps_avx(auVar5,auVar40);
      local_2d60 = local_3060._0_8_;
      uStack_2d58 = local_3060._8_8_;
      uStack_2d50 = local_3070._0_8_;
      uStack_2d48 = local_3070._8_8_;
      local_2e00 = local_3060._0_8_;
      uStack_2df8 = local_3060._8_8_;
      uStack_2df0 = local_3070._0_8_;
      uStack_2de8 = local_3070._8_8_;
      local_2e20 = 0x7f0000007f;
      uStack_2e18 = 0x7f0000007f;
      uStack_2e10 = 0x7f0000007f;
      uStack_2e08 = 0x7f0000007f;
      local_2db0 = 0x7f0000007f;
      uStack_2da8 = 0x7f0000007f;
      local_2dc0 = 0x7f0000007f;
      uStack_2db8 = 0x7f0000007f;
      local_1a90 = local_3060._0_8_;
      uStack_1a88 = local_3060._8_8_;
      local_1aa0 = 0x7f0000007f;
      uStack_1a98 = 0x7f0000007f;
      auVar1._8_8_ = 0x7f0000007f;
      auVar1._0_8_ = 0x7f0000007f;
      local_2d90 = vpsubd_avx(local_3060,auVar1);
      local_1ab0 = local_3070._0_8_;
      uStack_1aa8 = local_3070._8_8_;
      local_1ac0 = 0x7f0000007f;
      uStack_1ab8 = 0x7f0000007f;
      auVar2._8_8_ = 0x7f0000007f;
      auVar2._0_8_ = 0x7f0000007f;
      local_2da0 = vpsubd_avx(local_3070,auVar2);
      local_2e40 = local_2d90._0_8_;
      uStack_2e38 = local_2d90._8_8_;
      uStack_2e30 = local_2da0._0_8_;
      uStack_2e28 = local_2da0._8_8_;
      local_2de0 = local_2d90._0_8_;
      uStack_2dd8 = local_2d90._8_8_;
      uStack_2dd0 = local_2da0._0_8_;
      uStack_2dc8 = local_2da0._8_8_;
      local_3a20 = local_2d90._0_8_;
      uStack_3a18 = local_2d90._8_8_;
      uStack_3a10 = local_2da0._0_8_;
      uStack_3a08 = local_2da0._8_8_;
      local_2d40 = local_2d90._0_8_;
      uStack_2d38 = local_2d90._8_8_;
      uStack_2d30 = local_2da0._0_8_;
      uStack_2d28 = local_2da0._8_8_;
      auVar41._16_8_ = local_2da0._0_8_;
      auVar41._0_16_ = local_2d90;
      auVar41._24_8_ = local_2da0._8_8_;
      auVar5 = vcvtdq2ps_avx(auVar41);
      local_3a80 = auVar5._0_8_;
      uVar11 = local_3a80;
      uStack_3a78 = auVar5._8_8_;
      uVar12 = uStack_3a78;
      uStack_3a70 = auVar5._16_8_;
      uVar13 = uStack_3a70;
      uStack_3a68 = auVar5._24_8_;
      uVar14 = uStack_3a68;
      local_38a0 = 0x3f8000003f800000;
      uStack_3898 = 0x3f8000003f800000;
      uStack_3890 = 0x3f8000003f800000;
      uStack_3888 = 0x3f8000003f800000;
      local_3880._0_4_ = auVar5._0_4_;
      local_3880._4_4_ = auVar5._4_4_;
      uStack_3878._0_4_ = auVar5._8_4_;
      uStack_3878._4_4_ = auVar5._12_4_;
      uStack_3870._0_4_ = auVar5._16_4_;
      uStack_3870._4_4_ = auVar5._20_4_;
      uStack_3868._0_4_ = auVar5._24_4_;
      uStack_3868._4_4_ = auVar5._28_4_;
      local_3a80._4_4_ = local_3880._4_4_ + 1.0;
      local_3a80._0_4_ = (float)local_3880 + 1.0;
      uStack_3a78._0_4_ = (float)uStack_3878 + 1.0;
      uStack_3a78._4_4_ = uStack_3878._4_4_ + 1.0;
      uStack_3a70._0_4_ = (float)uStack_3870 + 1.0;
      uStack_3a70._4_4_ = uStack_3870._4_4_ + 1.0;
      auVar91 = _local_3a80;
      uStack_3a68._0_4_ = (float)uStack_3868 + 1.0;
      uStack_3a68._4_4_ = uStack_3868._4_4_ + 1.0;
      auVar28 = _local_3a80;
      local_3aa0 = vcmpps_avx(auVar4,_DAT_01f8f720,1);
      local_3a00 = auVar4._0_8_;
      local_2f20 = local_3a00;
      uStack_39f8 = auVar4._8_8_;
      uStack_2f18 = uStack_39f8;
      uStack_39f0 = auVar4._16_8_;
      uStack_2f10 = uStack_39f0;
      uStack_39e8 = auVar4._24_8_;
      uStack_2f08 = uStack_39e8;
      local_2f40 = local_3aa0._0_8_;
      uStack_2f38 = local_3aa0._8_8_;
      uStack_2f30 = local_3aa0._16_8_;
      uStack_2f28 = local_3aa0._24_8_;
      local_3ac0 = vandps_avx(auVar4,local_3aa0);
      local_35a0 = local_3a00;
      uStack_3598 = uStack_39f8;
      uStack_3590 = uStack_39f0;
      uStack_3588 = uStack_39e8;
      local_35c0 = 0x3f8000003f800000;
      uStack_35b8 = 0x3f8000003f800000;
      uStack_35b0 = 0x3f8000003f800000;
      uStack_35a8 = 0x3f8000003f800000;
      auVar6._8_8_ = 0x3f8000003f800000;
      auVar6._0_8_ = 0x3f8000003f800000;
      auVar6._16_8_ = 0x3f8000003f800000;
      auVar6._24_8_ = 0x3f8000003f800000;
      auVar5 = vsubps_avx(auVar4,auVar6);
      local_35e0 = local_3a80;
      uStack_35d8 = uStack_3a78;
      uStack_3a70 = auVar91._16_8_;
      uStack_35d0 = uStack_3a70;
      uStack_3a68 = auVar28._24_8_;
      uStack_35c8 = uStack_3a68;
      local_2f60 = 0x3f8000003f800000;
      uStack_2f58 = 0x3f8000003f800000;
      uStack_2f50 = 0x3f8000003f800000;
      uStack_2f48 = 0x3f8000003f800000;
      local_2f80 = local_3aa0._0_8_;
      uStack_2f78 = local_3aa0._8_8_;
      uStack_2f70 = local_3aa0._16_8_;
      uStack_2f68 = local_3aa0._24_8_;
      auVar37._8_8_ = 0x3f8000003f800000;
      auVar37._0_8_ = 0x3f8000003f800000;
      auVar37._16_8_ = 0x3f8000003f800000;
      auVar37._24_8_ = 0x3f8000003f800000;
      local_3600 = vandps_avx(local_3aa0,auVar37);
      auVar4._16_8_ = uStack_3a70;
      auVar4._0_16_ = _local_3a80;
      auVar4._24_8_ = uStack_3a68;
      _local_3a80 = vsubps_avx(auVar4,local_3600);
      local_3a00 = auVar5._0_8_;
      uVar15 = local_3a00;
      uStack_39f8 = auVar5._8_8_;
      uVar16 = uStack_39f8;
      uStack_39f0 = auVar5._16_8_;
      uVar17 = uStack_39f0;
      uStack_39e8 = auVar5._24_8_;
      uVar18 = uStack_39e8;
      local_38c0._0_4_ = auVar5._0_4_;
      local_38c0._4_4_ = auVar5._4_4_;
      uStack_38b8._0_4_ = auVar5._8_4_;
      uStack_38b8._4_4_ = auVar5._12_4_;
      uStack_38b0._0_4_ = auVar5._16_4_;
      uStack_38b0._4_4_ = auVar5._20_4_;
      uStack_38a8._0_4_ = auVar5._24_4_;
      uStack_38a8._4_4_ = auVar5._28_4_;
      local_38e0._0_4_ = local_3ac0._0_4_;
      local_38e0._4_4_ = local_3ac0._4_4_;
      uStack_38d8._0_4_ = local_3ac0._8_4_;
      uStack_38d8._4_4_ = local_3ac0._12_4_;
      uStack_38d0._0_4_ = local_3ac0._16_4_;
      uStack_38d0._4_4_ = local_3ac0._20_4_;
      uStack_38c8._0_4_ = local_3ac0._24_4_;
      uStack_38c8._4_4_ = local_3ac0._28_4_;
      local_38c0._0_4_ = (float)local_38c0 + (float)local_38e0;
      local_38c0._4_4_ = local_38c0._4_4_ + local_38e0._4_4_;
      uStack_38b8._0_4_ = (float)uStack_38b8 + (float)uStack_38d8;
      uStack_38b8._4_4_ = uStack_38b8._4_4_ + uStack_38d8._4_4_;
      uStack_38b0._0_4_ = (float)uStack_38b0 + (float)uStack_38d0;
      uStack_38b0._4_4_ = uStack_38b0._4_4_ + uStack_38d0._4_4_;
      uStack_38a8._0_4_ = (float)uStack_38a8 + (float)uStack_38c8;
      fStack_3ac4 = uStack_38a8._4_4_ + uStack_38c8._4_4_;
      local_3a00._4_4_ = local_38c0._4_4_;
      local_3a00._0_4_ = (float)local_38c0;
      uStack_39f8._0_4_ = (float)uStack_38b8;
      uStack_39f8._4_4_ = uStack_38b8._4_4_;
      uStack_39f0._0_4_ = (float)uStack_38b0;
      uStack_39f0._4_4_ = uStack_38b0._4_4_;
      auVar91 = _local_3a00;
      uStack_39e8._0_4_ = (float)uStack_38a8;
      uStack_39e8._4_4_ = fStack_3ac4;
      auVar5 = _local_3a00;
      local_3960 = local_3a00;
      uStack_3958 = uStack_39f8;
      uStack_39f0 = auVar91._16_8_;
      uStack_3950 = uStack_39f0;
      uStack_39e8 = auVar5._24_8_;
      uStack_3948 = uStack_39e8;
      local_3ae0 = (float)local_38c0 * (float)local_38c0;
      fStack_3adc = local_38c0._4_4_ * local_38c0._4_4_;
      fStack_3ad8 = (float)uStack_38b8 * (float)uStack_38b8;
      fStack_3ad4 = uStack_38b8._4_4_ * uStack_38b8._4_4_;
      fStack_3ad0 = (float)uStack_38b0 * (float)uStack_38b0;
      fStack_3acc = uStack_38b0._4_4_ * uStack_38b0._4_4_;
      fStack_3ac8 = (float)uStack_38a8 * (float)uStack_38a8;
      local_23b8 = local_3b00;
      local_2458 = local_3a00;
      local_1eb8 = ::_ps256_cephes_log_p1;
      local_1e80 = 0x3d9021bb3d9021bb;
      uStack_1e78 = 0x3d9021bb3d9021bb;
      uStack_1e70 = 0x3d9021bb3d9021bb;
      uStack_1e68 = 0x3d9021bb3d9021bb;
      local_1ea0 = local_3a00;
      uStack_1e98 = uStack_39f8;
      uStack_1e90 = uStack_39f0;
      uStack_1e88 = uStack_39e8;
      local_1e40 = (float)local_38c0 * 0.070376836;
      fStack_1e3c = local_38c0._4_4_ * 0.070376836;
      fStack_1e38 = (float)uStack_38b8 * 0.070376836;
      fStack_1e34 = uStack_38b8._4_4_ * 0.070376836;
      fStack_1e30 = (float)uStack_38b0 * 0.070376836;
      fStack_1e2c = uStack_38b0._4_4_ * 0.070376836;
      fStack_1e28 = (float)uStack_38a8 * 0.070376836;
      local_1e60[0] = -0.1151461;
      local_1e60[1] = -0.1151461;
      afStack_1e58[0] = -0.1151461;
      afStack_1e58[1] = -0.1151461;
      afStack_1e50[0] = -0.1151461;
      afStack_1e50[1] = -0.1151461;
      afStack_1e48[0] = -0.1151461;
      afStack_1e48[1] = -0.1151461;
      local_3b00._4_4_ = fStack_1e3c + -0.1151461;
      local_3b00._0_4_ = local_1e40 + -0.1151461;
      uStack_3af8._0_4_ = fStack_1e38 + -0.1151461;
      uStack_3af8._4_4_ = fStack_1e34 + -0.1151461;
      uStack_3af0._0_4_ = fStack_1e30 + -0.1151461;
      uStack_3af0._4_4_ = fStack_1e2c + -0.1151461;
      auVar91 = _local_3b00;
      uStack_3ae8._0_4_ = fStack_1e28 + -0.1151461;
      uStack_3ae8._4_4_ = fStack_3ac4 + -0.1151461;
      auVar5 = _local_3b00;
      local_1f58 = ::_ps256_cephes_log_p2;
      local_1f20 = local_3b00;
      uStack_1f18 = uStack_3af8;
      uStack_3af0 = auVar91._16_8_;
      uStack_1f10 = uStack_3af0;
      uStack_3ae8 = auVar5._24_8_;
      uStack_1f08 = uStack_3ae8;
      local_1f40 = local_3a00;
      uStack_1f38 = uStack_39f8;
      uStack_1f30 = uStack_39f0;
      uStack_1f28 = uStack_39e8;
      local_1ee0 = (local_1e40 + -0.1151461) * (float)local_38c0;
      fStack_1edc = (fStack_1e3c + -0.1151461) * local_38c0._4_4_;
      fStack_1ed8 = (fStack_1e38 + -0.1151461) * (float)uStack_38b8;
      fStack_1ed4 = (fStack_1e34 + -0.1151461) * uStack_38b8._4_4_;
      fStack_1ed0 = (fStack_1e30 + -0.1151461) * (float)uStack_38b0;
      fStack_1ecc = (fStack_1e2c + -0.1151461) * uStack_38b0._4_4_;
      fStack_1ec8 = (fStack_1e28 + -0.1151461) * (float)uStack_38a8;
      local_1f00[0] = 0.116769984;
      local_1f00[1] = 0.116769984;
      afStack_1ef8[0] = 0.116769984;
      afStack_1ef8[1] = 0.116769984;
      afStack_1ef0[0] = 0.116769984;
      afStack_1ef0[1] = 0.116769984;
      afStack_1ee8[0] = 0.116769984;
      afStack_1ee8[1] = 0.116769984;
      local_3b00._4_4_ = fStack_1edc + 0.116769984;
      local_3b00._0_4_ = local_1ee0 + 0.116769984;
      uStack_3af8._0_4_ = fStack_1ed8 + 0.116769984;
      uStack_3af8._4_4_ = fStack_1ed4 + 0.116769984;
      uStack_3af0._0_4_ = fStack_1ed0 + 0.116769984;
      uStack_3af0._4_4_ = fStack_1ecc + 0.116769984;
      auVar91 = _local_3b00;
      uStack_3ae8._0_4_ = fStack_1ec8 + 0.116769984;
      uStack_3ae8._4_4_ = fStack_3ac4 + 0.116769984;
      auVar5 = _local_3b00;
      local_1ff8 = ::_ps256_cephes_log_p3;
      local_1fc0 = local_3b00;
      uStack_1fb8 = uStack_3af8;
      uStack_3af0 = auVar91._16_8_;
      uStack_1fb0 = uStack_3af0;
      uStack_3ae8 = auVar5._24_8_;
      uStack_1fa8 = uStack_3ae8;
      local_1fe0 = local_3a00;
      uStack_1fd8 = uStack_39f8;
      uStack_1fd0 = uStack_39f0;
      uStack_1fc8 = uStack_39e8;
      local_1f80 = (local_1ee0 + 0.116769984) * (float)local_38c0;
      fStack_1f7c = (fStack_1edc + 0.116769984) * local_38c0._4_4_;
      fStack_1f78 = (fStack_1ed8 + 0.116769984) * (float)uStack_38b8;
      fStack_1f74 = (fStack_1ed4 + 0.116769984) * uStack_38b8._4_4_;
      fStack_1f70 = (fStack_1ed0 + 0.116769984) * (float)uStack_38b0;
      fStack_1f6c = (fStack_1ecc + 0.116769984) * uStack_38b0._4_4_;
      fStack_1f68 = (fStack_1ec8 + 0.116769984) * (float)uStack_38a8;
      local_1fa0[0] = -0.12420141;
      local_1fa0[1] = -0.12420141;
      afStack_1f98[0] = -0.12420141;
      afStack_1f98[1] = -0.12420141;
      afStack_1f90[0] = -0.12420141;
      afStack_1f90[1] = -0.12420141;
      afStack_1f88[0] = -0.12420141;
      afStack_1f88[1] = -0.12420141;
      local_3b00._4_4_ = fStack_1f7c + -0.12420141;
      local_3b00._0_4_ = local_1f80 + -0.12420141;
      uStack_3af8._0_4_ = fStack_1f78 + -0.12420141;
      uStack_3af8._4_4_ = fStack_1f74 + -0.12420141;
      uStack_3af0._0_4_ = fStack_1f70 + -0.12420141;
      uStack_3af0._4_4_ = fStack_1f6c + -0.12420141;
      auVar91 = _local_3b00;
      uStack_3ae8._0_4_ = fStack_1f68 + -0.12420141;
      uStack_3ae8._4_4_ = fStack_3ac4 + -0.12420141;
      auVar5 = _local_3b00;
      local_2098 = ::_ps256_cephes_log_p4;
      local_2060 = local_3b00;
      uStack_2058 = uStack_3af8;
      uStack_3af0 = auVar91._16_8_;
      uStack_2050 = uStack_3af0;
      uStack_3ae8 = auVar5._24_8_;
      uStack_2048 = uStack_3ae8;
      local_2080 = local_3a00;
      uStack_2078 = uStack_39f8;
      uStack_2070 = uStack_39f0;
      uStack_2068 = uStack_39e8;
      local_2020 = (local_1f80 + -0.12420141) * (float)local_38c0;
      fStack_201c = (fStack_1f7c + -0.12420141) * local_38c0._4_4_;
      fStack_2018 = (fStack_1f78 + -0.12420141) * (float)uStack_38b8;
      fStack_2014 = (fStack_1f74 + -0.12420141) * uStack_38b8._4_4_;
      fStack_2010 = (fStack_1f70 + -0.12420141) * (float)uStack_38b0;
      fStack_200c = (fStack_1f6c + -0.12420141) * uStack_38b0._4_4_;
      fStack_2008 = (fStack_1f68 + -0.12420141) * (float)uStack_38a8;
      local_2040[0] = 0.14249323;
      local_2040[1] = 0.14249323;
      afStack_2038[0] = 0.14249323;
      afStack_2038[1] = 0.14249323;
      afStack_2030[0] = 0.14249323;
      afStack_2030[1] = 0.14249323;
      afStack_2028[0] = 0.14249323;
      afStack_2028[1] = 0.14249323;
      local_3b00._4_4_ = fStack_201c + 0.14249323;
      local_3b00._0_4_ = local_2020 + 0.14249323;
      uStack_3af8._0_4_ = fStack_2018 + 0.14249323;
      uStack_3af8._4_4_ = fStack_2014 + 0.14249323;
      uStack_3af0._0_4_ = fStack_2010 + 0.14249323;
      uStack_3af0._4_4_ = fStack_200c + 0.14249323;
      auVar91 = _local_3b00;
      uStack_3ae8._0_4_ = fStack_2008 + 0.14249323;
      uStack_3ae8._4_4_ = fStack_3ac4 + 0.14249323;
      auVar5 = _local_3b00;
      local_2138 = ::_ps256_cephes_log_p5;
      local_2100 = local_3b00;
      uStack_20f8 = uStack_3af8;
      uStack_3af0 = auVar91._16_8_;
      uStack_20f0 = uStack_3af0;
      uStack_3ae8 = auVar5._24_8_;
      uStack_20e8 = uStack_3ae8;
      local_2120 = local_3a00;
      uStack_2118 = uStack_39f8;
      uStack_2110 = uStack_39f0;
      uStack_2108 = uStack_39e8;
      local_20c0 = (local_2020 + 0.14249323) * (float)local_38c0;
      fStack_20bc = (fStack_201c + 0.14249323) * local_38c0._4_4_;
      fStack_20b8 = (fStack_2018 + 0.14249323) * (float)uStack_38b8;
      fStack_20b4 = (fStack_2014 + 0.14249323) * uStack_38b8._4_4_;
      fStack_20b0 = (fStack_2010 + 0.14249323) * (float)uStack_38b0;
      fStack_20ac = (fStack_200c + 0.14249323) * uStack_38b0._4_4_;
      fStack_20a8 = (fStack_2008 + 0.14249323) * (float)uStack_38a8;
      local_20e0[0] = -0.16668057;
      local_20e0[1] = -0.16668057;
      afStack_20d8[0] = -0.16668057;
      afStack_20d8[1] = -0.16668057;
      afStack_20d0[0] = -0.16668057;
      afStack_20d0[1] = -0.16668057;
      afStack_20c8[0] = -0.16668057;
      afStack_20c8[1] = -0.16668057;
      local_3b00._4_4_ = fStack_20bc + -0.16668057;
      local_3b00._0_4_ = local_20c0 + -0.16668057;
      uStack_3af8._0_4_ = fStack_20b8 + -0.16668057;
      uStack_3af8._4_4_ = fStack_20b4 + -0.16668057;
      uStack_3af0._0_4_ = fStack_20b0 + -0.16668057;
      uStack_3af0._4_4_ = fStack_20ac + -0.16668057;
      auVar91 = _local_3b00;
      uStack_3ae8._0_4_ = fStack_20a8 + -0.16668057;
      uStack_3ae8._4_4_ = fStack_3ac4 + -0.16668057;
      auVar5 = _local_3b00;
      local_21d8 = ::_ps256_cephes_log_p6;
      local_21a0 = local_3b00;
      uStack_2198 = uStack_3af8;
      uStack_3af0 = auVar91._16_8_;
      uStack_2190 = uStack_3af0;
      uStack_3ae8 = auVar5._24_8_;
      uStack_2188 = uStack_3ae8;
      local_21c0 = local_3a00;
      uStack_21b8 = uStack_39f8;
      uStack_21b0 = uStack_39f0;
      uStack_21a8 = uStack_39e8;
      local_2160 = (local_20c0 + -0.16668057) * (float)local_38c0;
      fStack_215c = (fStack_20bc + -0.16668057) * local_38c0._4_4_;
      fStack_2158 = (fStack_20b8 + -0.16668057) * (float)uStack_38b8;
      fStack_2154 = (fStack_20b4 + -0.16668057) * uStack_38b8._4_4_;
      fStack_2150 = (fStack_20b0 + -0.16668057) * (float)uStack_38b0;
      fStack_214c = (fStack_20ac + -0.16668057) * uStack_38b0._4_4_;
      fStack_2148 = (fStack_20a8 + -0.16668057) * (float)uStack_38a8;
      local_2180[0] = 0.20000714;
      local_2180[1] = 0.20000714;
      afStack_2178[0] = 0.20000714;
      afStack_2178[1] = 0.20000714;
      afStack_2170[0] = 0.20000714;
      afStack_2170[1] = 0.20000714;
      afStack_2168[0] = 0.20000714;
      afStack_2168[1] = 0.20000714;
      local_3b00._4_4_ = fStack_215c + 0.20000714;
      local_3b00._0_4_ = local_2160 + 0.20000714;
      uStack_3af8._0_4_ = fStack_2158 + 0.20000714;
      uStack_3af8._4_4_ = fStack_2154 + 0.20000714;
      uStack_3af0._0_4_ = fStack_2150 + 0.20000714;
      uStack_3af0._4_4_ = fStack_214c + 0.20000714;
      auVar91 = _local_3b00;
      uStack_3ae8._0_4_ = fStack_2148 + 0.20000714;
      uStack_3ae8._4_4_ = fStack_3ac4 + 0.20000714;
      auVar5 = _local_3b00;
      local_2278 = ::_ps256_cephes_log_p7;
      local_2240 = local_3b00;
      uStack_2238 = uStack_3af8;
      uStack_3af0 = auVar91._16_8_;
      uStack_2230 = uStack_3af0;
      uStack_3ae8 = auVar5._24_8_;
      uStack_2228 = uStack_3ae8;
      local_2260 = local_3a00;
      uStack_2258 = uStack_39f8;
      uStack_2250 = uStack_39f0;
      uStack_2248 = uStack_39e8;
      local_2200 = (local_2160 + 0.20000714) * (float)local_38c0;
      fStack_21fc = (fStack_215c + 0.20000714) * local_38c0._4_4_;
      fStack_21f8 = (fStack_2158 + 0.20000714) * (float)uStack_38b8;
      fStack_21f4 = (fStack_2154 + 0.20000714) * uStack_38b8._4_4_;
      fStack_21f0 = (fStack_2150 + 0.20000714) * (float)uStack_38b0;
      fStack_21ec = (fStack_214c + 0.20000714) * uStack_38b0._4_4_;
      fStack_21e8 = (fStack_2148 + 0.20000714) * (float)uStack_38a8;
      local_2220[0] = -0.24999994;
      local_2220[1] = -0.24999994;
      afStack_2218[0] = -0.24999994;
      afStack_2218[1] = -0.24999994;
      afStack_2210[0] = -0.24999994;
      afStack_2210[1] = -0.24999994;
      afStack_2208[0] = -0.24999994;
      afStack_2208[1] = -0.24999994;
      local_3b00._4_4_ = fStack_21fc + -0.24999994;
      local_3b00._0_4_ = local_2200 + -0.24999994;
      uStack_3af8._0_4_ = fStack_21f8 + -0.24999994;
      uStack_3af8._4_4_ = fStack_21f4 + -0.24999994;
      uStack_3af0._0_4_ = fStack_21f0 + -0.24999994;
      uStack_3af0._4_4_ = fStack_21ec + -0.24999994;
      auVar91 = _local_3b00;
      uStack_3ae8._0_4_ = fStack_21e8 + -0.24999994;
      uStack_3ae8._4_4_ = fStack_3ac4 + -0.24999994;
      auVar5 = _local_3b00;
      local_2318 = ::_ps256_cephes_log_p8;
      local_22e0 = local_3b00;
      uStack_22d8 = uStack_3af8;
      uStack_3af0 = auVar91._16_8_;
      uStack_22d0 = uStack_3af0;
      uStack_3ae8 = auVar5._24_8_;
      uStack_22c8 = uStack_3ae8;
      local_2300 = local_3a00;
      uStack_22f8 = uStack_39f8;
      uStack_22f0 = uStack_39f0;
      uStack_22e8 = uStack_39e8;
      local_22a0 = (local_2200 + -0.24999994) * (float)local_38c0;
      fStack_229c = (fStack_21fc + -0.24999994) * local_38c0._4_4_;
      fStack_2298 = (fStack_21f8 + -0.24999994) * (float)uStack_38b8;
      fStack_2294 = (fStack_21f4 + -0.24999994) * uStack_38b8._4_4_;
      fStack_2290 = (fStack_21f0 + -0.24999994) * (float)uStack_38b0;
      fStack_228c = (fStack_21ec + -0.24999994) * uStack_38b0._4_4_;
      fStack_2288 = (fStack_21e8 + -0.24999994) * (float)uStack_38a8;
      local_22c0[0] = 0.3333333;
      local_22c0[1] = 0.3333333;
      afStack_22b8[0] = 0.3333333;
      afStack_22b8[1] = 0.3333333;
      afStack_22b0[0] = 0.3333333;
      afStack_22b0[1] = 0.3333333;
      afStack_22a8[0] = 0.3333333;
      afStack_22a8[1] = 0.3333333;
      fVar97 = fStack_3ac4 + 0.3333333;
      local_3b00._4_4_ = fStack_229c + 0.3333333;
      local_3b00._0_4_ = local_22a0 + 0.3333333;
      uStack_3af8._0_4_ = fStack_2298 + 0.3333333;
      uStack_3af8._4_4_ = fStack_2294 + 0.3333333;
      uStack_3af0._0_4_ = fStack_2290 + 0.3333333;
      uStack_3af0._4_4_ = fStack_228c + 0.3333333;
      auVar91 = _local_3b00;
      uStack_3ae8._0_4_ = fStack_2288 + 0.3333333;
      uStack_3ae8._4_4_ = fVar97;
      auVar5 = _local_3b00;
      local_3980 = local_3b00;
      uStack_3978 = uStack_3af8;
      uStack_3af0 = auVar91._16_8_;
      uStack_3970 = uStack_3af0;
      uStack_3ae8 = auVar5._24_8_;
      uStack_3968 = uStack_3ae8;
      local_39a0 = local_3a00;
      uStack_3998 = uStack_39f8;
      uStack_3990 = uStack_39f0;
      uStack_3988 = uStack_39e8;
      local_3b00._0_4_ = (local_22a0 + 0.3333333) * (float)local_38c0;
      local_3b00._4_4_ = (fStack_229c + 0.3333333) * local_38c0._4_4_;
      fVar92 = (fStack_2298 + 0.3333333) * (float)uStack_38b8;
      fVar93 = (fStack_2294 + 0.3333333) * uStack_38b8._4_4_;
      fVar94 = (fStack_2290 + 0.3333333) * (float)uStack_38b0;
      fVar95 = (fStack_228c + 0.3333333) * uStack_38b0._4_4_;
      fVar96 = (fStack_2288 + 0.3333333) * (float)uStack_38a8;
      uStack_3af8._0_4_ = fVar92;
      uStack_3af8._4_4_ = fVar93;
      uStack_3af0._0_4_ = fVar94;
      uStack_3af0._4_4_ = fVar95;
      auVar91 = _local_3b00;
      uStack_3ae8._0_4_ = fVar96;
      auVar5 = _local_3b00;
      local_39c0 = local_3b00;
      uStack_39b8 = uStack_3af8;
      uStack_3af0 = auVar91._16_8_;
      uStack_39b0 = uStack_3af0;
      uStack_3ae8 = auVar5._24_8_;
      uStack_39a8 = uStack_3ae8;
      local_39e0 = CONCAT44(fStack_3adc,local_3ae0);
      uStack_39d8 = CONCAT44(fStack_3ad4,fStack_3ad8);
      uStack_39d0 = CONCAT44(fStack_3acc,fStack_3ad0);
      uStack_39c8 = CONCAT44(fStack_3ac4,fStack_3ac8);
      local_3b00._0_4_ = (float)local_3b00._0_4_ * local_3ae0;
      local_3b00._4_4_ = (float)local_3b00._4_4_ * fStack_3adc;
      fVar92 = fVar92 * fStack_3ad8;
      fVar93 = fVar93 * fStack_3ad4;
      fVar94 = fVar94 * fStack_3ad0;
      fVar95 = fVar95 * fStack_3acc;
      fVar96 = fVar96 * fStack_3ac8;
      uStack_3af8._0_4_ = fVar92;
      uStack_3af8._4_4_ = fVar93;
      uStack_3af0._0_4_ = fVar94;
      uStack_3af0._4_4_ = fVar95;
      auVar91 = _local_3b00;
      uStack_3ae8._0_4_ = fVar96;
      auVar5 = _local_3b00;
      local_2448 = local_3a80;
      local_23b0 = ::_ps256_cephes_log_q1;
      local_23a0[0] = -0.00021219444;
      local_23a0[1] = -0.00021219444;
      afStack_2398[0] = -0.00021219444;
      afStack_2398[1] = -0.00021219444;
      afStack_2390[0] = -0.00021219444;
      afStack_2390[1] = -0.00021219444;
      afStack_2388[0] = -0.00021219444;
      afStack_2388[1] = -0.00021219444;
      local_2380._0_4_ = local_3a80._0_4_;
      local_2380._4_4_ = local_3a80._4_4_;
      uStack_2378._0_4_ = local_3a80._8_4_;
      uStack_2378._4_4_ = local_3a80._12_4_;
      uStack_2370._0_4_ = local_3a80._16_4_;
      uStack_2370._4_4_ = local_3a80._20_4_;
      uStack_2368._0_4_ = local_3a80._24_4_;
      uStack_2324 = 0xb95e8083;
      local_2340 = (float)local_2380 * -0.00021219444;
      fStack_233c = local_2380._4_4_ * -0.00021219444;
      fStack_2338 = (float)uStack_2378 * -0.00021219444;
      fStack_2334 = uStack_2378._4_4_ * -0.00021219444;
      fStack_2330 = (float)uStack_2370 * -0.00021219444;
      fStack_232c = uStack_2370._4_4_ * -0.00021219444;
      fStack_2328 = (float)uStack_2368 * -0.00021219444;
      local_2360 = local_3b00;
      uStack_2358 = uStack_3af8;
      uStack_3af0 = auVar91._16_8_;
      uStack_2350 = uStack_3af0;
      uStack_3ae8 = auVar5._24_8_;
      uStack_2348 = uStack_3ae8;
      local_3b00._4_4_ = fStack_233c + (float)local_3b00._4_4_;
      local_3b00._0_4_ = local_2340 + (float)local_3b00._0_4_;
      uStack_3af8._0_4_ = fStack_2338 + fVar92;
      uStack_3af8._4_4_ = fStack_2334 + fVar93;
      uStack_3af0._0_4_ = fStack_2330 + fVar94;
      uStack_3af0._4_4_ = fStack_232c + fVar95;
      auVar91 = _local_3b00;
      uStack_3ae8._0_4_ = fStack_2328 + fVar96;
      uStack_3ae8._4_4_ = fVar97 + -0.00021219444;
      auVar5 = _local_3b00;
      local_1b88 = &local_3ae0;
      local_1b90 = ::_ps256_0p5;
      local_1b20 = local_3b00;
      uStack_1b18 = uStack_3af8;
      uStack_3af0 = auVar91._16_8_;
      uStack_1b10 = uStack_3af0;
      uStack_3ae8 = auVar5._24_8_;
      uStack_1b08 = uStack_3ae8;
      local_1b60 = CONCAT44(fStack_3adc,local_3ae0);
      uStack_1b58 = CONCAT44(fStack_3ad4,fStack_3ad8);
      uStack_1b50 = CONCAT44(fStack_3acc,fStack_3ad0);
      uStack_1b48 = CONCAT44(fStack_3ac4,fStack_3ac8);
      local_1b80[0] = 0.5;
      local_1b80[1] = 0.5;
      afStack_1b78[0] = 0.5;
      afStack_1b78[1] = 0.5;
      afStack_1b70[0] = 0.5;
      afStack_1b70[1] = 0.5;
      afStack_1b68[0] = 0.5;
      afStack_1b68[1] = 0.5;
      local_1b40 = local_3ae0 * 0.5;
      fStack_1b3c = fStack_3adc * 0.5;
      fStack_1b38 = fStack_3ad8 * 0.5;
      fStack_1b34 = fStack_3ad4 * 0.5;
      fStack_1b30 = fStack_3ad0 * 0.5;
      fStack_1b2c = fStack_3acc * 0.5;
      fStack_1b28 = fStack_3ac8 * 0.5;
      auVar46._4_4_ = fStack_1b3c;
      auVar46._0_4_ = local_1b40;
      auVar46._8_4_ = fStack_1b38;
      auVar46._12_4_ = fStack_1b34;
      auVar46._16_4_ = fStack_1b30;
      auVar46._20_4_ = fStack_1b2c;
      auVar46._24_4_ = fStack_1b28;
      auVar46._28_4_ = fStack_3ac4;
      auVar5 = vsubps_avx(auVar5,auVar46);
      local_3900 = local_3a00;
      uStack_38f8 = uStack_39f8;
      uStack_38f0 = uStack_39f0;
      uStack_38e8 = uStack_39e8;
      local_3b00 = auVar5._0_8_;
      uVar19 = local_3b00;
      uStack_3af8 = auVar5._8_8_;
      uVar20 = uStack_3af8;
      uStack_3af0 = auVar5._16_8_;
      uVar21 = uStack_3af0;
      uStack_3ae8 = auVar5._24_8_;
      uVar22 = uStack_3ae8;
      local_3920._0_4_ = auVar5._0_4_;
      local_3920._4_4_ = auVar5._4_4_;
      uStack_3918._0_4_ = auVar5._8_4_;
      uStack_3918._4_4_ = auVar5._12_4_;
      uStack_3910._0_4_ = auVar5._16_4_;
      uStack_3910._4_4_ = auVar5._20_4_;
      uStack_3908._0_4_ = auVar5._24_4_;
      uStack_3908._4_4_ = auVar5._28_4_;
      local_3a00._4_4_ = local_38c0._4_4_ + local_3920._4_4_;
      local_3a00._0_4_ = (float)local_38c0 + (float)local_3920;
      uStack_39f8._0_4_ = (float)uStack_38b8 + (float)uStack_3918;
      uStack_39f8._4_4_ = uStack_38b8._4_4_ + uStack_3918._4_4_;
      uStack_39f0._0_4_ = (float)uStack_38b0 + (float)uStack_3910;
      uStack_39f0._4_4_ = uStack_38b0._4_4_ + uStack_3910._4_4_;
      auVar91 = _local_3a00;
      uStack_39e8._0_4_ = (float)uStack_38a8 + (float)uStack_3908;
      uStack_39e8._4_4_ = fStack_3ac4 + uStack_3908._4_4_;
      auVar5 = _local_3a00;
      local_2450 = ::_ps256_cephes_log_q2;
      local_2420 = local_3a80;
      uStack_2418 = uStack_3a78;
      uStack_2410 = uStack_3a70;
      uStack_2408 = uStack_3a68;
      local_2440[0] = 0.6933594;
      local_2440[1] = 0.6933594;
      afStack_2438[0] = 0.6933594;
      afStack_2438[1] = 0.6933594;
      afStack_2430[0] = 0.6933594;
      afStack_2430[1] = 0.6933594;
      afStack_2428[0] = 0.6933594;
      afStack_2428[1] = 0.6933594;
      uStack_23c4 = 0x3f318000;
      local_23e0 = (float)local_2380 * 0.6933594;
      fStack_23dc = local_2380._4_4_ * 0.6933594;
      fStack_23d8 = (float)uStack_2378 * 0.6933594;
      fStack_23d4 = uStack_2378._4_4_ * 0.6933594;
      fStack_23d0 = (float)uStack_2370 * 0.6933594;
      fStack_23cc = uStack_2370._4_4_ * 0.6933594;
      fStack_23c8 = (float)uStack_2368 * 0.6933594;
      local_2400 = local_3a00;
      uStack_23f8 = uStack_39f8;
      uStack_39f0 = auVar91._16_8_;
      uStack_23f0 = uStack_39f0;
      uStack_39e8 = auVar5._24_8_;
      uStack_23e8 = uStack_39e8;
      local_3a00._4_4_ = fStack_23dc + local_38c0._4_4_ + local_3920._4_4_;
      local_3a00._0_4_ = local_23e0 + (float)local_38c0 + (float)local_3920;
      uStack_39f8._0_4_ = fStack_23d8 + (float)uStack_38b8 + (float)uStack_3918;
      uStack_39f8._4_4_ = fStack_23d4 + uStack_38b8._4_4_ + uStack_3918._4_4_;
      uStack_39f0._0_4_ = fStack_23d0 + (float)uStack_38b0 + (float)uStack_3910;
      uStack_39f0._4_4_ = fStack_23cc + uStack_38b0._4_4_ + uStack_3910._4_4_;
      auVar91 = _local_3a00;
      uStack_39e8._0_4_ = fStack_23c8 + (float)uStack_38a8 + (float)uStack_3908;
      uStack_39e8._4_4_ = fStack_3ac4 + uStack_3908._4_4_ + 0.6933594;
      auVar32 = _local_3a00;
      local_2ea0 = local_3a00;
      uStack_2e98 = uStack_39f8;
      uStack_39f0 = auVar91._16_8_;
      uStack_2e90 = uStack_39f0;
      uStack_39e8 = auVar32._24_8_;
      uStack_2e88 = uStack_39e8;
      local_2ec0 = local_3a60._0_8_;
      uStack_2eb8 = local_3a60._8_8_;
      uStack_2eb0 = local_3a60._16_8_;
      uStack_2ea8 = local_3a60._24_8_;
      auVar39._16_8_ = uStack_39f0;
      auVar39._0_16_ = _local_3a00;
      auVar39._24_8_ = uStack_39e8;
      _local_3b00 = vorps_avx(auVar39,local_3a60);
      local_3ba0 = local_3b00;
      uStack_3b98 = uStack_3af8;
      uStack_3b90 = uStack_3af0;
      uStack_3b88 = uStack_3ae8;
      local_3648 = 0x3f800000;
      local_1460 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_1480 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_1470 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_3bc0 = local_1480._0_8_;
      uStack_3bb8 = local_1480._8_8_;
      uStack_3bb0 = auStack_1470._0_8_;
      uStack_3ba8 = auStack_1470._8_8_;
      local_364c = 0x40000000;
      local_1410 = 0x40000000;
      auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
      local_1440 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
      auStack_1430 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
      local_3be0 = local_1440._0_8_;
      uStack_3bd8 = local_1440._8_8_;
      uStack_3bd0 = auStack_1430._0_8_;
      uStack_3bc8 = auStack_1430._8_8_;
      local_3b20._0_4_ = local_3b00._0_4_;
      local_3b20._4_4_ = local_3b00._4_4_;
      uStack_3b18._0_4_ = local_3b00._8_4_;
      uStack_3b18._4_4_ = local_3b00._12_4_;
      uStack_3b10._0_4_ = local_3b00._16_4_;
      uStack_3b10._4_4_ = local_3b00._20_4_;
      uStack_3b08._0_4_ = local_3b00._24_4_;
      uStack_3b08._4_4_ = local_3b00._28_4_;
      uStack_3504 = uStack_3b08._4_4_;
      local_3b40._0_4_ = local_1440._0_4_;
      local_3b40._4_4_ = local_1440._4_4_;
      uStack_3b38._0_4_ = local_1440._8_4_;
      uStack_3b38._4_4_ = local_1440._12_4_;
      uStack_3b30._0_4_ = auStack_1430._0_4_;
      uStack_3b30._4_4_ = auStack_1430._4_4_;
      uStack_3b28._0_4_ = auStack_1430._8_4_;
      local_3520 = (float)local_3b20 * (float)local_3b40;
      fStack_351c = local_3b20._4_4_ * local_3b40._4_4_;
      fStack_3518 = (float)uStack_3b18 * (float)uStack_3b38;
      fStack_3514 = uStack_3b18._4_4_ * uStack_3b38._4_4_;
      fStack_3510 = (float)uStack_3b10 * (float)uStack_3b30;
      fStack_350c = uStack_3b10._4_4_ * uStack_3b30._4_4_;
      fStack_3508 = (float)uStack_3b08 * (float)uStack_3b28;
      local_32e4 = 0x3f800000;
      local_14e0 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_1500 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_14f0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_3540 = local_1500._0_8_;
      uStack_3538 = local_1500._8_8_;
      uStack_3530 = auStack_14f0._0_8_;
      uStack_3528 = auStack_14f0._8_8_;
      local_3240._16_8_ = auStack_14f0._0_8_;
      local_3240._0_16_ = local_1500;
      local_3240._24_8_ = auStack_14f0._8_8_;
      local_3220 = ZEXT1632(ZEXT816(0) << 0x40);
      local_3280 = 0;
      uStack_3278 = 0;
      uStack_3270 = 0;
      uStack_3268 = 0;
      local_32a0 = CONCAT44(fStack_351c,local_3520);
      uStack_3298 = CONCAT44(fStack_3514,fStack_3518);
      uStack_3290 = CONCAT44(fStack_350c,fStack_3510);
      uStack_3288 = CONCAT44(uStack_3b08._4_4_,fStack_3508);
      auVar29._8_8_ = uStack_3298;
      auVar29._0_8_ = local_32a0;
      auVar29._16_8_ = uStack_3290;
      auVar29._24_8_ = uStack_3288;
      auVar5 = vsubps_avx(ZEXT832(0),auVar29);
      local_33e0._0_8_ = auVar5._0_8_;
      local_1a60 = local_33e0._0_8_;
      local_33e0._8_8_ = auVar5._8_8_;
      uStack_1a58 = local_33e0._8_8_;
      local_33e0._16_8_ = auVar5._16_8_;
      uStack_1a50 = local_33e0._16_8_;
      local_33e0._24_8_ = auVar5._24_8_;
      uStack_1a48 = local_33e0._24_8_;
      auVar47._8_8_ = 0x42b0c0a542b0c0a5;
      auVar47._0_8_ = 0x42b0c0a542b0c0a5;
      auVar47._16_8_ = 0x42b0c0a542b0c0a5;
      auVar47._24_8_ = 0x42b0c0a542b0c0a5;
      auVar5 = vminps_avx(auVar5,auVar47);
      local_33e0._0_8_ = auVar5._0_8_;
      local_3180 = local_33e0._0_8_;
      local_33e0._8_8_ = auVar5._8_8_;
      uStack_3178 = local_33e0._8_8_;
      local_33e0._16_8_ = auVar5._16_8_;
      uStack_3170 = local_33e0._16_8_;
      local_33e0._24_8_ = auVar5._24_8_;
      uStack_3168 = local_33e0._24_8_;
      auVar31._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar31._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar31._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar31._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar4 = vmaxps_avx(auVar5,auVar31);
      local_2d18 = local_33e0;
      local_2950 = ::_ps256_cephes_LOG2EF;
      local_2958 = ::_ps256_0p5;
      local_33e0._0_8_ = auVar4._0_8_;
      uVar23 = local_33e0._0_8_;
      local_33e0._8_8_ = auVar4._8_8_;
      uVar24 = local_33e0._8_8_;
      local_33e0._16_8_ = auVar4._16_8_;
      uVar25 = local_33e0._16_8_;
      local_33e0._24_8_ = auVar4._24_8_;
      uVar26 = local_33e0._24_8_;
      local_2940[0] = 1.442695;
      local_2940[1] = 1.442695;
      afStack_2938[0] = 1.442695;
      afStack_2938[1] = 1.442695;
      afStack_2930[0] = 1.442695;
      afStack_2930[1] = 1.442695;
      afStack_2928[0] = 1.442695;
      afStack_2928[1] = 1.442695;
      local_2920._0_4_ = auVar4._0_4_;
      local_2920._4_4_ = auVar4._4_4_;
      uStack_2918._0_4_ = auVar4._8_4_;
      uStack_2918._4_4_ = auVar4._12_4_;
      uStack_2910._0_4_ = auVar4._16_4_;
      uStack_2910._4_4_ = auVar4._20_4_;
      uStack_2908._0_4_ = auVar4._24_4_;
      uStack_28c4 = 0x3fb8aa3b;
      local_28e0 = (float)local_2920 * 1.442695;
      fStack_28dc = local_2920._4_4_ * 1.442695;
      fStack_28d8 = (float)uStack_2918 * 1.442695;
      fStack_28d4 = uStack_2918._4_4_ * 1.442695;
      fStack_28d0 = (float)uStack_2910 * 1.442695;
      fStack_28cc = uStack_2910._4_4_ * 1.442695;
      fStack_28c8 = (float)uStack_2908 * 1.442695;
      local_2900[0] = 0.5;
      local_2900[1] = 0.5;
      afStack_28f8[0] = 0.5;
      afStack_28f8[1] = 0.5;
      afStack_28f0[0] = 0.5;
      afStack_28f0[1] = 0.5;
      afStack_28e8[0] = 0.5;
      afStack_28e8[1] = 0.5;
      local_3420._4_4_ = fStack_28dc + 0.5;
      local_3420._0_4_ = local_28e0 + 0.5;
      uStack_3418._0_4_ = fStack_28d8 + 0.5;
      uStack_3418._4_4_ = fStack_28d4 + 0.5;
      uStack_3410._0_4_ = fStack_28d0 + 0.5;
      uStack_3410._4_4_ = fStack_28cc + 0.5;
      uStack_3408._0_4_ = fStack_28c8 + 0.5;
      uStack_3408._4_4_ = 0x3ff8aa3b;
      auVar6 = vroundps_avx(_local_3420,1);
      auVar5 = vcmpps_avx(_local_3420,auVar6,1);
      local_3480._0_8_ = auVar5._0_8_;
      local_2fe0 = local_3480._0_8_;
      local_3480._8_8_ = auVar5._8_8_;
      uStack_2fd8 = local_3480._8_8_;
      local_3480._16_8_ = auVar5._16_8_;
      uStack_2fd0 = local_3480._16_8_;
      local_3480._24_8_ = auVar5._24_8_;
      uStack_2fc8 = local_3480._24_8_;
      local_3000 = 0x3f8000003f800000;
      uStack_2ff8 = 0x3f8000003f800000;
      uStack_2ff0 = 0x3f8000003f800000;
      uStack_2fe8 = 0x3f8000003f800000;
      auVar35._8_8_ = 0x3f8000003f800000;
      auVar35._0_8_ = 0x3f8000003f800000;
      auVar35._16_8_ = 0x3f8000003f800000;
      auVar35._24_8_ = 0x3f8000003f800000;
      local_3480 = vandps_avx(auVar5,auVar35);
      local_3400 = auVar6._0_8_;
      local_32c0 = local_3400;
      uStack_33f8 = auVar6._8_8_;
      uStack_32b8 = uStack_33f8;
      uStack_33f0 = auVar6._16_8_;
      uStack_32b0 = uStack_33f0;
      uStack_33e8 = auVar6._24_8_;
      uStack_32a8 = uStack_33e8;
      local_32e0 = local_3480._0_8_;
      uStack_32d8 = local_3480._8_8_;
      uStack_32d0 = local_3480._16_8_;
      uStack_32c8 = local_3480._24_8_;
      _local_3420 = vsubps_avx(auVar6,local_3480);
      local_1e08 = local_3420;
      local_1d70 = ::_ps256_cephes_exp_C1;
      local_1d00 = local_33e0._0_8_;
      uStack_1cf8 = local_33e0._8_8_;
      uStack_1cf0 = local_33e0._16_8_;
      uStack_1ce8 = local_33e0._24_8_;
      local_1d60[0] = 0.6933594;
      local_1d60[1] = 0.6933594;
      afStack_1d58[0] = 0.6933594;
      afStack_1d58[1] = 0.6933594;
      afStack_1d50[0] = 0.6933594;
      afStack_1d50[1] = 0.6933594;
      afStack_1d48[0] = 0.6933594;
      afStack_1d48[1] = 0.6933594;
      local_1d40._0_4_ = local_3420._0_4_;
      local_1d40._4_4_ = local_3420._4_4_;
      uStack_1d38._0_4_ = local_3420._8_4_;
      uStack_1d38._4_4_ = local_3420._12_4_;
      uStack_1d30._0_4_ = local_3420._16_4_;
      uStack_1d30._4_4_ = local_3420._20_4_;
      uStack_1d28._0_4_ = local_3420._24_4_;
      uStack_1d28._4_4_ = local_3420._28_4_;
      fStack_1d04 = uStack_1d28._4_4_;
      local_1d20 = (float)local_1d40 * 0.6933594;
      fStack_1d1c = local_1d40._4_4_ * 0.6933594;
      fStack_1d18 = (float)uStack_1d38 * 0.6933594;
      fStack_1d14 = uStack_1d38._4_4_ * 0.6933594;
      fStack_1d10 = (float)uStack_1d30 * 0.6933594;
      fStack_1d0c = uStack_1d30._4_4_ * 0.6933594;
      fStack_1d08 = (float)uStack_1d28 * 0.6933594;
      auVar43._4_4_ = fStack_1d1c;
      auVar43._0_4_ = local_1d20;
      auVar43._8_4_ = fStack_1d18;
      auVar43._12_4_ = fStack_1d14;
      auVar43._16_4_ = fStack_1d10;
      auVar43._20_4_ = fStack_1d0c;
      auVar43._24_4_ = fStack_1d08;
      auVar43._28_4_ = uStack_1d28._4_4_;
      auVar5 = vsubps_avx(auVar4,auVar43);
      local_1e10 = ::_ps256_cephes_exp_C2;
      local_33e0._0_8_ = auVar5._0_8_;
      local_1da0 = local_33e0._0_8_;
      local_33e0._8_8_ = auVar5._8_8_;
      uStack_1d98 = local_33e0._8_8_;
      local_33e0._16_8_ = auVar5._16_8_;
      uStack_1d90 = local_33e0._16_8_;
      local_33e0._24_8_ = auVar5._24_8_;
      uStack_1d88 = local_33e0._24_8_;
      local_1de0 = local_3420;
      uStack_1dd8 = uStack_3418;
      uStack_1dd0 = uStack_3410;
      uStack_1dc8 = uStack_3408;
      local_1e00[0] = -0.00021219444;
      local_1e00[1] = -0.00021219444;
      afStack_1df8[0] = -0.00021219444;
      afStack_1df8[1] = -0.00021219444;
      afStack_1df0[0] = -0.00021219444;
      afStack_1df0[1] = -0.00021219444;
      afStack_1de8[0] = -0.00021219444;
      afStack_1de8[1] = -0.00021219444;
      fStack_1da4 = uStack_1d28._4_4_;
      local_1dc0 = (float)local_1d40 * -0.00021219444;
      fStack_1dbc = local_1d40._4_4_ * -0.00021219444;
      fStack_1db8 = (float)uStack_1d38 * -0.00021219444;
      fStack_1db4 = uStack_1d38._4_4_ * -0.00021219444;
      fStack_1db0 = (float)uStack_1d30 * -0.00021219444;
      fStack_1dac = uStack_1d30._4_4_ * -0.00021219444;
      fStack_1da8 = (float)uStack_1d28 * -0.00021219444;
      auVar42._4_4_ = fStack_1dbc;
      auVar42._0_4_ = local_1dc0;
      auVar42._8_4_ = fStack_1db8;
      auVar42._12_4_ = fStack_1db4;
      auVar42._16_4_ = fStack_1db0;
      auVar42._20_4_ = fStack_1dac;
      auVar42._24_4_ = fStack_1da8;
      auVar42._28_4_ = uStack_1d28._4_4_;
      local_33e0 = vsubps_avx(auVar5,auVar42);
      local_3380 = local_33e0._0_8_;
      uStack_3378 = local_33e0._8_8_;
      uStack_3370 = local_33e0._16_8_;
      uStack_3368 = local_33e0._24_8_;
      local_3360._0_4_ = local_33e0._0_4_;
      local_3360._4_4_ = local_33e0._4_4_;
      uStack_3358._0_4_ = local_33e0._8_4_;
      uStack_3358._4_4_ = local_33e0._12_4_;
      uStack_3350._0_4_ = local_33e0._16_4_;
      uStack_3350._4_4_ = local_33e0._20_4_;
      uStack_3348._0_4_ = local_33e0._24_4_;
      uStack_3348._4_4_ = local_33e0._28_4_;
      local_3400 = CONCAT44(local_3360._4_4_ * local_3360._4_4_,
                            (float)local_3360 * (float)local_3360);
      uStack_33f8._0_4_ = (float)uStack_3358 * (float)uStack_3358;
      uStack_33f8._4_4_ = uStack_3358._4_4_ * uStack_3358._4_4_;
      uStack_33f0._0_4_ = (float)uStack_3350 * (float)uStack_3350;
      uStack_33f0._4_4_ = uStack_3350._4_4_ * uStack_3350._4_4_;
      auVar91 = _local_3400;
      uStack_33e8._0_4_ = (float)uStack_3348 * (float)uStack_3348;
      uStack_33e8._4_4_ = uStack_3348._4_4_;
      auVar4 = _local_3400;
      local_2d08 = &local_34a0;
      local_29f8 = ::_ps256_cephes_exp_p1;
      local_29c0 = 0x3950696739506967;
      uStack_29b8 = 0x3950696739506967;
      uStack_29b0 = 0x3950696739506967;
      uStack_29a8 = 0x3950696739506967;
      local_29e0 = local_33e0._0_8_;
      uStack_29d8 = local_33e0._8_8_;
      uStack_29d0 = local_33e0._16_8_;
      uStack_29c8 = local_33e0._24_8_;
      fStack_2964 = uStack_3348._4_4_;
      local_2980 = (float)local_3360 * 0.00019875691;
      fStack_297c = local_3360._4_4_ * 0.00019875691;
      fStack_2978 = (float)uStack_3358 * 0.00019875691;
      fStack_2974 = uStack_3358._4_4_ * 0.00019875691;
      fStack_2970 = (float)uStack_3350 * 0.00019875691;
      fStack_296c = uStack_3350._4_4_ * 0.00019875691;
      fStack_2968 = (float)uStack_3348 * 0.00019875691;
      local_29a0[0] = 0.0013981999;
      local_29a0[1] = 0.0013981999;
      afStack_2998[0] = 0.0013981999;
      afStack_2998[1] = 0.0013981999;
      afStack_2990[0] = 0.0013981999;
      afStack_2990[1] = 0.0013981999;
      afStack_2988[0] = 0.0013981999;
      afStack_2988[1] = 0.0013981999;
      local_2a98 = ::_ps256_cephes_exp_p2;
      local_2a60 = CONCAT44(fStack_297c + 0.0013981999,local_2980 + 0.0013981999);
      uStack_2a58 = CONCAT44(fStack_2974 + 0.0013981999,fStack_2978 + 0.0013981999);
      uStack_2a50 = CONCAT44(fStack_296c + 0.0013981999,fStack_2970 + 0.0013981999);
      uStack_2a48 = CONCAT44(uStack_3348._4_4_ + 0.0013981999,fStack_2968 + 0.0013981999);
      local_2a80 = local_33e0._0_8_;
      uStack_2a78 = local_33e0._8_8_;
      uStack_2a70 = local_33e0._16_8_;
      uStack_2a68 = local_33e0._24_8_;
      fStack_2a04 = uStack_3348._4_4_;
      local_2a20 = (local_2980 + 0.0013981999) * (float)local_3360;
      fStack_2a1c = (fStack_297c + 0.0013981999) * local_3360._4_4_;
      fStack_2a18 = (fStack_2978 + 0.0013981999) * (float)uStack_3358;
      fStack_2a14 = (fStack_2974 + 0.0013981999) * uStack_3358._4_4_;
      fStack_2a10 = (fStack_2970 + 0.0013981999) * (float)uStack_3350;
      fStack_2a0c = (fStack_296c + 0.0013981999) * uStack_3350._4_4_;
      fStack_2a08 = (fStack_2968 + 0.0013981999) * (float)uStack_3348;
      local_2a40[0] = 0.008333452;
      local_2a40[1] = 0.008333452;
      afStack_2a38[0] = 0.008333452;
      afStack_2a38[1] = 0.008333452;
      afStack_2a30[0] = 0.008333452;
      afStack_2a30[1] = 0.008333452;
      afStack_2a28[0] = 0.008333452;
      afStack_2a28[1] = 0.008333452;
      local_2b38 = ::_ps256_cephes_exp_p3;
      local_2b00 = CONCAT44(fStack_2a1c + 0.008333452,local_2a20 + 0.008333452);
      uStack_2af8 = CONCAT44(fStack_2a14 + 0.008333452,fStack_2a18 + 0.008333452);
      uStack_2af0 = CONCAT44(fStack_2a0c + 0.008333452,fStack_2a10 + 0.008333452);
      uStack_2ae8 = CONCAT44(uStack_3348._4_4_ + 0.008333452,fStack_2a08 + 0.008333452);
      local_2b20 = local_33e0._0_8_;
      uStack_2b18 = local_33e0._8_8_;
      uStack_2b10 = local_33e0._16_8_;
      uStack_2b08 = local_33e0._24_8_;
      fStack_2aa4 = uStack_3348._4_4_;
      local_2ac0 = (local_2a20 + 0.008333452) * (float)local_3360;
      fStack_2abc = (fStack_2a1c + 0.008333452) * local_3360._4_4_;
      fStack_2ab8 = (fStack_2a18 + 0.008333452) * (float)uStack_3358;
      fStack_2ab4 = (fStack_2a14 + 0.008333452) * uStack_3358._4_4_;
      fStack_2ab0 = (fStack_2a10 + 0.008333452) * (float)uStack_3350;
      fStack_2aac = (fStack_2a0c + 0.008333452) * uStack_3350._4_4_;
      fStack_2aa8 = (fStack_2a08 + 0.008333452) * (float)uStack_3348;
      local_2ae0[0] = 0.041665796;
      local_2ae0[1] = 0.041665796;
      afStack_2ad8[0] = 0.041665796;
      afStack_2ad8[1] = 0.041665796;
      afStack_2ad0[0] = 0.041665796;
      afStack_2ad0[1] = 0.041665796;
      afStack_2ac8[0] = 0.041665796;
      afStack_2ac8[1] = 0.041665796;
      local_2bd8 = ::_ps256_cephes_exp_p4;
      local_2ba0 = CONCAT44(fStack_2abc + 0.041665796,local_2ac0 + 0.041665796);
      uStack_2b98 = CONCAT44(fStack_2ab4 + 0.041665796,fStack_2ab8 + 0.041665796);
      uStack_2b90 = CONCAT44(fStack_2aac + 0.041665796,fStack_2ab0 + 0.041665796);
      uStack_2b88 = CONCAT44(uStack_3348._4_4_ + 0.041665796,fStack_2aa8 + 0.041665796);
      local_2bc0 = local_33e0._0_8_;
      uStack_2bb8 = local_33e0._8_8_;
      uStack_2bb0 = local_33e0._16_8_;
      uStack_2ba8 = local_33e0._24_8_;
      fStack_2b44 = uStack_3348._4_4_;
      local_2b60 = (local_2ac0 + 0.041665796) * (float)local_3360;
      fStack_2b5c = (fStack_2abc + 0.041665796) * local_3360._4_4_;
      fStack_2b58 = (fStack_2ab8 + 0.041665796) * (float)uStack_3358;
      fStack_2b54 = (fStack_2ab4 + 0.041665796) * uStack_3358._4_4_;
      fStack_2b50 = (fStack_2ab0 + 0.041665796) * (float)uStack_3350;
      fStack_2b4c = (fStack_2aac + 0.041665796) * uStack_3350._4_4_;
      fStack_2b48 = (fStack_2aa8 + 0.041665796) * (float)uStack_3348;
      local_2b80[0] = 0.16666666;
      local_2b80[1] = 0.16666666;
      afStack_2b78[0] = 0.16666666;
      afStack_2b78[1] = 0.16666666;
      afStack_2b70[0] = 0.16666666;
      afStack_2b70[1] = 0.16666666;
      afStack_2b68[0] = 0.16666666;
      afStack_2b68[1] = 0.16666666;
      local_2c78 = ::_ps256_cephes_exp_p5;
      local_2c40 = CONCAT44(fStack_2b5c + 0.16666666,local_2b60 + 0.16666666);
      uStack_2c38 = CONCAT44(fStack_2b54 + 0.16666666,fStack_2b58 + 0.16666666);
      uStack_2c30 = CONCAT44(fStack_2b4c + 0.16666666,fStack_2b50 + 0.16666666);
      uStack_2c28 = CONCAT44(uStack_3348._4_4_ + 0.16666666,fStack_2b48 + 0.16666666);
      local_2c60 = local_33e0._0_8_;
      uStack_2c58 = local_33e0._8_8_;
      uStack_2c50 = local_33e0._16_8_;
      uStack_2c48 = local_33e0._24_8_;
      fStack_2be4 = uStack_3348._4_4_;
      local_2c00 = (local_2b60 + 0.16666666) * (float)local_3360;
      fStack_2bfc = (fStack_2b5c + 0.16666666) * local_3360._4_4_;
      fStack_2bf8 = (fStack_2b58 + 0.16666666) * (float)uStack_3358;
      fStack_2bf4 = (fStack_2b54 + 0.16666666) * uStack_3358._4_4_;
      fStack_2bf0 = (fStack_2b50 + 0.16666666) * (float)uStack_3350;
      fStack_2bec = (fStack_2b4c + 0.16666666) * uStack_3350._4_4_;
      fStack_2be8 = (fStack_2b48 + 0.16666666) * (float)uStack_3348;
      local_2c20[0] = 0.5;
      local_2c20[1] = 0.5;
      afStack_2c18[0] = 0.5;
      afStack_2c18[1] = 0.5;
      afStack_2c10[0] = 0.5;
      afStack_2c10[1] = 0.5;
      afStack_2c08[0] = 0.5;
      afStack_2c08[1] = 0.5;
      local_2d10 = &local_3400;
      local_2ce0 = CONCAT44(fStack_2bfc + 0.5,local_2c00 + 0.5);
      uStack_2cd8 = CONCAT44(fStack_2bf4 + 0.5,fStack_2bf8 + 0.5);
      uStack_2cd0 = CONCAT44(fStack_2bec + 0.5,fStack_2bf0 + 0.5);
      uStack_2cc8 = CONCAT44(uStack_3348._4_4_ + 0.5,fStack_2be8 + 0.5);
      local_2d00 = local_3400;
      uStack_2cf8 = uStack_33f8;
      uStack_33f0 = auVar91._16_8_;
      uStack_2cf0 = uStack_33f0;
      uStack_33e8 = auVar4._24_8_;
      uStack_2ce8 = uStack_33e8;
      fStack_2c84 = uStack_3348._4_4_;
      local_2ca0 = (local_2c00 + 0.5) * (float)local_3360 * (float)local_3360;
      fStack_2c9c = (fStack_2bfc + 0.5) * local_3360._4_4_ * local_3360._4_4_;
      fStack_2c98 = (fStack_2bf8 + 0.5) * (float)uStack_3358 * (float)uStack_3358;
      fStack_2c94 = (fStack_2bf4 + 0.5) * uStack_3358._4_4_ * uStack_3358._4_4_;
      fStack_2c90 = (fStack_2bf0 + 0.5) * (float)uStack_3350 * (float)uStack_3350;
      fStack_2c8c = (fStack_2bec + 0.5) * uStack_3350._4_4_ * uStack_3350._4_4_;
      fStack_2c88 = (fStack_2be8 + 0.5) * (float)uStack_3348 * (float)uStack_3348;
      local_2cc0 = local_33e0._0_8_;
      uStack_2cb8 = local_33e0._8_8_;
      uStack_2cb0 = local_33e0._16_8_;
      uStack_2ca8 = local_33e0._24_8_;
      local_3320 = CONCAT44(fStack_2c9c + local_3360._4_4_,local_2ca0 + (float)local_3360);
      uStack_3318 = CONCAT44(fStack_2c94 + uStack_3358._4_4_,fStack_2c98 + (float)uStack_3358);
      uStack_3310 = CONCAT44(fStack_2c8c + uStack_3350._4_4_,fStack_2c90 + (float)uStack_3350);
      uStack_3308 = CONCAT44(uStack_3348._4_4_ + uStack_3348._4_4_,fStack_2c88 + (float)uStack_3348)
      ;
      local_3340 = 0x3f8000003f800000;
      uStack_3338 = 0x3f8000003f800000;
      uStack_3330 = 0x3f8000003f800000;
      uStack_3328 = 0x3f8000003f800000;
      local_34a0 = local_2ca0 + (float)local_3360 + 1.0;
      fStack_349c = fStack_2c9c + local_3360._4_4_ + 1.0;
      fStack_3498 = fStack_2c98 + (float)uStack_3358 + 1.0;
      fStack_3494 = fStack_2c94 + uStack_3358._4_4_ + 1.0;
      fStack_3490 = fStack_2c90 + (float)uStack_3350 + 1.0;
      fStack_348c = fStack_2c8c + uStack_3350._4_4_ + 1.0;
      fStack_3488 = fStack_2c88 + (float)uStack_3348 + 1.0;
      fStack_3484 = uStack_3348._4_4_ + uStack_3348._4_4_ + 1.0;
      local_1a00 = local_3420;
      uStack_19f8 = uStack_3418;
      uStack_19f0 = uStack_3410;
      uStack_19e8 = uStack_3408;
      local_3440 = CONCAT44((int)local_1d40._4_4_,(int)(float)local_1d40);
      uStack_3438 = CONCAT44((int)uStack_1d38._4_4_,(int)(float)uStack_1d38);
      uStack_3430 = CONCAT44((int)uStack_1d30._4_4_,(int)(float)uStack_1d30);
      uStack_3428 = CONCAT44((int)uStack_1d28._4_4_,(int)(float)uStack_1d28);
      local_18e0 = local_3440;
      uStack_18d8 = uStack_3438;
      uStack_18d0 = uStack_3430;
      uStack_18c8 = uStack_3428;
      local_1980 = local_3440;
      uStack_1978 = uStack_3438;
      uStack_1970 = uStack_3430;
      uStack_1968 = uStack_3428;
      local_19a0 = 0x7f0000007f;
      uStack_1998 = 0x7f0000007f;
      uStack_1990 = 0x7f0000007f;
      uStack_1988 = 0x7f0000007f;
      local_1930 = 0x7f0000007f;
      uStack_1928 = 0x7f0000007f;
      local_1940 = 0x7f0000007f;
      uStack_1938 = 0x7f0000007f;
      local_1590 = local_3440;
      uStack_1588 = uStack_3438;
      local_15a0 = 0x7f0000007f;
      uStack_1598 = 0x7f0000007f;
      auVar55._8_8_ = uStack_3438;
      auVar55._0_8_ = local_3440;
      auVar54._8_8_ = 0x7f0000007f;
      auVar54._0_8_ = 0x7f0000007f;
      local_1910 = vpaddd_avx(auVar55,auVar54);
      local_15b0 = uStack_3430;
      uStack_15a8 = uStack_3428;
      local_15c0 = 0x7f0000007f;
      uStack_15b8 = 0x7f0000007f;
      auVar53._8_8_ = uStack_3428;
      auVar53._0_8_ = uStack_3430;
      auVar52._8_8_ = 0x7f0000007f;
      auVar52._0_8_ = 0x7f0000007f;
      local_1920 = vpaddd_avx(auVar53,auVar52);
      local_19c0 = local_1910._0_8_;
      uStack_19b8 = local_1910._8_8_;
      uStack_19b0 = local_1920._0_8_;
      uStack_19a8 = local_1920._8_8_;
      local_1960 = local_1910._0_8_;
      uStack_1958 = local_1910._8_8_;
      uStack_1950 = local_1920._0_8_;
      uStack_1948 = local_1920._8_8_;
      local_1720 = local_1910._0_8_;
      uStack_1718 = local_1910._8_8_;
      uStack_1710 = local_1920._0_8_;
      uStack_1708 = local_1920._8_8_;
      local_1724 = 0x17;
      local_17a0 = local_1910._0_8_;
      uStack_1798 = local_1910._8_8_;
      uStack_1790 = local_1920._0_8_;
      uStack_1788 = local_1920._8_8_;
      local_1510 = local_1910._0_8_;
      uStack_1508 = local_1910._8_8_;
      local_1514 = 0x17;
      local_1740 = vpslld_avx(local_1910,ZEXT416(0x17));
      local_1530 = local_1920._0_8_;
      uStack_1528 = local_1920._8_8_;
      local_1534 = 0x17;
      local_1750 = vpslld_avx(local_1920,ZEXT416(0x17));
      local_17c0 = local_1740._0_8_;
      uStack_17b8 = local_1740._8_8_;
      uStack_17b0 = local_1750._0_8_;
      uStack_17a8 = local_1750._8_8_;
      local_1780 = local_1740._0_8_;
      uStack_1778 = local_1740._8_8_;
      uStack_1770 = local_1750._0_8_;
      uStack_1768 = local_1750._8_8_;
      local_3440 = local_1740._0_8_;
      uStack_3438 = local_1740._8_8_;
      uStack_3430 = local_1750._0_8_;
      uStack_3428 = local_1750._8_8_;
      local_1640 = local_1740._0_8_;
      uStack_1638 = local_1740._8_8_;
      uStack_1630 = local_1750._0_8_;
      uStack_1628 = local_1750._8_8_;
      local_34c0 = local_1740._0_8_;
      uStack_34b8 = local_1740._8_8_;
      uStack_34b0 = local_1750._0_8_;
      uStack_34a8 = local_1750._8_8_;
      local_33a0._4_4_ = fStack_349c;
      local_33a0._0_4_ = local_34a0;
      local_33a0._8_4_ = fStack_3498;
      local_33a0._12_4_ = fStack_3494;
      local_33a0._16_4_ = fStack_3490;
      local_33a0._20_4_ = fStack_348c;
      local_33a0._24_4_ = fStack_3488;
      local_33a0._28_4_ = fStack_3484;
      local_33c0._0_4_ = local_1740._0_4_;
      local_33c0._4_4_ = local_1740._4_4_;
      uStack_33b8._0_4_ = local_1740._8_4_;
      uStack_33b8._4_4_ = local_1740._12_4_;
      uStack_33b0._0_4_ = local_1750._0_4_;
      uStack_33b0._4_4_ = local_1750._4_4_;
      uStack_33a8._0_4_ = local_1750._8_4_;
      local_34a0 = local_34a0 * (float)local_33c0;
      fStack_349c = fStack_349c * local_33c0._4_4_;
      fStack_3498 = fStack_3498 * (float)uStack_33b8;
      fStack_3494 = fStack_3494 * uStack_33b8._4_4_;
      fStack_3490 = fStack_3490 * (float)uStack_33b0;
      fStack_348c = fStack_348c * uStack_33b0._4_4_;
      fStack_3488 = fStack_3488 * (float)uStack_33a8;
      local_3500 = CONCAT44(fStack_349c,local_34a0);
      uStack_34f8 = CONCAT44(fStack_3494,fStack_3498);
      uStack_34f0 = CONCAT44(fStack_348c,fStack_3490);
      uStack_34e8 = CONCAT44(fStack_3484,fStack_3488);
      local_34e0._0_4_ = local_1500._0_4_;
      local_34e0._4_4_ = local_1500._4_4_;
      fStack_34d8 = local_1500._8_4_;
      fStack_34d4 = local_1500._12_4_;
      fStack_34d0 = auStack_14f0._0_4_;
      fStack_34cc = auStack_14f0._4_4_;
      fStack_34c8 = auStack_14f0._8_4_;
      fStack_34c4 = auStack_14f0._12_4_;
      local_3260 = (float)local_34e0._0_4_ + local_34a0;
      fStack_325c = (float)local_34e0._4_4_ + fStack_349c;
      fStack_3258 = fStack_34d8 + fStack_3498;
      fStack_3254 = fStack_34d4 + fStack_3494;
      fStack_3250 = fStack_34d0 + fStack_3490;
      fStack_324c = fStack_34cc + fStack_348c;
      fStack_3248 = fStack_34c8 + fStack_3488;
      fStack_3244 = fStack_34c4 + fStack_3484;
      auVar30._4_4_ = fStack_325c;
      auVar30._0_4_ = local_3260;
      auVar30._8_4_ = fStack_3258;
      auVar30._12_4_ = fStack_3254;
      auVar30._16_4_ = fStack_3250;
      auVar30._20_4_ = fStack_324c;
      auVar30._24_4_ = fStack_3248;
      auVar30._28_4_ = fStack_3244;
      _local_3b60 = vdivps_avx(local_3240,auVar30);
      local_3b80 = local_1440._0_8_;
      uStack_3b78 = local_1440._8_8_;
      uStack_3b70 = auStack_1430._0_8_;
      uStack_3b68 = auStack_1430._8_8_;
      local_3560._4_4_ = (float)local_3b60._4_4_ * local_3b40._4_4_;
      local_3560._0_4_ = (float)local_3b60._0_4_ * (float)local_3b40;
      local_3560._8_4_ = fStack_3b58 * (float)uStack_3b38;
      local_3560._12_4_ = fStack_3b54 * uStack_3b38._4_4_;
      local_3560._16_4_ = fStack_3b50 * (float)uStack_3b30;
      local_3560._20_4_ = fStack_3b4c * uStack_3b30._4_4_;
      local_3560._24_4_ = fStack_3b48 * (float)uStack_3b28;
      local_3560._28_4_ = local_3b60._28_4_;
      local_3580 = local_1480._0_8_;
      uStack_3578 = local_1480._8_8_;
      uStack_3570 = auStack_1470._0_8_;
      uStack_3568 = auStack_1470._8_8_;
      auVar28._16_8_ = auStack_1470._0_8_;
      auVar28._0_16_ = local_1480;
      auVar28._24_8_ = auStack_1470._8_8_;
      _local_3c20 = vsubps_avx(local_3560,auVar28);
      local_3c00._0_4_ = auVar89._0_4_;
      local_3c00._4_4_ = auVar89._4_4_;
      fStack_3bf8 = auVar89._8_4_;
      fStack_3bf4 = auVar89._12_4_;
      fStack_3bf0 = auVar89._16_4_;
      fStack_3bec = auVar89._20_4_;
      fStack_3be8 = (float)uStack_3d28;
      uStack_3be4 = (undefined4)((ulong)uStack_3d28 >> 0x20);
      local_3e40 = CONCAT44((float)local_3c00._4_4_ * (float)local_3c20._4_4_,
                            (float)local_3c00._0_4_ * (float)local_3c20._0_4_);
      uStack_3e38 = CONCAT44(fStack_3bf4 * fStack_3c14,fStack_3bf8 * fStack_3c18);
      uStack_3e30 = CONCAT44(fStack_3bec * fStack_3c0c,fStack_3bf0 * fStack_3c10);
      uStack_3e28 = CONCAT44(uStack_3be4,fStack_3be8 * fStack_3c08);
      local_3cf0 = local_3dc0;
      local_3d20 = local_3e40;
      uStack_3d18 = uStack_3e38;
      uStack_3d10 = uStack_3e30;
      uStack_3d08 = uStack_3e28;
      auVar5._8_8_ = uStack_3e38;
      auVar5._0_8_ = local_3e40;
      auVar5._16_8_ = uStack_3e30;
      auVar5._24_8_ = uStack_3e28;
      *local_3dc0 = auVar5;
      local_3dc0 = local_3dc0 + 1;
      _local_3c00 = auVar90;
      local_3b40 = local_1440._0_8_;
      uStack_3b38 = local_1440._8_8_;
      uStack_3b30 = auStack_1430._0_8_;
      uStack_3b28 = auStack_1430._8_8_;
      local_3b20 = local_3b00;
      uStack_3b18 = uStack_3af8;
      uStack_3b10 = uStack_3af0;
      uStack_3b08 = uStack_3ae8;
      _local_3a00 = auVar32;
      local_3940 = local_3960;
      uStack_3938 = uStack_3958;
      uStack_3930 = uStack_3950;
      uStack_3928 = uStack_3948;
      local_3920 = uVar19;
      uStack_3918 = uVar20;
      uStack_3910 = uVar21;
      uStack_3908 = uVar22;
      local_38e0 = local_3ac0._0_8_;
      uStack_38d8 = local_3ac0._8_8_;
      uStack_38d0 = local_3ac0._16_8_;
      uStack_38c8 = local_3ac0._24_8_;
      local_38c0 = uVar15;
      uStack_38b8 = uVar16;
      uStack_38b0 = uVar17;
      uStack_38a8 = uVar18;
      local_3880 = uVar11;
      uStack_3878 = uVar12;
      uStack_3870 = uVar13;
      uStack_3868 = uVar14;
      local_3860 = local_14c0._0_8_;
      uStack_3858 = local_14c0._8_8_;
      uStack_3850 = auStack_14b0._0_8_;
      uStack_3848 = auStack_14b0._8_8_;
      local_37c0 = local_3a40;
      uStack_37b8 = uStack_3a38;
      uStack_37b0 = uStack_3a30;
      uStack_37a8 = uStack_3a28;
      _local_3760 = auVar36;
      local_3720 = local_1680._0_8_;
      uStack_3718 = local_1680._8_8_;
      uStack_3710 = local_1690._0_8_;
      uStack_3708 = local_1690._8_8_;
      local_36c0 = local_36e0;
      uStack_36b8 = uStack_36d8;
      uStack_36b0 = uStack_36d0;
      uStack_36a8 = uStack_36c8;
      _local_34e0 = local_3240;
      local_3460 = local_3a40;
      uStack_3458 = uStack_3a38;
      uStack_3450 = uStack_3a30;
      uStack_3448 = uStack_3a28;
      _local_3400 = auVar4;
      local_33c0 = local_1740._0_8_;
      uStack_33b8 = local_1740._8_8_;
      uStack_33b0 = local_1750._0_8_;
      uStack_33a8 = local_1750._8_8_;
      local_3360 = local_3380;
      uStack_3358 = uStack_3378;
      uStack_3350 = uStack_3370;
      uStack_3348 = uStack_3368;
      local_3200 = local_3220;
      local_31c0 = local_31e0;
      local_3160 = local_31a0;
      uStack_3158 = uStack_3198;
      uStack_3150 = uStack_3190;
      uStack_3148 = uStack_3188;
      local_2c70 = local_2d18;
      local_2c68 = local_2d08;
      local_2bd0 = local_2d18;
      local_2bc8 = local_2d08;
      local_2b30 = local_2d18;
      local_2b28 = local_2d08;
      local_2a90 = local_2d18;
      local_2a88 = local_2d08;
      local_29f0 = local_2d18;
      local_29e8 = local_2d08;
      local_2948 = local_2d18;
      local_2920 = uVar23;
      uStack_2918 = uVar24;
      uStack_2910 = uVar25;
      uStack_2908 = uVar26;
      local_2810 = local_28b8;
      local_2808 = local_28a8;
      local_2770 = local_28b8;
      local_2768 = local_28a8;
      local_26d0 = local_28b8;
      local_26c8 = local_28a8;
      local_2630 = local_28b8;
      local_2628 = local_28a8;
      local_2590 = local_28b8;
      local_2588 = local_28a8;
      local_24e8 = local_28b8;
      local_24c0 = uVar7;
      uStack_24b8 = uVar8;
      uStack_24b0 = uVar9;
      uStack_24a8 = uVar10;
      local_23a8 = local_2448;
      local_2380 = local_3a80;
      uStack_2378 = uStack_3a78;
      uStack_2370 = uStack_3a70;
      uStack_2368 = uStack_3a68;
      local_2310 = local_2458;
      local_2308 = local_23b8;
      fStack_2284 = fStack_3ac4;
      local_2270 = local_2458;
      local_2268 = local_23b8;
      fStack_21e4 = fStack_3ac4;
      local_21d0 = local_2458;
      local_21c8 = local_23b8;
      fStack_2144 = fStack_3ac4;
      local_2130 = local_2458;
      local_2128 = local_23b8;
      fStack_20a4 = fStack_3ac4;
      local_2090 = local_2458;
      local_2088 = local_23b8;
      fStack_2004 = fStack_3ac4;
      local_1ff0 = local_2458;
      local_1fe8 = local_23b8;
      fStack_1f64 = fStack_3ac4;
      local_1f50 = local_2458;
      local_1f48 = local_23b8;
      fStack_1ec4 = fStack_3ac4;
      local_1eb0 = local_2458;
      local_1ea8 = local_23b8;
      fStack_1e24 = fStack_3ac4;
      local_1e18 = local_2d18;
      local_1d78 = local_2d18;
      local_1d68 = local_1e08;
      local_1d40 = local_3420;
      uStack_1d38 = uStack_3418;
      uStack_1d30 = uStack_3410;
      uStack_1d28 = uStack_3408;
      local_1cd8 = local_28b8;
      local_1c38 = local_28b8;
      local_1c28 = local_1cc8;
      local_1c00 = local_3780;
      uStack_1bf8 = uStack_3778;
      uStack_1bf0 = uStack_3770;
      uStack_1be8 = uStack_3768;
      local_1b98 = local_23b8;
      fStack_1b24 = fStack_3ac4;
      local_1a40 = local_1a80;
      uStack_1a38 = uStack_1a78;
      uStack_1a30 = uStack_1a70;
      uStack_1a28 = uStack_1a68;
      uStack_1a08 = uStack_3d28;
      local_1900 = local_2d80;
      uStack_18f8 = uStack_2d78;
      uStack_18f0 = uStack_2d70;
      uStack_18e8 = uStack_2d68;
      local_1800 = local_2d80;
      uStack_17f8 = uStack_2d78;
      uStack_17f0 = uStack_2d70;
      uStack_17e8 = uStack_2d68;
      local_14dc = local_14e0;
      local_14d8 = local_14e0;
      local_14d4 = local_14e0;
      local_14d0 = local_14e0;
      local_14cc = local_14e0;
      local_14c8 = local_14e0;
      local_14c4 = local_14e0;
      local_149c = local_14a0;
      local_1498 = local_14a0;
      local_1494 = local_14a0;
      local_1490 = local_14a0;
      local_148c = local_14a0;
      local_1488 = local_14a0;
      local_1484 = local_14a0;
      local_145c = local_1460;
      local_1458 = local_1460;
      local_1454 = local_1460;
      local_1450 = local_1460;
      local_144c = local_1460;
      local_1448 = local_1460;
      local_1444 = local_1460;
      local_140c = local_1410;
      local_1408 = local_1410;
      local_1404 = local_1410;
      local_1400 = local_1410;
      local_13fc = local_1410;
      local_13f8 = local_1410;
      local_13f4 = local_1410;
    }
    for (; local_3c50 = local_3d58, local_3de8 = local_3cb0, local_3e18 + 3 < local_3db0;
        local_3e18 = local_3e18 + 4) {
      local_3ce8 = local_3dc0;
      local_3ce0 = *(undefined8 *)*local_3dc0;
      uStack_3cd8 = *(undefined8 *)(*local_3dc0 + 8);
      auVar49 = *(undefined1 (*) [16])*local_3dc0;
      local_d30 = 0;
      uStack_d28 = 0;
      local_1300 = 0x3f8000003f800000;
      uStack_12f8 = 0x3f8000003f800000;
      local_130 = 0x42b0c0a542b0c0a5;
      uStack_128 = 0x42b0c0a542b0c0a5;
      auVar86._8_8_ = 0x42b0c0a542b0c0a5;
      auVar86._0_8_ = 0x42b0c0a542b0c0a5;
      auVar2 = vminps_avx(*(undefined1 (*) [16])*local_3dc0,auVar86);
      local_1140._0_8_ = auVar2._0_8_;
      local_cc0 = local_1140._0_8_;
      local_1140._8_8_ = auVar2._8_8_;
      uStack_cb8 = local_1140._8_8_;
      local_cf0 = 0xc2b0c0a5c2b0c0a5;
      uStack_ce8 = 0xc2b0c0a5c2b0c0a5;
      auVar68._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar68._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3 = vmaxps_avx(auVar2,auVar68);
      local_1140._0_8_ = auVar3._0_8_;
      uVar7 = local_1140._0_8_;
      local_1140._8_8_ = auVar3._8_8_;
      uVar8 = local_1140._8_8_;
      local_10b0 = 0x3fb8aa3b3fb8aa3b;
      uStack_10a8 = 0x3fb8aa3b3fb8aa3b;
      local_10a0._0_4_ = auVar3._0_4_;
      local_10a0._4_4_ = auVar3._4_4_;
      uStack_1098._0_4_ = auVar3._8_4_;
      uStack_1098._4_4_ = auVar3._12_4_;
      local_1160._4_4_ = local_10a0._4_4_ * 1.442695;
      local_1160._0_4_ = (float)local_10a0 * 1.442695;
      uStack_1158._0_4_ = (float)uStack_1098 * 1.442695;
      uStack_1158._4_4_ = uStack_1098._4_4_ * 1.442695;
      local_1060 = local_1160;
      uStack_1058 = uStack_1158;
      local_1070 = 0x3f0000003f000000;
      uStack_1068 = 0x3f0000003f000000;
      local_1160._0_4_ = (float)local_10a0 * 1.442695 + 0.5;
      local_1160._4_4_ = local_10a0._4_4_ * 1.442695 + 0.5;
      fVar92 = (float)uStack_1098 * 1.442695 + 0.5;
      fVar93 = uStack_1098._4_4_ * 1.442695 + 0.5;
      uStack_1158._0_4_ = fVar92;
      uStack_1158._4_4_ = fVar93;
      local_c0 = local_1160;
      uStack_b8 = uStack_1158;
      local_1170._4_4_ = (int)(float)local_1160._4_4_;
      local_1170._0_4_ = (int)(float)local_1160._0_4_;
      local_1170._8_4_ = (int)fVar92;
      local_1170._12_4_ = (int)fVar93;
      local_b90 = local_1170._0_8_;
      uStack_b88 = local_1170._8_8_;
      auVar78._8_8_ = local_1170._8_8_;
      auVar78._0_8_ = local_1170._0_8_;
      auVar1 = vcvtdq2ps_avx(auVar78);
      local_1150 = auVar1._0_8_;
      local_80 = local_1150;
      uStack_1148 = auVar1._8_8_;
      uStack_78 = uStack_1148;
      local_90 = local_1160;
      uStack_88 = uStack_1158;
      auVar88._8_8_ = uStack_1158;
      auVar88._0_8_ = local_1160;
      auVar2 = vcmpps_avx(auVar88,auVar1,1);
      local_1190._0_8_ = auVar2._0_8_;
      local_c50 = local_1190._0_8_;
      local_1190._8_8_ = auVar2._8_8_;
      uStack_c48 = local_1190._8_8_;
      local_c60 = 0x3f8000003f800000;
      uStack_c58 = 0x3f8000003f800000;
      auVar72._8_8_ = 0x3f8000003f800000;
      auVar72._0_8_ = 0x3f8000003f800000;
      local_1190 = vpand_avx(auVar2,auVar72);
      local_fe0 = local_1150;
      uStack_fd8 = uStack_1148;
      local_ff0 = local_1190._0_8_;
      uStack_fe8 = local_1190._8_8_;
      _local_1160 = vsubps_avx(auVar1,local_1190);
      local_238 = local_1160;
      local_1e0 = ::_ps_cephes_exp_C1;
      local_908 = local_1140;
      local_1a0 = local_1140._0_8_;
      uStack_198 = local_1140._8_8_;
      local_1d0[0] = 0.6933594;
      local_1d0[1] = 0.6933594;
      afStack_1c8[0] = 0.6933594;
      afStack_1c8[1] = 0.6933594;
      local_1c0._0_4_ = local_1160._0_4_;
      local_1c0._4_4_ = local_1160._4_4_;
      uStack_1b8._0_4_ = local_1160._8_4_;
      uStack_1b8._4_4_ = local_1160._12_4_;
      local_1b0 = (float)local_1c0 * 0.6933594;
      fStack_1ac = local_1c0._4_4_ * 0.6933594;
      fStack_1a8 = (float)uStack_1b8 * 0.6933594;
      fStack_1a4 = uStack_1b8._4_4_ * 0.6933594;
      auVar83._4_4_ = fStack_1ac;
      auVar83._0_4_ = local_1b0;
      auVar83._8_4_ = fStack_1a8;
      auVar83._12_4_ = fStack_1a4;
      auVar2 = vsubps_avx(auVar3,auVar83);
      local_240 = ::_ps_cephes_exp_C2;
      local_1140._0_8_ = auVar2._0_8_;
      local_200 = local_1140._0_8_;
      local_1140._8_8_ = auVar2._8_8_;
      uStack_1f8 = local_1140._8_8_;
      local_220 = local_1160;
      uStack_218 = uStack_1158;
      local_230[0] = -0.00021219444;
      local_230[1] = -0.00021219444;
      afStack_228[0] = -0.00021219444;
      afStack_228[1] = -0.00021219444;
      local_210 = (float)local_1c0 * -0.00021219444;
      fStack_20c = local_1c0._4_4_ * -0.00021219444;
      fStack_208 = (float)uStack_1b8 * -0.00021219444;
      fStack_204 = uStack_1b8._4_4_ * -0.00021219444;
      auVar82._4_4_ = fStack_20c;
      auVar82._0_4_ = local_210;
      auVar82._8_4_ = fStack_208;
      auVar82._12_4_ = fStack_204;
      local_1140 = vsubps_avx(auVar2,auVar82);
      local_10d0 = local_1140._0_8_;
      uStack_10c8 = local_1140._8_8_;
      local_10c0._0_4_ = local_1140._0_4_;
      local_10c0._4_4_ = local_1140._4_4_;
      uStack_10b8._0_4_ = local_1140._8_4_;
      uStack_10b8._4_4_ = local_1140._12_4_;
      local_1150 = CONCAT44(local_10c0._4_4_ * local_10c0._4_4_,
                            (float)local_10c0 * (float)local_10c0);
      uStack_1148._0_4_ = (float)uStack_10b8 * (float)uStack_10b8;
      uStack_1148._4_4_ = uStack_10b8._4_4_ * uStack_10b8._4_4_;
      local_8f8 = &local_11a0;
      local_728 = ::_ps_cephes_exp_p1;
      local_700 = 0x3950696739506967;
      uStack_6f8 = 0x3950696739506967;
      local_710 = local_1140._0_8_;
      uStack_708 = local_1140._8_8_;
      local_6e0 = (float)local_10c0 * 0.00019875691;
      fStack_6dc = local_10c0._4_4_ * 0.00019875691;
      fStack_6d8 = (float)uStack_10b8 * 0.00019875691;
      fStack_6d4 = uStack_10b8._4_4_ * 0.00019875691;
      local_6f0[0] = 0.0013981999;
      local_6f0[1] = 0.0013981999;
      afStack_6e8[0] = 0.0013981999;
      afStack_6e8[1] = 0.0013981999;
      local_11a0 = CONCAT44(fStack_6dc + 0.0013981999,local_6e0 + 0.0013981999);
      uStack_1198 = CONCAT44(fStack_6d4 + 0.0013981999,fStack_6d8 + 0.0013981999);
      local_788 = ::_ps_cephes_exp_p2;
      local_760 = local_11a0;
      uStack_758 = uStack_1198;
      local_770 = local_1140._0_8_;
      uStack_768 = local_1140._8_8_;
      local_740 = (local_6e0 + 0.0013981999) * (float)local_10c0;
      fStack_73c = (fStack_6dc + 0.0013981999) * local_10c0._4_4_;
      fStack_738 = (fStack_6d8 + 0.0013981999) * (float)uStack_10b8;
      fStack_734 = (fStack_6d4 + 0.0013981999) * uStack_10b8._4_4_;
      local_750[0] = 0.008333452;
      local_750[1] = 0.008333452;
      afStack_748[0] = 0.008333452;
      afStack_748[1] = 0.008333452;
      local_11a0 = CONCAT44(fStack_73c + 0.008333452,local_740 + 0.008333452);
      uStack_1198 = CONCAT44(fStack_734 + 0.008333452,fStack_738 + 0.008333452);
      local_7e8 = ::_ps_cephes_exp_p3;
      local_7c0 = local_11a0;
      uStack_7b8 = uStack_1198;
      local_7d0 = local_1140._0_8_;
      uStack_7c8 = local_1140._8_8_;
      local_7a0 = (local_740 + 0.008333452) * (float)local_10c0;
      fStack_79c = (fStack_73c + 0.008333452) * local_10c0._4_4_;
      fStack_798 = (fStack_738 + 0.008333452) * (float)uStack_10b8;
      fStack_794 = (fStack_734 + 0.008333452) * uStack_10b8._4_4_;
      local_7b0[0] = 0.041665796;
      local_7b0[1] = 0.041665796;
      afStack_7a8[0] = 0.041665796;
      afStack_7a8[1] = 0.041665796;
      local_11a0 = CONCAT44(fStack_79c + 0.041665796,local_7a0 + 0.041665796);
      uStack_1198 = CONCAT44(fStack_794 + 0.041665796,fStack_798 + 0.041665796);
      local_848 = ::_ps_cephes_exp_p4;
      local_820 = local_11a0;
      uStack_818 = uStack_1198;
      local_830 = local_1140._0_8_;
      uStack_828 = local_1140._8_8_;
      local_800 = (local_7a0 + 0.041665796) * (float)local_10c0;
      fStack_7fc = (fStack_79c + 0.041665796) * local_10c0._4_4_;
      fStack_7f8 = (fStack_798 + 0.041665796) * (float)uStack_10b8;
      fStack_7f4 = (fStack_794 + 0.041665796) * uStack_10b8._4_4_;
      local_810[0] = 0.16666666;
      local_810[1] = 0.16666666;
      afStack_808[0] = 0.16666666;
      afStack_808[1] = 0.16666666;
      local_11a0 = CONCAT44(fStack_7fc + 0.16666666,local_800 + 0.16666666);
      uStack_1198 = CONCAT44(fStack_7f4 + 0.16666666,fStack_7f8 + 0.16666666);
      local_8a8 = ::_ps_cephes_exp_p5;
      local_880 = local_11a0;
      uStack_878 = uStack_1198;
      local_890 = local_1140._0_8_;
      uStack_888 = local_1140._8_8_;
      local_860 = (local_800 + 0.16666666) * (float)local_10c0;
      fStack_85c = (fStack_7fc + 0.16666666) * local_10c0._4_4_;
      fStack_858 = (fStack_7f8 + 0.16666666) * (float)uStack_10b8;
      fStack_854 = (fStack_7f4 + 0.16666666) * uStack_10b8._4_4_;
      local_870[0] = 0.5;
      local_870[1] = 0.5;
      afStack_868[0] = 0.5;
      afStack_868[1] = 0.5;
      local_11a0 = CONCAT44(fStack_85c + 0.5,local_860 + 0.5);
      uStack_1198 = CONCAT44(fStack_854 + 0.5,fStack_858 + 0.5);
      local_900 = &local_1150;
      local_8e0 = local_11a0;
      uStack_8d8 = uStack_1198;
      local_8f0 = local_1150;
      uStack_8e8 = uStack_1148;
      local_8c0 = (local_860 + 0.5) * (float)local_10c0 * (float)local_10c0;
      fStack_8bc = (fStack_85c + 0.5) * local_10c0._4_4_ * local_10c0._4_4_;
      fStack_8b8 = (fStack_858 + 0.5) * (float)uStack_10b8 * (float)uStack_10b8;
      fStack_8b4 = (fStack_854 + 0.5) * uStack_10b8._4_4_ * uStack_10b8._4_4_;
      local_8d0 = local_1140._0_8_;
      uStack_8c8 = local_1140._8_8_;
      local_11a0 = CONCAT44(fStack_8bc + local_10c0._4_4_,local_8c0 + (float)local_10c0);
      uStack_1198 = CONCAT44(fStack_8b4 + uStack_10b8._4_4_,fStack_8b8 + (float)uStack_10b8);
      local_1080 = local_11a0;
      uStack_1078 = uStack_1198;
      local_1090 = 0x3f8000003f800000;
      uStack_1088 = 0x3f8000003f800000;
      fVar92 = local_8c0 + (float)local_10c0 + 1.0;
      fVar93 = fStack_8bc + local_10c0._4_4_ + 1.0;
      fVar94 = fStack_8b8 + (float)uStack_10b8 + 1.0;
      fVar95 = fStack_8b4 + uStack_10b8._4_4_ + 1.0;
      local_11a0 = CONCAT44(fVar93,fVar92);
      uStack_1198 = CONCAT44(fVar95,fVar94);
      local_d0 = local_1160;
      uStack_c8 = uStack_1158;
      local_1170._4_4_ = (int)local_1c0._4_4_;
      local_1170._0_4_ = (int)(float)local_1c0;
      local_1170._8_4_ = (int)(float)uStack_1b8;
      local_1170._12_4_ = (int)uStack_1b8._4_4_;
      local_1120 = local_1170._0_8_;
      uStack_1118 = local_1170._8_8_;
      local_12b0 = 0x7f0000007f;
      uStack_12a8 = 0x7f0000007f;
      auVar58._8_8_ = local_1170._8_8_;
      auVar58._0_8_ = local_1170._0_8_;
      auVar57._8_8_ = 0x7f0000007f;
      auVar57._0_8_ = 0x7f0000007f;
      auVar2 = vpaddd_avx(auVar58,auVar57);
      local_1170._0_8_ = auVar2._0_8_;
      local_1100 = local_1170._0_8_;
      local_1170._8_8_ = auVar2._8_8_;
      uStack_10f8 = local_1170._8_8_;
      local_1104 = 0x17;
      local_1170 = vpslld_avx(auVar2,ZEXT416(0x17));
      local_60 = local_1170._0_8_;
      uStack_58 = local_1170._8_8_;
      local_11b0 = local_1170._0_8_;
      uStack_11a8 = local_1170._8_8_;
      local_10e0 = local_11a0;
      uStack_10d8 = uStack_1198;
      local_10f0._0_4_ = local_1170._0_4_;
      local_10f0._4_4_ = local_1170._4_4_;
      uStack_10e8._0_4_ = local_1170._8_4_;
      uStack_10e8._4_4_ = local_1170._12_4_;
      fVar92 = fVar92 * (float)local_10f0;
      fVar93 = fVar93 * local_10f0._4_4_;
      fVar94 = fVar94 * (float)uStack_10e8;
      fVar95 = fVar95 * uStack_10e8._4_4_;
      local_11a0 = CONCAT44(fVar93,fVar92);
      uStack_1198 = CONCAT44(fVar95,fVar94);
      local_11c0 = local_11a0;
      uStack_11b8 = uStack_1198;
      local_ff4 = 0x3f800000;
      local_1010 = 0x3f800000;
      local_11d0 = 0x3f8000003f800000;
      uStack_11c8 = 0x3f8000003f800000;
      local_12e0._4_4_ = fVar93 + 1.0;
      local_12e0._0_4_ = fVar92 + 1.0;
      uStack_12d8._0_4_ = fVar94 + 1.0;
      uStack_12d8._4_4_ = fVar95 + 1.0;
      local_d00 = local_12e0;
      uStack_cf8 = uStack_12d8;
      local_d20 = 0;
      uStack_d18 = 0;
      local_d10 = 0;
      uStack_d08 = 0;
      auVar66._8_8_ = uStack_12d8;
      auVar66._0_8_ = local_12e0;
      local_1310 = vcmpps_avx(auVar66,ZEXT816(0),2);
      local_ca0 = local_12e0;
      uStack_c98 = uStack_12d8;
      local_cb0 = 0x80000000800000;
      uStack_ca8 = 0x80000000800000;
      auVar70._8_8_ = uStack_12d8;
      auVar70._0_8_ = local_12e0;
      auVar69._8_8_ = 0x80000000800000;
      auVar69._0_8_ = 0x80000000800000;
      auVar2 = vmaxps_avx(auVar70,auVar69);
      local_12e0 = auVar2._0_8_;
      local_c90 = local_12e0;
      uStack_12d8 = auVar2._8_8_;
      uStack_c88 = uStack_12d8;
      local_12c0 = local_12e0;
      uStack_12b8 = uStack_12d8;
      local_12c4 = 0x17;
      auVar3 = vpsrld_avx(auVar2,ZEXT416(0x17));
      local_bf0 = local_12e0;
      uStack_be8 = uStack_12d8;
      local_c00 = 0x807fffff807fffff;
      uStack_bf8 = 0x807fffff807fffff;
      auVar74._8_8_ = 0x807fffff807fffff;
      auVar74._0_8_ = 0x807fffff807fffff;
      auVar2 = vpand_avx(auVar2,auVar74);
      local_12e0 = auVar2._0_8_;
      local_bb0 = local_12e0;
      uStack_12d8 = auVar2._8_8_;
      uStack_ba8 = uStack_12d8;
      auVar76._8_8_ = 0x3f0000003f000000;
      auVar76._0_8_ = 0x3f0000003f000000;
      auVar1 = vpor_avx(auVar2,auVar76);
      local_12f0._0_8_ = auVar3._0_8_;
      local_12a0 = local_12f0._0_8_;
      local_12f0._8_8_ = auVar3._8_8_;
      uStack_1298 = local_12f0._8_8_;
      auVar56._8_8_ = 0x7f0000007f;
      auVar56._0_8_ = 0x7f0000007f;
      local_12f0 = vpsubd_avx(auVar3,auVar56);
      local_b80 = local_12f0._0_8_;
      uStack_b78 = local_12f0._8_8_;
      auVar2 = vcvtdq2ps_avx(local_12f0);
      local_1320 = auVar2._0_8_;
      uVar9 = local_1320;
      uStack_1318 = auVar2._8_8_;
      uVar10 = uStack_1318;
      local_11f0 = 0x3f8000003f800000;
      uStack_11e8 = 0x3f8000003f800000;
      local_11e0._0_4_ = auVar2._0_4_;
      local_11e0._4_4_ = auVar2._4_4_;
      uStack_11d8._0_4_ = auVar2._8_4_;
      uStack_11d8._4_4_ = auVar2._12_4_;
      local_1320._4_4_ = local_11e0._4_4_ + 1.0;
      local_1320._0_4_ = (float)local_11e0 + 1.0;
      uStack_1318._0_4_ = (float)uStack_11d8 + 1.0;
      uStack_1318._4_4_ = uStack_11d8._4_4_ + 1.0;
      local_12e0 = auVar1._0_8_;
      local_b60 = local_12e0;
      uStack_12d8 = auVar1._8_8_;
      uStack_b58 = uStack_12d8;
      local_b70 = 0x3f3504f33f3504f3;
      uStack_b68 = 0x3f3504f33f3504f3;
      auVar79._8_8_ = 0x3f3504f33f3504f3;
      auVar79._0_8_ = 0x3f3504f33f3504f3;
      local_1330 = vcmpps_avx(auVar1,auVar79,1);
      local_c10 = local_12e0;
      uStack_c08 = uStack_12d8;
      local_c20 = local_1330._0_8_;
      uStack_c18 = local_1330._8_8_;
      local_1340 = vpand_avx(auVar1,local_1330);
      local_fa0 = local_12e0;
      uStack_f98 = uStack_12d8;
      local_fb0 = 0x3f8000003f800000;
      uStack_fa8 = 0x3f8000003f800000;
      auVar60._8_8_ = 0x3f8000003f800000;
      auVar60._0_8_ = 0x3f8000003f800000;
      auVar2 = vsubps_avx(auVar1,auVar60);
      local_fc0 = local_1320;
      uStack_fb8 = uStack_1318;
      local_c30 = 0x3f8000003f800000;
      uStack_c28 = 0x3f8000003f800000;
      local_c40 = local_1330._0_8_;
      uStack_c38 = local_1330._8_8_;
      auVar73._8_8_ = 0x3f8000003f800000;
      auVar73._0_8_ = 0x3f8000003f800000;
      local_fd0 = vpand_avx(local_1330,auVar73);
      auVar59._8_8_ = uStack_1318;
      auVar59._0_8_ = local_1320;
      _local_1320 = vsubps_avx(auVar59,local_fd0);
      local_12e0 = auVar2._0_8_;
      uVar11 = local_12e0;
      uStack_12d8 = auVar2._8_8_;
      uVar12 = uStack_12d8;
      local_1200._0_4_ = auVar2._0_4_;
      local_1200._4_4_ = auVar2._4_4_;
      uStack_11f8._0_4_ = auVar2._8_4_;
      uStack_11f8._4_4_ = auVar2._12_4_;
      local_1210._0_4_ = local_1340._0_4_;
      local_1210._4_4_ = local_1340._4_4_;
      uStack_1208._0_4_ = local_1340._8_4_;
      uStack_1208._4_4_ = local_1340._12_4_;
      local_1200._0_4_ = (float)local_1200 + (float)local_1210;
      local_1200._4_4_ = local_1200._4_4_ + local_1210._4_4_;
      uStack_11f8._0_4_ = (float)uStack_11f8 + (float)uStack_1208;
      uStack_11f8._4_4_ = uStack_11f8._4_4_ + uStack_1208._4_4_;
      local_12e0._4_4_ = local_1200._4_4_;
      local_12e0._0_4_ = (float)local_1200;
      uStack_12d8._0_4_ = (float)uStack_11f8;
      uStack_12d8._4_4_ = uStack_11f8._4_4_;
      local_1250 = local_12e0;
      uStack_1248 = uStack_12d8;
      local_1350 = (float)local_1200 * (float)local_1200;
      fStack_134c = local_1200._4_4_ * local_1200._4_4_;
      fStack_1348 = (float)uStack_11f8 * (float)uStack_11f8;
      fStack_1344 = uStack_11f8._4_4_ * uStack_11f8._4_4_;
      local_668 = local_1360;
      local_6c8 = local_12e0;
      local_368 = ::_ps_cephes_log_p1;
      local_340 = 0x3d9021bb3d9021bb;
      uStack_338 = 0x3d9021bb3d9021bb;
      local_350 = local_12e0;
      uStack_348 = uStack_12d8;
      local_320 = (float)local_1200 * 0.070376836;
      fStack_31c = local_1200._4_4_ * 0.070376836;
      fStack_318 = (float)uStack_11f8 * 0.070376836;
      fStack_314 = uStack_11f8._4_4_ * 0.070376836;
      local_330[0] = -0.1151461;
      local_330[1] = -0.1151461;
      afStack_328[0] = -0.1151461;
      afStack_328[1] = -0.1151461;
      local_1360._4_4_ = fStack_31c + -0.1151461;
      local_1360._0_4_ = local_320 + -0.1151461;
      uStack_1358._0_4_ = fStack_318 + -0.1151461;
      uStack_1358._4_4_ = fStack_314 + -0.1151461;
      local_3c8 = ::_ps_cephes_log_p2;
      local_3a0 = local_1360;
      uStack_398 = uStack_1358;
      local_3b0 = local_12e0;
      uStack_3a8 = uStack_12d8;
      local_380 = (local_320 + -0.1151461) * (float)local_1200;
      fStack_37c = (fStack_31c + -0.1151461) * local_1200._4_4_;
      fStack_378 = (fStack_318 + -0.1151461) * (float)uStack_11f8;
      fStack_374 = (fStack_314 + -0.1151461) * uStack_11f8._4_4_;
      local_390[0] = 0.116769984;
      local_390[1] = 0.116769984;
      afStack_388[0] = 0.116769984;
      afStack_388[1] = 0.116769984;
      local_1360._4_4_ = fStack_37c + 0.116769984;
      local_1360._0_4_ = local_380 + 0.116769984;
      uStack_1358._0_4_ = fStack_378 + 0.116769984;
      uStack_1358._4_4_ = fStack_374 + 0.116769984;
      local_428 = ::_ps_cephes_log_p3;
      local_400 = local_1360;
      uStack_3f8 = uStack_1358;
      local_410 = local_12e0;
      uStack_408 = uStack_12d8;
      local_3e0 = (local_380 + 0.116769984) * (float)local_1200;
      fStack_3dc = (fStack_37c + 0.116769984) * local_1200._4_4_;
      fStack_3d8 = (fStack_378 + 0.116769984) * (float)uStack_11f8;
      fStack_3d4 = (fStack_374 + 0.116769984) * uStack_11f8._4_4_;
      local_3f0[0] = -0.12420141;
      local_3f0[1] = -0.12420141;
      afStack_3e8[0] = -0.12420141;
      afStack_3e8[1] = -0.12420141;
      local_1360._4_4_ = fStack_3dc + -0.12420141;
      local_1360._0_4_ = local_3e0 + -0.12420141;
      uStack_1358._0_4_ = fStack_3d8 + -0.12420141;
      uStack_1358._4_4_ = fStack_3d4 + -0.12420141;
      local_488 = ::_ps_cephes_log_p4;
      local_460 = local_1360;
      uStack_458 = uStack_1358;
      local_470 = local_12e0;
      uStack_468 = uStack_12d8;
      local_440 = (local_3e0 + -0.12420141) * (float)local_1200;
      fStack_43c = (fStack_3dc + -0.12420141) * local_1200._4_4_;
      fStack_438 = (fStack_3d8 + -0.12420141) * (float)uStack_11f8;
      fStack_434 = (fStack_3d4 + -0.12420141) * uStack_11f8._4_4_;
      local_450[0] = 0.14249323;
      local_450[1] = 0.14249323;
      afStack_448[0] = 0.14249323;
      afStack_448[1] = 0.14249323;
      local_1360._4_4_ = fStack_43c + 0.14249323;
      local_1360._0_4_ = local_440 + 0.14249323;
      uStack_1358._0_4_ = fStack_438 + 0.14249323;
      uStack_1358._4_4_ = fStack_434 + 0.14249323;
      local_4e8 = ::_ps_cephes_log_p5;
      local_4c0 = local_1360;
      uStack_4b8 = uStack_1358;
      local_4d0 = local_12e0;
      uStack_4c8 = uStack_12d8;
      local_4a0 = (local_440 + 0.14249323) * (float)local_1200;
      fStack_49c = (fStack_43c + 0.14249323) * local_1200._4_4_;
      fStack_498 = (fStack_438 + 0.14249323) * (float)uStack_11f8;
      fStack_494 = (fStack_434 + 0.14249323) * uStack_11f8._4_4_;
      local_4b0[0] = -0.16668057;
      local_4b0[1] = -0.16668057;
      afStack_4a8[0] = -0.16668057;
      afStack_4a8[1] = -0.16668057;
      local_1360._4_4_ = fStack_49c + -0.16668057;
      local_1360._0_4_ = local_4a0 + -0.16668057;
      uStack_1358._0_4_ = fStack_498 + -0.16668057;
      uStack_1358._4_4_ = fStack_494 + -0.16668057;
      local_548 = ::_ps_cephes_log_p6;
      local_520 = local_1360;
      uStack_518 = uStack_1358;
      local_530 = local_12e0;
      uStack_528 = uStack_12d8;
      local_500 = (local_4a0 + -0.16668057) * (float)local_1200;
      fStack_4fc = (fStack_49c + -0.16668057) * local_1200._4_4_;
      fStack_4f8 = (fStack_498 + -0.16668057) * (float)uStack_11f8;
      fStack_4f4 = (fStack_494 + -0.16668057) * uStack_11f8._4_4_;
      local_510[0] = 0.20000714;
      local_510[1] = 0.20000714;
      afStack_508[0] = 0.20000714;
      afStack_508[1] = 0.20000714;
      local_1360._4_4_ = fStack_4fc + 0.20000714;
      local_1360._0_4_ = local_500 + 0.20000714;
      uStack_1358._0_4_ = fStack_4f8 + 0.20000714;
      uStack_1358._4_4_ = fStack_4f4 + 0.20000714;
      local_5a8 = ::_ps_cephes_log_p7;
      local_580 = local_1360;
      uStack_578 = uStack_1358;
      local_590 = local_12e0;
      uStack_588 = uStack_12d8;
      local_560 = (local_500 + 0.20000714) * (float)local_1200;
      fStack_55c = (fStack_4fc + 0.20000714) * local_1200._4_4_;
      fStack_558 = (fStack_4f8 + 0.20000714) * (float)uStack_11f8;
      fStack_554 = (fStack_4f4 + 0.20000714) * uStack_11f8._4_4_;
      local_570[0] = -0.24999994;
      local_570[1] = -0.24999994;
      afStack_568[0] = -0.24999994;
      afStack_568[1] = -0.24999994;
      local_1360._4_4_ = fStack_55c + -0.24999994;
      local_1360._0_4_ = local_560 + -0.24999994;
      uStack_1358._0_4_ = fStack_558 + -0.24999994;
      uStack_1358._4_4_ = fStack_554 + -0.24999994;
      local_608 = ::_ps_cephes_log_p8;
      local_5e0 = local_1360;
      uStack_5d8 = uStack_1358;
      local_5f0 = local_12e0;
      uStack_5e8 = uStack_12d8;
      local_5c0 = (local_560 + -0.24999994) * (float)local_1200;
      fStack_5bc = (fStack_55c + -0.24999994) * local_1200._4_4_;
      fStack_5b8 = (fStack_558 + -0.24999994) * (float)uStack_11f8;
      fStack_5b4 = (fStack_554 + -0.24999994) * uStack_11f8._4_4_;
      local_5d0[0] = 0.3333333;
      local_5d0[1] = 0.3333333;
      afStack_5c8[0] = 0.3333333;
      afStack_5c8[1] = 0.3333333;
      local_1360._4_4_ = fStack_5bc + 0.3333333;
      local_1360._0_4_ = local_5c0 + 0.3333333;
      uStack_1358._0_4_ = fStack_5b8 + 0.3333333;
      uStack_1358._4_4_ = fStack_5b4 + 0.3333333;
      local_1260 = local_1360;
      uStack_1258 = uStack_1358;
      local_1270 = local_12e0;
      uStack_1268 = uStack_12d8;
      local_1360._0_4_ = (local_5c0 + 0.3333333) * (float)local_1200;
      local_1360._4_4_ = (fStack_5bc + 0.3333333) * local_1200._4_4_;
      fVar92 = (fStack_5b8 + 0.3333333) * (float)uStack_11f8;
      fVar93 = (fStack_5b4 + 0.3333333) * uStack_11f8._4_4_;
      uStack_1358._0_4_ = fVar92;
      uStack_1358._4_4_ = fVar93;
      local_1280 = local_1360;
      uStack_1278 = uStack_1358;
      local_1290 = CONCAT44(fStack_134c,local_1350);
      uStack_1288 = CONCAT44(fStack_1344,fStack_1348);
      local_1360._0_4_ = (float)local_1360._0_4_ * local_1350;
      local_1360._4_4_ = (float)local_1360._4_4_ * fStack_134c;
      fVar92 = fVar92 * fStack_1348;
      fVar93 = fVar93 * fStack_1344;
      uStack_1358._0_4_ = fVar92;
      uStack_1358._4_4_ = fVar93;
      local_6b8 = local_1320;
      local_660 = ::_ps_cephes_log_q1;
      local_650[0] = -0.00021219444;
      local_650[1] = -0.00021219444;
      afStack_648[0] = -0.00021219444;
      afStack_648[1] = -0.00021219444;
      local_640._0_4_ = local_1320._0_4_;
      local_640._4_4_ = local_1320._4_4_;
      uStack_638._0_4_ = local_1320._8_4_;
      uStack_638._4_4_ = local_1320._12_4_;
      local_620 = (float)local_640 * -0.00021219444;
      fStack_61c = local_640._4_4_ * -0.00021219444;
      fStack_618 = (float)uStack_638 * -0.00021219444;
      fStack_614 = uStack_638._4_4_ * -0.00021219444;
      local_630 = local_1360;
      uStack_628 = uStack_1358;
      local_1360._4_4_ = fStack_61c + (float)local_1360._4_4_;
      local_1360._0_4_ = local_620 + (float)local_1360._0_4_;
      uStack_1358._0_4_ = fStack_618 + fVar92;
      uStack_1358._4_4_ = fStack_614 + fVar93;
      local_178 = &local_1350;
      local_180 = ::_ps_0p5;
      local_140 = local_1360;
      uStack_138 = uStack_1358;
      local_160 = CONCAT44(fStack_134c,local_1350);
      uStack_158 = CONCAT44(fStack_1344,fStack_1348);
      local_170[0] = 0.5;
      local_170[1] = 0.5;
      afStack_168[0] = 0.5;
      afStack_168[1] = 0.5;
      local_150 = local_1350 * 0.5;
      fStack_14c = fStack_134c * 0.5;
      fStack_148 = fStack_1348 * 0.5;
      fStack_144 = fStack_1344 * 0.5;
      auVar84._4_4_ = fStack_14c;
      auVar84._0_4_ = local_150;
      auVar84._8_4_ = fStack_148;
      auVar84._12_4_ = fStack_144;
      _local_1360 = vsubps_avx(_local_1360,auVar84);
      local_1220 = local_12e0;
      uStack_1218 = uStack_12d8;
      local_1230._0_4_ = local_1360._0_4_;
      local_1230._4_4_ = local_1360._4_4_;
      uStack_1228._0_4_ = local_1360._8_4_;
      uStack_1228._4_4_ = local_1360._12_4_;
      local_12e0._4_4_ = local_1200._4_4_ + local_1230._4_4_;
      local_12e0._0_4_ = (float)local_1200 + (float)local_1230;
      uStack_12d8._0_4_ = (float)uStack_11f8 + (float)uStack_1228;
      uStack_12d8._4_4_ = uStack_11f8._4_4_ + uStack_1228._4_4_;
      local_6c0 = ::_ps_cephes_log_q2;
      local_6a0 = local_1320;
      uStack_698 = uStack_1318;
      local_6b0[0] = 0.6933594;
      local_6b0[1] = 0.6933594;
      afStack_6a8[0] = 0.6933594;
      afStack_6a8[1] = 0.6933594;
      local_680 = (float)local_640 * 0.6933594;
      fStack_67c = local_640._4_4_ * 0.6933594;
      fStack_678 = (float)uStack_638 * 0.6933594;
      fStack_674 = uStack_638._4_4_ * 0.6933594;
      local_690 = local_12e0;
      uStack_688 = uStack_12d8;
      local_12e0._4_4_ = fStack_67c + local_1200._4_4_ + local_1230._4_4_;
      local_12e0._0_4_ = local_680 + (float)local_1200 + (float)local_1230;
      uStack_12d8._0_4_ = fStack_678 + (float)uStack_11f8 + (float)uStack_1228;
      uStack_12d8._4_4_ = fStack_674 + uStack_11f8._4_4_ + uStack_1228._4_4_;
      local_bd0 = local_12e0;
      uStack_bc8 = uStack_12d8;
      local_be0 = local_1310._0_8_;
      uStack_bd8 = local_1310._8_8_;
      auVar75._8_8_ = uStack_12d8;
      auVar75._0_8_ = local_12e0;
      _local_12e0 = vpor_avx(auVar75,local_1310);
      local_13b0 = local_12e0;
      uStack_13a8 = uStack_12d8;
      local_1014 = 0x3f800000;
      local_1030 = 0x3f800000;
      local_13c0 = 0x3f8000003f800000;
      uStack_13b8 = 0x3f8000003f800000;
      local_1034 = 0x40000000;
      local_1050 = 0x40000000;
      local_13d0 = 0x4000000040000000;
      uStack_13c8 = 0x4000000040000000;
      local_1370._0_4_ = local_12e0._0_4_;
      local_1370._4_4_ = local_12e0._4_4_;
      uStack_1368._0_4_ = local_12e0._8_4_;
      uStack_1368._4_4_ = local_12e0._12_4_;
      local_f60 = (float)local_1370 * 2.0;
      fStack_f5c = local_1370._4_4_ * 2.0;
      fStack_f58 = (float)uStack_1368 * 2.0;
      fStack_f54 = uStack_1368._4_4_ * 2.0;
      local_db4 = 0x3f800000;
      local_dd0 = 0x3f800000;
      local_f70 = 0x3f8000003f800000;
      uStack_f68 = 0x3f8000003f800000;
      local_f40._8_8_ = 0x3f8000003f800000;
      local_f40._0_8_ = 0x3f8000003f800000;
      local_d40 = 0;
      uStack_d38 = 0;
      local_d80 = 0;
      uStack_d78 = 0;
      local_d90 = CONCAT44(fStack_f5c,local_f60);
      uStack_d88 = CONCAT44(fStack_f54,fStack_f58);
      auVar64._8_8_ = uStack_d88;
      auVar64._0_8_ = local_d90;
      auVar2 = vsubps_avx(ZEXT816(0),auVar64);
      local_d50 = 0;
      uStack_d48 = 0;
      local_ec0._0_8_ = auVar2._0_8_;
      local_120 = local_ec0._0_8_;
      local_ec0._8_8_ = auVar2._8_8_;
      uStack_118 = local_ec0._8_8_;
      auVar85._8_8_ = 0x42b0c0a542b0c0a5;
      auVar85._0_8_ = 0x42b0c0a542b0c0a5;
      auVar2 = vminps_avx(auVar2,auVar85);
      local_ec0._0_8_ = auVar2._0_8_;
      local_ce0 = local_ec0._0_8_;
      local_ec0._8_8_ = auVar2._8_8_;
      uStack_cd8 = local_ec0._8_8_;
      auVar67._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar67._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3 = vmaxps_avx(auVar67,auVar2);
      local_ec0._0_8_ = auVar3._0_8_;
      uVar13 = local_ec0._0_8_;
      local_ec0._8_8_ = auVar3._8_8_;
      uVar14 = local_ec0._8_8_;
      local_e20._0_4_ = auVar3._0_4_;
      local_e20._4_4_ = auVar3._4_4_;
      uStack_e18._0_4_ = auVar3._8_4_;
      uStack_e18._4_4_ = auVar3._12_4_;
      local_ee0._4_4_ = local_e20._4_4_ * 1.442695;
      local_ee0._0_4_ = (float)local_e20 * 1.442695;
      uStack_ed8._0_4_ = (float)uStack_e18 * 1.442695;
      uStack_ed8._4_4_ = uStack_e18._4_4_ * 1.442695;
      local_de0 = local_ee0;
      uStack_dd8 = uStack_ed8;
      local_ee0._0_4_ = (float)local_e20 * 1.442695 + 0.5;
      local_ee0._4_4_ = local_e20._4_4_ * 1.442695 + 0.5;
      fVar92 = (float)uStack_e18 * 1.442695 + 0.5;
      fVar93 = uStack_e18._4_4_ * 1.442695 + 0.5;
      uStack_ed8._0_4_ = fVar92;
      uStack_ed8._4_4_ = fVar93;
      local_e0 = local_ee0;
      uStack_d8 = uStack_ed8;
      local_ef0._4_4_ = (int)(float)local_ee0._4_4_;
      local_ef0._0_4_ = (int)(float)local_ee0._0_4_;
      local_ef0._8_4_ = (int)fVar92;
      local_ef0._12_4_ = (int)fVar93;
      local_ba0 = local_ef0._0_8_;
      uStack_b98 = local_ef0._8_8_;
      auVar77._8_8_ = local_ef0._8_8_;
      auVar77._0_8_ = local_ef0._0_8_;
      auVar1 = vcvtdq2ps_avx(auVar77);
      local_ed0 = auVar1._0_8_;
      local_a0 = local_ed0;
      uStack_ec8 = auVar1._8_8_;
      uStack_98 = uStack_ec8;
      local_b0 = local_ee0;
      uStack_a8 = uStack_ed8;
      auVar87._8_8_ = uStack_ed8;
      auVar87._0_8_ = local_ee0;
      auVar2 = vcmpps_avx(auVar87,auVar1,1);
      local_f10._0_8_ = auVar2._0_8_;
      local_c70 = local_f10._0_8_;
      local_f10._8_8_ = auVar2._8_8_;
      uStack_c68 = local_f10._8_8_;
      local_c80 = 0x3f8000003f800000;
      uStack_c78 = 0x3f8000003f800000;
      auVar71._8_8_ = 0x3f8000003f800000;
      auVar71._0_8_ = 0x3f8000003f800000;
      local_f10 = vpand_avx(auVar2,auVar71);
      local_da0 = local_ed0;
      uStack_d98 = uStack_ec8;
      local_db0 = local_f10._0_8_;
      uStack_da8 = local_f10._8_8_;
      _local_ee0 = vsubps_avx(auVar1,local_f10);
      local_2f8 = local_ee0;
      local_2a0 = ::_ps_cephes_exp_C1;
      local_b48 = local_ec0;
      local_260 = local_ec0._0_8_;
      uStack_258 = local_ec0._8_8_;
      local_290[0] = 0.6933594;
      local_290[1] = 0.6933594;
      afStack_288[0] = 0.6933594;
      afStack_288[1] = 0.6933594;
      local_280._0_4_ = local_ee0._0_4_;
      local_280._4_4_ = local_ee0._4_4_;
      uStack_278._0_4_ = local_ee0._8_4_;
      uStack_278._4_4_ = local_ee0._12_4_;
      local_270 = (float)local_280 * 0.6933594;
      fStack_26c = local_280._4_4_ * 0.6933594;
      fStack_268 = (float)uStack_278 * 0.6933594;
      fStack_264 = uStack_278._4_4_ * 0.6933594;
      auVar81._4_4_ = fStack_26c;
      auVar81._0_4_ = local_270;
      auVar81._8_4_ = fStack_268;
      auVar81._12_4_ = fStack_264;
      auVar2 = vsubps_avx(auVar3,auVar81);
      local_300 = ::_ps_cephes_exp_C2;
      local_ec0._0_8_ = auVar2._0_8_;
      local_2c0 = local_ec0._0_8_;
      local_ec0._8_8_ = auVar2._8_8_;
      uStack_2b8 = local_ec0._8_8_;
      local_2e0 = local_ee0;
      uStack_2d8 = uStack_ed8;
      local_2f0[0] = -0.00021219444;
      local_2f0[1] = -0.00021219444;
      afStack_2e8[0] = -0.00021219444;
      afStack_2e8[1] = -0.00021219444;
      local_2d0 = (float)local_280 * -0.00021219444;
      fStack_2cc = local_280._4_4_ * -0.00021219444;
      fStack_2c8 = (float)uStack_278 * -0.00021219444;
      fStack_2c4 = uStack_278._4_4_ * -0.00021219444;
      auVar80._4_4_ = fStack_2cc;
      auVar80._0_4_ = local_2d0;
      auVar80._8_4_ = fStack_2c8;
      auVar80._12_4_ = fStack_2c4;
      local_ec0 = vsubps_avx(auVar2,auVar80);
      local_e50 = local_ec0._0_8_;
      uStack_e48 = local_ec0._8_8_;
      local_e40._0_4_ = local_ec0._0_4_;
      local_e40._4_4_ = local_ec0._4_4_;
      uStack_e38._0_4_ = local_ec0._8_4_;
      uStack_e38._4_4_ = local_ec0._12_4_;
      local_ed0 = CONCAT44(local_e40._4_4_ * local_e40._4_4_,(float)local_e40 * (float)local_e40);
      uStack_ec8._0_4_ = (float)uStack_e38 * (float)uStack_e38;
      uStack_ec8._4_4_ = uStack_e38._4_4_ * uStack_e38._4_4_;
      local_b38 = &local_f20;
      local_968 = ::_ps_cephes_exp_p1;
      local_940 = 0x3950696739506967;
      uStack_938 = 0x3950696739506967;
      local_950 = local_ec0._0_8_;
      uStack_948 = local_ec0._8_8_;
      local_920 = (float)local_e40 * 0.00019875691;
      fStack_91c = local_e40._4_4_ * 0.00019875691;
      fStack_918 = (float)uStack_e38 * 0.00019875691;
      fStack_914 = uStack_e38._4_4_ * 0.00019875691;
      local_930[0] = 0.0013981999;
      local_930[1] = 0.0013981999;
      afStack_928[0] = 0.0013981999;
      afStack_928[1] = 0.0013981999;
      local_9c8 = ::_ps_cephes_exp_p2;
      local_9a0 = CONCAT44(fStack_91c + 0.0013981999,local_920 + 0.0013981999);
      uStack_998 = CONCAT44(fStack_914 + 0.0013981999,fStack_918 + 0.0013981999);
      local_9b0 = local_ec0._0_8_;
      uStack_9a8 = local_ec0._8_8_;
      local_980 = (local_920 + 0.0013981999) * (float)local_e40;
      fStack_97c = (fStack_91c + 0.0013981999) * local_e40._4_4_;
      fStack_978 = (fStack_918 + 0.0013981999) * (float)uStack_e38;
      fStack_974 = (fStack_914 + 0.0013981999) * uStack_e38._4_4_;
      local_990[0] = 0.008333452;
      local_990[1] = 0.008333452;
      afStack_988[0] = 0.008333452;
      afStack_988[1] = 0.008333452;
      local_a28 = ::_ps_cephes_exp_p3;
      local_a00 = CONCAT44(fStack_97c + 0.008333452,local_980 + 0.008333452);
      uStack_9f8 = CONCAT44(fStack_974 + 0.008333452,fStack_978 + 0.008333452);
      local_a10 = local_ec0._0_8_;
      uStack_a08 = local_ec0._8_8_;
      local_9e0 = (local_980 + 0.008333452) * (float)local_e40;
      fStack_9dc = (fStack_97c + 0.008333452) * local_e40._4_4_;
      fStack_9d8 = (fStack_978 + 0.008333452) * (float)uStack_e38;
      fStack_9d4 = (fStack_974 + 0.008333452) * uStack_e38._4_4_;
      local_9f0[0] = 0.041665796;
      local_9f0[1] = 0.041665796;
      afStack_9e8[0] = 0.041665796;
      afStack_9e8[1] = 0.041665796;
      local_a88 = ::_ps_cephes_exp_p4;
      local_a60 = CONCAT44(fStack_9dc + 0.041665796,local_9e0 + 0.041665796);
      uStack_a58 = CONCAT44(fStack_9d4 + 0.041665796,fStack_9d8 + 0.041665796);
      local_a70 = local_ec0._0_8_;
      uStack_a68 = local_ec0._8_8_;
      local_a40 = (local_9e0 + 0.041665796) * (float)local_e40;
      fStack_a3c = (fStack_9dc + 0.041665796) * local_e40._4_4_;
      fStack_a38 = (fStack_9d8 + 0.041665796) * (float)uStack_e38;
      fStack_a34 = (fStack_9d4 + 0.041665796) * uStack_e38._4_4_;
      local_a50[0] = 0.16666666;
      local_a50[1] = 0.16666666;
      afStack_a48[0] = 0.16666666;
      afStack_a48[1] = 0.16666666;
      local_ae8 = ::_ps_cephes_exp_p5;
      local_ac0 = CONCAT44(fStack_a3c + 0.16666666,local_a40 + 0.16666666);
      uStack_ab8 = CONCAT44(fStack_a34 + 0.16666666,fStack_a38 + 0.16666666);
      local_ad0 = local_ec0._0_8_;
      uStack_ac8 = local_ec0._8_8_;
      local_aa0 = (local_a40 + 0.16666666) * (float)local_e40;
      fStack_a9c = (fStack_a3c + 0.16666666) * local_e40._4_4_;
      fStack_a98 = (fStack_a38 + 0.16666666) * (float)uStack_e38;
      fStack_a94 = (fStack_a34 + 0.16666666) * uStack_e38._4_4_;
      local_ab0[0] = 0.5;
      local_ab0[1] = 0.5;
      afStack_aa8[0] = 0.5;
      afStack_aa8[1] = 0.5;
      local_b40 = &local_ed0;
      local_b20 = CONCAT44(fStack_a9c + 0.5,local_aa0 + 0.5);
      uStack_b18 = CONCAT44(fStack_a94 + 0.5,fStack_a98 + 0.5);
      local_b30 = local_ed0;
      uStack_b28 = uStack_ec8;
      local_b00 = (local_aa0 + 0.5) * (float)local_e40 * (float)local_e40;
      fStack_afc = (fStack_a9c + 0.5) * local_e40._4_4_ * local_e40._4_4_;
      fStack_af8 = (fStack_a98 + 0.5) * (float)uStack_e38 * (float)uStack_e38;
      fStack_af4 = (fStack_a94 + 0.5) * uStack_e38._4_4_ * uStack_e38._4_4_;
      local_b10 = local_ec0._0_8_;
      uStack_b08 = local_ec0._8_8_;
      local_e00 = CONCAT44(fStack_afc + local_e40._4_4_,local_b00 + (float)local_e40);
      uStack_df8 = CONCAT44(fStack_af4 + uStack_e38._4_4_,fStack_af8 + (float)uStack_e38);
      local_e10 = 0x3f8000003f800000;
      uStack_e08 = 0x3f8000003f800000;
      local_f20 = local_b00 + (float)local_e40 + 1.0;
      fStack_f1c = fStack_afc + local_e40._4_4_ + 1.0;
      fStack_f18 = fStack_af8 + (float)uStack_e38 + 1.0;
      fStack_f14 = fStack_af4 + uStack_e38._4_4_ + 1.0;
      local_f0 = local_ee0;
      uStack_e8 = uStack_ed8;
      local_ef0._4_4_ = (int)local_280._4_4_;
      local_ef0._0_4_ = (int)(float)local_280;
      local_ef0._8_4_ = (int)(float)uStack_278;
      local_ef0._12_4_ = (int)uStack_278._4_4_;
      local_ea0 = local_ef0._0_8_;
      uStack_e98 = local_ef0._8_8_;
      auVar63._8_8_ = local_ef0._8_8_;
      auVar63._0_8_ = local_ef0._0_8_;
      auVar62._8_8_ = 0x7f0000007f;
      auVar62._0_8_ = 0x7f0000007f;
      auVar2 = vpaddd_avx(auVar63,auVar62);
      local_ef0._0_8_ = auVar2._0_8_;
      local_e80 = local_ef0._0_8_;
      local_ef0._8_8_ = auVar2._8_8_;
      uStack_e78 = local_ef0._8_8_;
      local_e84 = 0x17;
      local_ef0 = vpslld_avx(auVar2,ZEXT416(0x17));
      local_70 = local_ef0._0_8_;
      uStack_68 = local_ef0._8_8_;
      local_f30 = local_ef0._0_8_;
      uStack_f28 = local_ef0._8_8_;
      local_e60._4_4_ = fStack_f1c;
      local_e60._0_4_ = local_f20;
      local_e60._8_4_ = fStack_f18;
      local_e60._12_4_ = fStack_f14;
      local_e70._0_4_ = local_ef0._0_4_;
      local_e70._4_4_ = local_ef0._4_4_;
      uStack_e68._0_4_ = local_ef0._8_4_;
      uStack_e68._4_4_ = local_ef0._12_4_;
      local_f20 = local_f20 * (float)local_e70;
      fStack_f1c = fStack_f1c * local_e70._4_4_;
      fStack_f18 = fStack_f18 * (float)uStack_e68;
      fStack_f14 = fStack_f14 * uStack_e68._4_4_;
      local_f50 = CONCAT44(fStack_f1c,local_f20);
      uStack_f48 = CONCAT44(fStack_f14,fStack_f18);
      local_d70 = local_f20 + 1.0;
      fStack_d6c = fStack_f1c + 1.0;
      fStack_d68 = fStack_f18 + 1.0;
      fStack_d64 = fStack_f14 + 1.0;
      auVar65._4_4_ = fStack_d6c;
      auVar65._0_4_ = local_d70;
      auVar65._8_4_ = fStack_d68;
      auVar65._12_4_ = fStack_d64;
      _local_1390 = vdivps_avx(local_f40,auVar65);
      local_f80._0_4_ = (float)local_1390._0_4_ * 2.0;
      local_f80._4_4_ = (float)local_1390._4_4_ * 2.0;
      local_f80._8_4_ = fStack_1388 * 2.0;
      local_f80._12_4_ = fStack_1384 * 2.0;
      auVar61._8_8_ = 0x3f8000003f800000;
      auVar61._0_8_ = 0x3f8000003f800000;
      _local_13f0 = vsubps_avx(local_f80,auVar61);
      local_13e0._0_4_ = (undefined4)local_3ce0;
      local_13e0._4_4_ = (undefined4)((ulong)local_3ce0 >> 0x20);
      fStack_13d8 = (float)uStack_3cd8;
      fStack_13d4 = (float)((ulong)uStack_3cd8 >> 0x20);
      local_3e50 = CONCAT44((float)local_13e0._4_4_ * (float)local_13f0._4_4_,
                            (float)local_13e0._0_4_ * (float)local_13f0._0_4_);
      uStack_3e48 = CONCAT44(fStack_13d4 * fStack_13e4,fStack_13d8 * fStack_13e8);
      local_3cb8 = local_3dc0;
      local_3cd0 = local_3e50;
      uStack_3cc8 = uStack_3e48;
      auVar27._8_8_ = uStack_3e48;
      auVar27._0_8_ = local_3e50;
      *(undefined1 (*) [16])*local_3dc0 = auVar27;
      local_3dc0 = (undefined1 (*) [32])(*local_3dc0 + 0x10);
      _local_13e0 = auVar49;
      local_13a0 = local_13d0;
      uStack_1398 = uStack_13c8;
      local_1380 = local_13d0;
      uStack_1378 = uStack_13c8;
      local_1370 = local_12e0;
      uStack_1368 = uStack_12d8;
      local_1240 = local_1250;
      uStack_1238 = uStack_1248;
      local_1230 = local_1360;
      uStack_1228 = uStack_1358;
      local_1210 = local_1340._0_8_;
      uStack_1208 = local_1340._8_8_;
      local_1200 = uVar11;
      uStack_11f8 = uVar12;
      local_11e0 = uVar9;
      uStack_11d8 = uVar10;
      local_1180 = local_1300;
      uStack_1178 = uStack_12f8;
      local_1130 = local_12b0;
      uStack_1128 = uStack_12a8;
      local_10f0 = local_1170._0_8_;
      uStack_10e8 = local_1170._8_8_;
      local_10c0 = local_10d0;
      uStack_10b8 = uStack_10c8;
      local_10a0 = uVar7;
      uStack_1098 = uVar8;
      uStack_104c = local_1050;
      uStack_1048 = local_1050;
      uStack_1044 = local_1050;
      uStack_102c = local_1030;
      uStack_1028 = local_1030;
      uStack_1024 = local_1030;
      uStack_100c = local_1010;
      uStack_1008 = local_1010;
      uStack_1004 = local_1010;
      local_f90 = local_13c0;
      uStack_f88 = uStack_13b8;
      local_f00 = local_1300;
      uStack_ef8 = uStack_12f8;
      local_eb0 = local_12b0;
      uStack_ea8 = uStack_12a8;
      local_e70 = local_ef0._0_8_;
      uStack_e68 = local_ef0._8_8_;
      local_e40 = local_e50;
      uStack_e38 = uStack_e48;
      local_e30 = local_10b0;
      uStack_e28 = uStack_10a8;
      local_e20 = uVar13;
      uStack_e18 = uVar14;
      local_df0 = local_1070;
      uStack_de8 = uStack_1068;
      uStack_dcc = local_dd0;
      uStack_dc8 = local_dd0;
      uStack_dc4 = local_dd0;
      local_d60 = local_f40;
      local_cd0 = local_cf0;
      uStack_cc8 = uStack_ce8;
      local_bc0 = local_1070;
      uStack_bb8 = uStack_1068;
      local_ae0 = local_b48;
      local_ad8 = local_b38;
      local_a80 = local_b48;
      local_a78 = local_b38;
      local_a20 = local_b48;
      local_a18 = local_b38;
      local_9c0 = local_b48;
      local_9b8 = local_b38;
      local_960 = local_b48;
      local_958 = local_b38;
      local_8a0 = local_908;
      local_898 = local_8f8;
      local_840 = local_908;
      local_838 = local_8f8;
      local_7e0 = local_908;
      local_7d8 = local_8f8;
      local_780 = local_908;
      local_778 = local_8f8;
      local_720 = local_908;
      local_718 = local_8f8;
      local_658 = local_6b8;
      local_640 = local_1320;
      uStack_638 = uStack_1318;
      local_600 = local_6c8;
      local_5f8 = local_668;
      local_5a0 = local_6c8;
      local_598 = local_668;
      local_540 = local_6c8;
      local_538 = local_668;
      local_4e0 = local_6c8;
      local_4d8 = local_668;
      local_480 = local_6c8;
      local_478 = local_668;
      local_420 = local_6c8;
      local_418 = local_668;
      local_3c0 = local_6c8;
      local_3b8 = local_668;
      local_360 = local_6c8;
      local_358 = local_668;
      local_308 = local_b48;
      local_2a8 = local_b48;
      local_298 = local_2f8;
      local_280 = local_ee0;
      uStack_278 = uStack_ed8;
      local_248 = local_908;
      local_1e8 = local_908;
      local_1d8 = local_238;
      local_1c0 = local_1160;
      uStack_1b8 = uStack_1158;
      local_188 = local_668;
      local_110 = local_130;
      uStack_108 = uStack_128;
      local_100 = local_3ce0;
      uStack_f8 = uStack_3cd8;
    }
    for (; local_3e18 < local_3db0; local_3e18 = local_3e18 + 1) {
      fVar92 = *(float *)*local_3dc0;
      fVar93 = expf(*(float *)*local_3dc0);
      fVar93 = logf(fVar93 + 1.0);
      fVar93 = tanhf(fVar93);
      *(float *)*local_3dc0 = fVar92 * fVar93;
      local_3dc0 = (undefined1 (*) [32])(*local_3dc0 + 4);
    }
  }
  return 0;
}

Assistant:

int Mish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = mish_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanhf(logf(expf(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}